

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined4 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Primitive PVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  undefined4 uVar35;
  __int_type_conflict _Var36;
  long lVar37;
  RTCFilterFunctionN p_Var38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  bool bVar130;
  bool bVar131;
  bool bVar132;
  bool bVar133;
  bool bVar134;
  bool bVar135;
  bool bVar136;
  bool bVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [28];
  undefined1 auVar155 [28];
  undefined1 auVar156 [28];
  undefined1 auVar157 [28];
  undefined1 auVar158 [28];
  uint uVar159;
  uint uVar160;
  uint uVar161;
  ulong uVar162;
  ulong uVar163;
  long lVar164;
  uint uVar165;
  long lVar166;
  long lVar167;
  Geometry *pGVar168;
  long lVar169;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar170;
  float fVar194;
  float fVar197;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar171;
  undefined1 auVar178 [32];
  float fVar195;
  float fVar198;
  float fVar199;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar175 [16];
  float fVar172;
  float fVar196;
  float fVar200;
  float fVar201;
  float fVar205;
  float fVar206;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar207 [16];
  undefined1 auVar211 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar226;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  float fVar243;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar245;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar244;
  undefined1 auVar242 [64];
  float fVar246;
  float fVar261;
  undefined1 auVar247 [16];
  float fVar262;
  undefined1 auVar249 [16];
  float fVar260;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar248 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar267;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  float fVar268;
  float fVar269;
  float fVar277;
  float fVar281;
  float fVar285;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar278;
  float fVar279;
  float fVar282;
  float fVar283;
  float fVar286;
  float fVar287;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar272 [32];
  float fVar280;
  float fVar284;
  float fVar288;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar292;
  float fVar302;
  float fVar303;
  undefined1 auVar293 [16];
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  undefined1 auVar294 [32];
  float fVar304;
  float fVar309;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar310;
  undefined1 auVar311 [16];
  float fVar318;
  float fVar319;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  float fVar320;
  float fVar324;
  undefined1 auVar317 [32];
  float fVar325;
  undefined1 auVar329 [16];
  float fVar326;
  float fVar327;
  float fVar336;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar337;
  float fVar341;
  undefined1 auVar335 [64];
  float fVar346;
  undefined1 auVar349 [16];
  float fVar359;
  float fVar361;
  float fVar363;
  float fVar364;
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar347;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  float fVar360;
  float fVar362;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar375;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  float fVar376;
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [64];
  float fVar385;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [64];
  float fVar394;
  float fVar403;
  float fVar404;
  float fVar405;
  float in_register_0000151c;
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  float fVar406;
  float fVar411;
  float fVar413;
  float fVar415;
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  float fVar412;
  float fVar414;
  float fVar416;
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  float fVar417;
  float fVar418;
  float fVar423;
  float fVar425;
  float fVar426;
  float in_register_0000159c;
  undefined1 auVar420 [32];
  float fVar424;
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  float fVar427;
  float fVar433;
  float fVar434;
  float fVar435;
  float in_register_000015dc;
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined8 uStack_908;
  RTCFilterFunctionNArguments local_8f0;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [8];
  undefined8 uStack_858;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 local_790 [8];
  undefined8 uStack_788;
  undefined8 *local_778;
  undefined1 (*local_770) [16];
  undefined1 (*local_768) [32];
  undefined8 local_760;
  undefined1 auStack_758 [8];
  undefined1 auStack_750 [8];
  float fStack_748;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 auStack_730 [16];
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined1 local_710 [8];
  undefined8 uStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  LinearSpace3fa *local_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  uint local_460;
  uint local_45c;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_400 [32];
  float local_3e0 [4];
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  RTCHitN local_2a0 [16];
  undefined1 auStack_290 [16];
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar328 [16];
  undefined1 auVar348 [16];
  undefined1 auVar419 [16];
  
  PVar31 = prim[1];
  uVar162 = (ulong)(byte)PVar31;
  lVar166 = uVar162 * 0x25;
  auVar174 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar174 = vinsertps_avx(auVar174,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar231 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar231 = vinsertps_avx(auVar231,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar174 = vsubps_avx(auVar174,*(undefined1 (*) [16])(prim + lVar166 + 6));
  fVar246 = *(float *)(prim + lVar166 + 0x12);
  auVar207._0_4_ = fVar246 * auVar174._0_4_;
  auVar207._4_4_ = fVar246 * auVar174._4_4_;
  auVar207._8_4_ = fVar246 * auVar174._8_4_;
  auVar207._12_4_ = fVar246 * auVar174._12_4_;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar162 * 4 + 6)));
  auVar293._0_4_ = fVar246 * auVar231._0_4_;
  auVar293._4_4_ = fVar246 * auVar231._4_4_;
  auVar293._8_4_ = fVar246 * auVar231._8_4_;
  auVar293._12_4_ = fVar246 * auVar231._12_4_;
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar162 * 4 + 10)));
  auVar176._16_16_ = auVar231;
  auVar176._0_16_ = auVar174;
  auVar176 = vcvtdq2ps_avx(auVar176);
  lVar169 = uVar162 * 5;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar169 + 6)));
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar169 + 10)));
  auVar236._16_16_ = auVar231;
  auVar236._0_16_ = auVar174;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar162 * 6 + 6)));
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar162 * 6 + 10)));
  auVar186 = vcvtdq2ps_avx(auVar236);
  auVar250._16_16_ = auVar231;
  auVar250._0_16_ = auVar174;
  auVar39 = vcvtdq2ps_avx(auVar250);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar162 * 0xf + 6)));
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar162 * 0xf + 10)));
  auVar251._16_16_ = auVar231;
  auVar251._0_16_ = auVar174;
  auVar40 = vcvtdq2ps_avx(auVar251);
  lVar167 = (ulong)(byte)PVar31 * 0x10;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar167 + 6)));
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar167 + 10)));
  auVar312._16_16_ = auVar231;
  auVar312._0_16_ = auVar174;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar167 + uVar162 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar312);
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar167 + uVar162 + 10)));
  auVar330._16_16_ = auVar231;
  auVar330._0_16_ = auVar174;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar162 * 0x1a + 6)));
  auVar371 = vcvtdq2ps_avx(auVar330);
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar162 * 0x1a + 10)));
  auVar331._16_16_ = auVar231;
  auVar331._0_16_ = auVar174;
  auVar357 = vcvtdq2ps_avx(auVar331);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar162 * 0x1b + 6)));
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar162 * 0x1b + 10)));
  auVar365._16_16_ = auVar231;
  auVar365._0_16_ = auVar174;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar162 * 0x1c + 6)));
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar162 * 0x1c + 10)));
  auVar42 = vcvtdq2ps_avx(auVar365);
  auVar377._16_16_ = auVar231;
  auVar377._0_16_ = auVar174;
  auVar431 = vcvtdq2ps_avx(auVar377);
  auVar174 = vshufps_avx(auVar293,auVar293,0);
  auVar231 = vshufps_avx(auVar293,auVar293,0x55);
  auVar249 = vshufps_avx(auVar293,auVar293,0xaa);
  fVar246 = auVar249._0_4_;
  fVar244 = auVar249._4_4_;
  fVar260 = auVar249._8_4_;
  fVar262 = auVar249._12_4_;
  fVar243 = auVar231._0_4_;
  fVar265 = auVar231._4_4_;
  fVar261 = auVar231._8_4_;
  fVar307 = auVar231._12_4_;
  fVar263 = auVar174._0_4_;
  fVar264 = auVar174._4_4_;
  fVar266 = auVar174._8_4_;
  fVar268 = auVar174._12_4_;
  auVar395._0_4_ = fVar263 * auVar176._0_4_ + fVar243 * auVar186._0_4_ + fVar246 * auVar39._0_4_;
  auVar395._4_4_ = fVar264 * auVar176._4_4_ + fVar265 * auVar186._4_4_ + fVar244 * auVar39._4_4_;
  auVar395._8_4_ = fVar266 * auVar176._8_4_ + fVar261 * auVar186._8_4_ + fVar260 * auVar39._8_4_;
  auVar395._12_4_ = fVar268 * auVar176._12_4_ + fVar307 * auVar186._12_4_ + fVar262 * auVar39._12_4_
  ;
  auVar395._16_4_ = fVar263 * auVar176._16_4_ + fVar243 * auVar186._16_4_ + fVar246 * auVar39._16_4_
  ;
  auVar395._20_4_ = fVar264 * auVar176._20_4_ + fVar265 * auVar186._20_4_ + fVar244 * auVar39._20_4_
  ;
  auVar395._24_4_ = fVar266 * auVar176._24_4_ + fVar261 * auVar186._24_4_ + fVar260 * auVar39._24_4_
  ;
  auVar395._28_4_ = fVar307 + in_register_000015dc + in_register_0000151c;
  auVar386._0_4_ = fVar263 * auVar40._0_4_ + fVar243 * auVar41._0_4_ + auVar371._0_4_ * fVar246;
  auVar386._4_4_ = fVar264 * auVar40._4_4_ + fVar265 * auVar41._4_4_ + auVar371._4_4_ * fVar244;
  auVar386._8_4_ = fVar266 * auVar40._8_4_ + fVar261 * auVar41._8_4_ + auVar371._8_4_ * fVar260;
  auVar386._12_4_ = fVar268 * auVar40._12_4_ + fVar307 * auVar41._12_4_ + auVar371._12_4_ * fVar262;
  auVar386._16_4_ = fVar263 * auVar40._16_4_ + fVar243 * auVar41._16_4_ + auVar371._16_4_ * fVar246;
  auVar386._20_4_ = fVar264 * auVar40._20_4_ + fVar265 * auVar41._20_4_ + auVar371._20_4_ * fVar244;
  auVar386._24_4_ = fVar266 * auVar40._24_4_ + fVar261 * auVar41._24_4_ + auVar371._24_4_ * fVar260;
  auVar386._28_4_ = fVar307 + in_register_000015dc + in_register_0000159c;
  auVar294._0_4_ = fVar263 * auVar357._0_4_ + fVar243 * auVar42._0_4_ + auVar431._0_4_ * fVar246;
  auVar294._4_4_ = fVar264 * auVar357._4_4_ + fVar265 * auVar42._4_4_ + auVar431._4_4_ * fVar244;
  auVar294._8_4_ = fVar266 * auVar357._8_4_ + fVar261 * auVar42._8_4_ + auVar431._8_4_ * fVar260;
  auVar294._12_4_ = fVar268 * auVar357._12_4_ + fVar307 * auVar42._12_4_ + auVar431._12_4_ * fVar262
  ;
  auVar294._16_4_ = fVar263 * auVar357._16_4_ + fVar243 * auVar42._16_4_ + auVar431._16_4_ * fVar246
  ;
  auVar294._20_4_ = fVar264 * auVar357._20_4_ + fVar265 * auVar42._20_4_ + auVar431._20_4_ * fVar244
  ;
  auVar294._24_4_ = fVar266 * auVar357._24_4_ + fVar261 * auVar42._24_4_ + auVar431._24_4_ * fVar260
  ;
  auVar294._28_4_ = fVar268 + fVar307 + fVar262;
  auVar174 = vshufps_avx(auVar207,auVar207,0);
  auVar231 = vshufps_avx(auVar207,auVar207,0x55);
  auVar249 = vshufps_avx(auVar207,auVar207,0xaa);
  fVar246 = auVar249._0_4_;
  fVar244 = auVar249._4_4_;
  fVar260 = auVar249._8_4_;
  fVar262 = auVar249._12_4_;
  fVar264 = auVar231._0_4_;
  fVar266 = auVar231._4_4_;
  fVar268 = auVar231._8_4_;
  fVar277 = auVar231._12_4_;
  fVar243 = auVar186._28_4_ + auVar39._28_4_;
  fVar265 = auVar174._0_4_;
  fVar261 = auVar174._4_4_;
  fVar307 = auVar174._8_4_;
  fVar263 = auVar174._12_4_;
  auVar211._0_4_ = fVar265 * auVar176._0_4_ + fVar264 * auVar186._0_4_ + fVar246 * auVar39._0_4_;
  auVar211._4_4_ = fVar261 * auVar176._4_4_ + fVar266 * auVar186._4_4_ + fVar244 * auVar39._4_4_;
  auVar211._8_4_ = fVar307 * auVar176._8_4_ + fVar268 * auVar186._8_4_ + fVar260 * auVar39._8_4_;
  auVar211._12_4_ = fVar263 * auVar176._12_4_ + fVar277 * auVar186._12_4_ + fVar262 * auVar39._12_4_
  ;
  auVar211._16_4_ = fVar265 * auVar176._16_4_ + fVar264 * auVar186._16_4_ + fVar246 * auVar39._16_4_
  ;
  auVar211._20_4_ = fVar261 * auVar176._20_4_ + fVar266 * auVar186._20_4_ + fVar244 * auVar39._20_4_
  ;
  auVar211._24_4_ = fVar307 * auVar176._24_4_ + fVar268 * auVar186._24_4_ + fVar260 * auVar39._24_4_
  ;
  auVar211._28_4_ = auVar176._28_4_ + fVar243;
  auVar177._0_4_ = fVar265 * auVar40._0_4_ + auVar371._0_4_ * fVar246 + fVar264 * auVar41._0_4_;
  auVar177._4_4_ = fVar261 * auVar40._4_4_ + auVar371._4_4_ * fVar244 + fVar266 * auVar41._4_4_;
  auVar177._8_4_ = fVar307 * auVar40._8_4_ + auVar371._8_4_ * fVar260 + fVar268 * auVar41._8_4_;
  auVar177._12_4_ = fVar263 * auVar40._12_4_ + auVar371._12_4_ * fVar262 + fVar277 * auVar41._12_4_;
  auVar177._16_4_ = fVar265 * auVar40._16_4_ + auVar371._16_4_ * fVar246 + fVar264 * auVar41._16_4_;
  auVar177._20_4_ = fVar261 * auVar40._20_4_ + auVar371._20_4_ * fVar244 + fVar266 * auVar41._20_4_;
  auVar177._24_4_ = fVar307 * auVar40._24_4_ + auVar371._24_4_ * fVar260 + fVar268 * auVar41._24_4_;
  auVar177._28_4_ = auVar176._28_4_ + auVar371._28_4_ + auVar39._28_4_;
  auVar350._8_4_ = 0x7fffffff;
  auVar350._0_8_ = 0x7fffffff7fffffff;
  auVar350._12_4_ = 0x7fffffff;
  auVar350._16_4_ = 0x7fffffff;
  auVar350._20_4_ = 0x7fffffff;
  auVar350._24_4_ = 0x7fffffff;
  auVar350._28_4_ = 0x7fffffff;
  auVar252._8_4_ = 0x219392ef;
  auVar252._0_8_ = 0x219392ef219392ef;
  auVar252._12_4_ = 0x219392ef;
  auVar252._16_4_ = 0x219392ef;
  auVar252._20_4_ = 0x219392ef;
  auVar252._24_4_ = 0x219392ef;
  auVar252._28_4_ = 0x219392ef;
  auVar176 = vandps_avx(auVar395,auVar350);
  auVar176 = vcmpps_avx(auVar176,auVar252,1);
  auVar186 = vblendvps_avx(auVar395,auVar252,auVar176);
  auVar176 = vandps_avx(auVar386,auVar350);
  auVar176 = vcmpps_avx(auVar176,auVar252,1);
  auVar39 = vblendvps_avx(auVar386,auVar252,auVar176);
  auVar176 = vandps_avx(auVar350,auVar294);
  auVar176 = vcmpps_avx(auVar176,auVar252,1);
  auVar176 = vblendvps_avx(auVar294,auVar252,auVar176);
  auVar237._0_4_ = fVar265 * auVar357._0_4_ + fVar264 * auVar42._0_4_ + auVar431._0_4_ * fVar246;
  auVar237._4_4_ = fVar261 * auVar357._4_4_ + fVar266 * auVar42._4_4_ + auVar431._4_4_ * fVar244;
  auVar237._8_4_ = fVar307 * auVar357._8_4_ + fVar268 * auVar42._8_4_ + auVar431._8_4_ * fVar260;
  auVar237._12_4_ = fVar263 * auVar357._12_4_ + fVar277 * auVar42._12_4_ + auVar431._12_4_ * fVar262
  ;
  auVar237._16_4_ = fVar265 * auVar357._16_4_ + fVar264 * auVar42._16_4_ + auVar431._16_4_ * fVar246
  ;
  auVar237._20_4_ = fVar261 * auVar357._20_4_ + fVar266 * auVar42._20_4_ + auVar431._20_4_ * fVar244
  ;
  auVar237._24_4_ = fVar307 * auVar357._24_4_ + fVar268 * auVar42._24_4_ + auVar431._24_4_ * fVar260
  ;
  auVar237._28_4_ = fVar243 + auVar41._28_4_ + fVar262;
  auVar40 = vrcpps_avx(auVar186);
  fVar246 = auVar40._0_4_;
  fVar260 = auVar40._4_4_;
  auVar41._4_4_ = auVar186._4_4_ * fVar260;
  auVar41._0_4_ = auVar186._0_4_ * fVar246;
  fVar243 = auVar40._8_4_;
  auVar41._8_4_ = auVar186._8_4_ * fVar243;
  fVar261 = auVar40._12_4_;
  auVar41._12_4_ = auVar186._12_4_ * fVar261;
  fVar263 = auVar40._16_4_;
  auVar41._16_4_ = auVar186._16_4_ * fVar263;
  fVar264 = auVar40._20_4_;
  auVar41._20_4_ = auVar186._20_4_ * fVar264;
  fVar266 = auVar40._24_4_;
  auVar41._24_4_ = auVar186._24_4_ * fVar266;
  auVar41._28_4_ = auVar186._28_4_;
  auVar351._8_4_ = 0x3f800000;
  auVar351._0_8_ = &DAT_3f8000003f800000;
  auVar351._12_4_ = 0x3f800000;
  auVar351._16_4_ = 0x3f800000;
  auVar351._20_4_ = 0x3f800000;
  auVar351._24_4_ = 0x3f800000;
  auVar351._28_4_ = 0x3f800000;
  auVar371 = vsubps_avx(auVar351,auVar41);
  auVar41 = vrcpps_avx(auVar39);
  fVar246 = fVar246 + fVar246 * auVar371._0_4_;
  fVar260 = fVar260 + fVar260 * auVar371._4_4_;
  fVar243 = fVar243 + fVar243 * auVar371._8_4_;
  fVar261 = fVar261 + fVar261 * auVar371._12_4_;
  fVar263 = fVar263 + fVar263 * auVar371._16_4_;
  fVar264 = fVar264 + fVar264 * auVar371._20_4_;
  fVar266 = fVar266 + fVar266 * auVar371._24_4_;
  fVar268 = auVar41._0_4_;
  fVar277 = auVar41._4_4_;
  auVar186._4_4_ = fVar277 * auVar39._4_4_;
  auVar186._0_4_ = fVar268 * auVar39._0_4_;
  fVar281 = auVar41._8_4_;
  auVar186._8_4_ = fVar281 * auVar39._8_4_;
  fVar285 = auVar41._12_4_;
  auVar186._12_4_ = fVar285 * auVar39._12_4_;
  fVar289 = auVar41._16_4_;
  auVar186._16_4_ = fVar289 * auVar39._16_4_;
  fVar290 = auVar41._20_4_;
  auVar186._20_4_ = fVar290 * auVar39._20_4_;
  fVar291 = auVar41._24_4_;
  auVar186._24_4_ = fVar291 * auVar39._24_4_;
  auVar186._28_4_ = auVar371._28_4_;
  auVar39 = vsubps_avx(auVar351,auVar186);
  fVar268 = fVar268 + fVar268 * auVar39._0_4_;
  fVar277 = fVar277 + fVar277 * auVar39._4_4_;
  fVar281 = fVar281 + fVar281 * auVar39._8_4_;
  fVar285 = fVar285 + fVar285 * auVar39._12_4_;
  fVar289 = fVar289 + fVar289 * auVar39._16_4_;
  fVar290 = fVar290 + fVar290 * auVar39._20_4_;
  fVar291 = fVar291 + fVar291 * auVar39._24_4_;
  auVar186 = vrcpps_avx(auVar176);
  fVar292 = auVar186._0_4_;
  fVar302 = auVar186._4_4_;
  auVar357._4_4_ = fVar302 * auVar176._4_4_;
  auVar357._0_4_ = fVar292 * auVar176._0_4_;
  fVar303 = auVar186._8_4_;
  auVar357._8_4_ = fVar303 * auVar176._8_4_;
  fVar304 = auVar186._12_4_;
  auVar357._12_4_ = fVar304 * auVar176._12_4_;
  fVar305 = auVar186._16_4_;
  auVar357._16_4_ = fVar305 * auVar176._16_4_;
  fVar306 = auVar186._20_4_;
  auVar357._20_4_ = fVar306 * auVar176._20_4_;
  fVar308 = auVar186._24_4_;
  auVar357._24_4_ = fVar308 * auVar176._24_4_;
  auVar357._28_4_ = auVar176._28_4_;
  auVar176 = vsubps_avx(auVar351,auVar357);
  fVar292 = fVar292 + fVar292 * auVar176._0_4_;
  fVar302 = fVar302 + fVar302 * auVar176._4_4_;
  fVar303 = fVar303 + fVar303 * auVar176._8_4_;
  fVar304 = fVar304 + fVar304 * auVar176._12_4_;
  fVar305 = fVar305 + fVar305 * auVar176._16_4_;
  fVar306 = fVar306 + fVar306 * auVar176._20_4_;
  fVar308 = fVar308 + fVar308 * auVar176._24_4_;
  auVar174 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar166 + 0x16)) *
                           *(float *)(prim + lVar166 + 0x1a)));
  auVar43 = vshufps_avx(auVar174,auVar174,0);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar162 * 7 + 6);
  auVar174 = vpmovsxwd_avx(auVar174);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar162 * 7 + 0xe);
  auVar231 = vpmovsxwd_avx(auVar231);
  auVar332._16_16_ = auVar231;
  auVar332._0_16_ = auVar174;
  auVar176 = vcvtdq2ps_avx(auVar332);
  auVar249._8_8_ = 0;
  auVar249._0_8_ = *(ulong *)(prim + uVar162 * 0xb + 6);
  auVar174 = vpmovsxwd_avx(auVar249);
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + uVar162 * 0xb + 0xe);
  auVar231 = vpmovsxwd_avx(auVar233);
  auVar352._16_16_ = auVar231;
  auVar352._0_16_ = auVar174;
  auVar186 = vcvtdq2ps_avx(auVar352);
  auVar186 = vsubps_avx(auVar186,auVar176);
  fVar244 = auVar43._0_4_;
  fVar262 = auVar43._4_4_;
  fVar265 = auVar43._8_4_;
  fVar307 = auVar43._12_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar162 * 9 + 6);
  auVar174 = vpmovsxwd_avx(auVar43);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar162 * 9 + 0xe);
  auVar231 = vpmovsxwd_avx(auVar12);
  auVar333._0_4_ = auVar186._0_4_ * fVar244 + auVar176._0_4_;
  auVar333._4_4_ = auVar186._4_4_ * fVar262 + auVar176._4_4_;
  auVar333._8_4_ = auVar186._8_4_ * fVar265 + auVar176._8_4_;
  auVar333._12_4_ = auVar186._12_4_ * fVar307 + auVar176._12_4_;
  auVar333._16_4_ = auVar186._16_4_ * fVar244 + auVar176._16_4_;
  auVar333._20_4_ = auVar186._20_4_ * fVar262 + auVar176._20_4_;
  auVar333._24_4_ = auVar186._24_4_ * fVar265 + auVar176._24_4_;
  auVar333._28_4_ = auVar186._28_4_ + auVar176._28_4_;
  auVar353._16_16_ = auVar231;
  auVar353._0_16_ = auVar174;
  auVar176 = vcvtdq2ps_avx(auVar353);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar162 * 0xd + 6);
  auVar174 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar162 * 0xd + 0xe);
  auVar231 = vpmovsxwd_avx(auVar14);
  auVar366._16_16_ = auVar231;
  auVar366._0_16_ = auVar174;
  auVar186 = vcvtdq2ps_avx(auVar366);
  auVar186 = vsubps_avx(auVar186,auVar176);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar162 * 0x12 + 6);
  auVar174 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar162 * 0x12 + 0xe);
  auVar231 = vpmovsxwd_avx(auVar16);
  auVar354._0_4_ = auVar176._0_4_ + auVar186._0_4_ * fVar244;
  auVar354._4_4_ = auVar176._4_4_ + auVar186._4_4_ * fVar262;
  auVar354._8_4_ = auVar176._8_4_ + auVar186._8_4_ * fVar265;
  auVar354._12_4_ = auVar176._12_4_ + auVar186._12_4_ * fVar307;
  auVar354._16_4_ = auVar176._16_4_ + auVar186._16_4_ * fVar244;
  auVar354._20_4_ = auVar176._20_4_ + auVar186._20_4_ * fVar262;
  auVar354._24_4_ = auVar176._24_4_ + auVar186._24_4_ * fVar265;
  auVar354._28_4_ = auVar176._28_4_ + auVar186._28_4_;
  auVar367._16_16_ = auVar231;
  auVar367._0_16_ = auVar174;
  auVar176 = vcvtdq2ps_avx(auVar367);
  uVar163 = (ulong)(uint)((int)lVar169 << 2);
  lVar166 = uVar162 * 2 + uVar163;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar166 + 6);
  auVar174 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar166 + 0xe);
  auVar231 = vpmovsxwd_avx(auVar18);
  auVar378._16_16_ = auVar231;
  auVar378._0_16_ = auVar174;
  auVar186 = vcvtdq2ps_avx(auVar378);
  auVar186 = vsubps_avx(auVar186,auVar176);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar163 + 6);
  auVar174 = vpmovsxwd_avx(auVar19);
  auVar368._0_4_ = auVar176._0_4_ + auVar186._0_4_ * fVar244;
  auVar368._4_4_ = auVar176._4_4_ + auVar186._4_4_ * fVar262;
  auVar368._8_4_ = auVar176._8_4_ + auVar186._8_4_ * fVar265;
  auVar368._12_4_ = auVar176._12_4_ + auVar186._12_4_ * fVar307;
  auVar368._16_4_ = auVar176._16_4_ + auVar186._16_4_ * fVar244;
  auVar368._20_4_ = auVar176._20_4_ + auVar186._20_4_ * fVar262;
  auVar368._24_4_ = auVar176._24_4_ + auVar186._24_4_ * fVar265;
  auVar368._28_4_ = auVar176._28_4_ + auVar186._28_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar163 + 0xe);
  auVar231 = vpmovsxwd_avx(auVar20);
  auVar379._16_16_ = auVar231;
  auVar379._0_16_ = auVar174;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar162 * 0x18 + 6);
  auVar174 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar162 * 0x18 + 0xe);
  auVar231 = vpmovsxwd_avx(auVar22);
  auVar176 = vcvtdq2ps_avx(auVar379);
  auVar387._16_16_ = auVar231;
  auVar387._0_16_ = auVar174;
  auVar186 = vcvtdq2ps_avx(auVar387);
  auVar186 = vsubps_avx(auVar186,auVar176);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar162 * 0x1d + 6);
  auVar174 = vpmovsxwd_avx(auVar23);
  auVar380._0_4_ = auVar176._0_4_ + auVar186._0_4_ * fVar244;
  auVar380._4_4_ = auVar176._4_4_ + auVar186._4_4_ * fVar262;
  auVar380._8_4_ = auVar176._8_4_ + auVar186._8_4_ * fVar265;
  auVar380._12_4_ = auVar176._12_4_ + auVar186._12_4_ * fVar307;
  auVar380._16_4_ = auVar176._16_4_ + auVar186._16_4_ * fVar244;
  auVar380._20_4_ = auVar176._20_4_ + auVar186._20_4_ * fVar262;
  auVar380._24_4_ = auVar176._24_4_ + auVar186._24_4_ * fVar265;
  auVar380._28_4_ = auVar176._28_4_ + auVar186._28_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar162 * 0x1d + 0xe);
  auVar231 = vpmovsxwd_avx(auVar24);
  auVar388._16_16_ = auVar231;
  auVar388._0_16_ = auVar174;
  auVar176 = vcvtdq2ps_avx(auVar388);
  lVar166 = uVar162 + (ulong)(byte)PVar31 * 0x20;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar166 + 6);
  auVar174 = vpmovsxwd_avx(auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar166 + 0xe);
  auVar231 = vpmovsxwd_avx(auVar26);
  auVar396._16_16_ = auVar231;
  auVar396._0_16_ = auVar174;
  auVar186 = vcvtdq2ps_avx(auVar396);
  auVar186 = vsubps_avx(auVar186,auVar176);
  auVar389._0_4_ = auVar176._0_4_ + auVar186._0_4_ * fVar244;
  auVar389._4_4_ = auVar176._4_4_ + auVar186._4_4_ * fVar262;
  auVar389._8_4_ = auVar176._8_4_ + auVar186._8_4_ * fVar265;
  auVar389._12_4_ = auVar176._12_4_ + auVar186._12_4_ * fVar307;
  auVar389._16_4_ = auVar176._16_4_ + auVar186._16_4_ * fVar244;
  auVar389._20_4_ = auVar176._20_4_ + auVar186._20_4_ * fVar262;
  auVar389._24_4_ = auVar176._24_4_ + auVar186._24_4_ * fVar265;
  auVar389._28_4_ = auVar176._28_4_ + auVar186._28_4_;
  lVar166 = (ulong)(byte)PVar31 * 0x20 - uVar162;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar166 + 6);
  auVar174 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar166 + 0xe);
  auVar231 = vpmovsxwd_avx(auVar28);
  auVar397._16_16_ = auVar231;
  auVar397._0_16_ = auVar174;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar162 * 0x23 + 6);
  auVar174 = vpmovsxwd_avx(auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar162 * 0x23 + 0xe);
  auVar231 = vpmovsxwd_avx(auVar30);
  auVar407._16_16_ = auVar231;
  auVar407._0_16_ = auVar174;
  auVar176 = vcvtdq2ps_avx(auVar397);
  auVar186 = vcvtdq2ps_avx(auVar407);
  auVar186 = vsubps_avx(auVar186,auVar176);
  auVar398._0_4_ = auVar176._0_4_ + auVar186._0_4_ * fVar244;
  auVar398._4_4_ = auVar176._4_4_ + auVar186._4_4_ * fVar262;
  auVar398._8_4_ = auVar176._8_4_ + auVar186._8_4_ * fVar265;
  auVar398._12_4_ = auVar176._12_4_ + auVar186._12_4_ * fVar307;
  auVar398._16_4_ = auVar176._16_4_ + auVar186._16_4_ * fVar244;
  auVar398._20_4_ = auVar176._20_4_ + auVar186._20_4_ * fVar262;
  auVar398._24_4_ = auVar176._24_4_ + auVar186._24_4_ * fVar265;
  auVar398._28_4_ = auVar176._28_4_ + fVar307;
  auVar176 = vsubps_avx(auVar333,auVar211);
  auVar311._0_4_ = fVar246 * auVar176._0_4_;
  auVar311._4_4_ = fVar260 * auVar176._4_4_;
  auVar311._8_4_ = fVar243 * auVar176._8_4_;
  auVar311._12_4_ = fVar261 * auVar176._12_4_;
  auVar42._16_4_ = fVar263 * auVar176._16_4_;
  auVar42._0_16_ = auVar311;
  auVar42._20_4_ = fVar264 * auVar176._20_4_;
  auVar42._24_4_ = fVar266 * auVar176._24_4_;
  auVar42._28_4_ = auVar176._28_4_;
  auVar176 = vsubps_avx(auVar354,auVar211);
  auVar247._0_4_ = fVar246 * auVar176._0_4_;
  auVar247._4_4_ = fVar260 * auVar176._4_4_;
  auVar247._8_4_ = fVar243 * auVar176._8_4_;
  auVar247._12_4_ = fVar261 * auVar176._12_4_;
  auVar431._16_4_ = fVar263 * auVar176._16_4_;
  auVar431._0_16_ = auVar247;
  auVar431._20_4_ = fVar264 * auVar176._20_4_;
  auVar431._24_4_ = fVar266 * auVar176._24_4_;
  auVar431._28_4_ = auVar40._28_4_ + auVar371._28_4_;
  auVar176 = vsubps_avx(auVar368,auVar177);
  auVar208._0_4_ = fVar268 * auVar176._0_4_;
  auVar208._4_4_ = fVar277 * auVar176._4_4_;
  auVar208._8_4_ = fVar281 * auVar176._8_4_;
  auVar208._12_4_ = fVar285 * auVar176._12_4_;
  auVar40._16_4_ = fVar289 * auVar176._16_4_;
  auVar40._0_16_ = auVar208;
  auVar40._20_4_ = fVar290 * auVar176._20_4_;
  auVar40._24_4_ = fVar291 * auVar176._24_4_;
  auVar40._28_4_ = auVar176._28_4_;
  auVar176 = vsubps_avx(auVar380,auVar177);
  auVar270._0_4_ = fVar268 * auVar176._0_4_;
  auVar270._4_4_ = fVar277 * auVar176._4_4_;
  auVar270._8_4_ = fVar281 * auVar176._8_4_;
  auVar270._12_4_ = fVar285 * auVar176._12_4_;
  auVar371._16_4_ = fVar289 * auVar176._16_4_;
  auVar371._0_16_ = auVar270;
  auVar371._20_4_ = fVar290 * auVar176._20_4_;
  auVar371._24_4_ = fVar291 * auVar176._24_4_;
  auVar371._28_4_ = auVar41._28_4_ + auVar39._28_4_;
  auVar176 = vsubps_avx(auVar389,auVar237);
  auVar173._0_4_ = fVar292 * auVar176._0_4_;
  auVar173._4_4_ = fVar302 * auVar176._4_4_;
  auVar173._8_4_ = fVar303 * auVar176._8_4_;
  auVar173._12_4_ = fVar304 * auVar176._12_4_;
  auVar39._16_4_ = fVar305 * auVar176._16_4_;
  auVar39._0_16_ = auVar173;
  auVar39._20_4_ = fVar306 * auVar176._20_4_;
  auVar39._24_4_ = fVar308 * auVar176._24_4_;
  auVar39._28_4_ = auVar176._28_4_;
  auVar176 = vsubps_avx(auVar398,auVar237);
  auVar227._0_4_ = fVar292 * auVar176._0_4_;
  auVar227._4_4_ = fVar302 * auVar176._4_4_;
  auVar227._8_4_ = fVar303 * auVar176._8_4_;
  auVar227._12_4_ = fVar304 * auVar176._12_4_;
  auVar45._16_4_ = fVar305 * auVar176._16_4_;
  auVar45._0_16_ = auVar227;
  auVar45._20_4_ = fVar306 * auVar176._20_4_;
  auVar45._24_4_ = fVar308 * auVar176._24_4_;
  auVar45._28_4_ = auVar176._28_4_;
  auVar174 = vpminsd_avx(auVar42._16_16_,auVar431._16_16_);
  auVar231 = vpminsd_avx(auVar311,auVar247);
  auVar355._16_16_ = auVar174;
  auVar355._0_16_ = auVar231;
  auVar174 = vpminsd_avx(auVar40._16_16_,auVar371._16_16_);
  auVar231 = vpminsd_avx(auVar208,auVar270);
  auVar390._16_16_ = auVar174;
  auVar390._0_16_ = auVar231;
  auVar176 = vmaxps_avx(auVar355,auVar390);
  auVar174 = vpminsd_avx(auVar39._16_16_,auVar45._16_16_);
  auVar231 = vpminsd_avx(auVar173,auVar227);
  auVar408._16_16_ = auVar174;
  auVar408._0_16_ = auVar231;
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar420._4_4_ = uVar11;
  auVar420._0_4_ = uVar11;
  auVar420._8_4_ = uVar11;
  auVar420._12_4_ = uVar11;
  auVar420._16_4_ = uVar11;
  auVar420._20_4_ = uVar11;
  auVar420._24_4_ = uVar11;
  auVar420._28_4_ = uVar11;
  auVar186 = vmaxps_avx(auVar408,auVar420);
  auVar176 = vmaxps_avx(auVar176,auVar186);
  local_80._4_4_ = auVar176._4_4_ * 0.99999964;
  local_80._0_4_ = auVar176._0_4_ * 0.99999964;
  local_80._8_4_ = auVar176._8_4_ * 0.99999964;
  local_80._12_4_ = auVar176._12_4_ * 0.99999964;
  local_80._16_4_ = auVar176._16_4_ * 0.99999964;
  local_80._20_4_ = auVar176._20_4_ * 0.99999964;
  local_80._24_4_ = auVar176._24_4_ * 0.99999964;
  local_80._28_4_ = auVar176._28_4_;
  auVar174 = vpmaxsd_avx(auVar42._16_16_,auVar431._16_16_);
  auVar231 = vpmaxsd_avx(auVar311,auVar247);
  auVar253._16_16_ = auVar174;
  auVar253._0_16_ = auVar231;
  auVar174 = vpmaxsd_avx(auVar40._16_16_,auVar371._16_16_);
  auVar231 = vpmaxsd_avx(auVar208,auVar270);
  auVar212._16_16_ = auVar174;
  auVar212._0_16_ = auVar231;
  auVar176 = vminps_avx(auVar253,auVar212);
  auVar174 = vpmaxsd_avx(auVar39._16_16_,auVar45._16_16_);
  auVar231 = vpmaxsd_avx(auVar173,auVar227);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar238._4_4_ = uVar11;
  auVar238._0_4_ = uVar11;
  auVar238._8_4_ = uVar11;
  auVar238._12_4_ = uVar11;
  auVar238._16_4_ = uVar11;
  auVar238._20_4_ = uVar11;
  auVar238._24_4_ = uVar11;
  auVar238._28_4_ = uVar11;
  auVar178._16_16_ = auVar174;
  auVar178._0_16_ = auVar231;
  auVar186 = vminps_avx(auVar178,auVar238);
  auVar176 = vminps_avx(auVar176,auVar186);
  auVar44._4_4_ = auVar176._4_4_ * 1.0000004;
  auVar44._0_4_ = auVar176._0_4_ * 1.0000004;
  auVar44._8_4_ = auVar176._8_4_ * 1.0000004;
  auVar44._12_4_ = auVar176._12_4_ * 1.0000004;
  auVar44._16_4_ = auVar176._16_4_ * 1.0000004;
  auVar44._20_4_ = auVar176._20_4_ * 1.0000004;
  auVar44._24_4_ = auVar176._24_4_ * 1.0000004;
  auVar44._28_4_ = auVar176._28_4_;
  auVar176 = vcmpps_avx(local_80,auVar44,2);
  auVar174 = vpshufd_avx(ZEXT116((byte)PVar31),0);
  auVar213._16_16_ = auVar174;
  auVar213._0_16_ = auVar174;
  auVar186 = vcvtdq2ps_avx(auVar213);
  auVar186 = vcmpps_avx(_DAT_02020f40,auVar186,1);
  auVar176 = vandps_avx(auVar176,auVar186);
  uVar159 = vmovmskps_avx(auVar176);
  if (uVar159 != 0) {
    uVar159 = uVar159 & 0xff;
    local_688 = pre->ray_space + k;
    local_680 = mm_lookupmask_ps._16_8_;
    uStack_678 = mm_lookupmask_ps._24_8_;
    uStack_670 = mm_lookupmask_ps._16_8_;
    uStack_668 = mm_lookupmask_ps._24_8_;
    uVar165 = 1 << ((byte)k & 0x1f);
    local_768 = (undefined1 (*) [32])&local_1c0;
    local_770 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar165 & 0xf) << 4));
    local_778 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar165 >> 4) * 0x10);
    do {
      lVar166 = 0;
      if (uVar159 != 0) {
        for (; (uVar159 >> lVar166 & 1) == 0; lVar166 = lVar166 + 1) {
        }
      }
      uVar32 = *(uint *)(prim + 2);
      uVar33 = *(uint *)(prim + lVar166 * 4 + 6);
      pGVar168 = (context->scene->geometries).items[uVar32].ptr;
      uVar162 = (ulong)*(uint *)(*(long *)&pGVar168->field_0x58 +
                                (ulong)uVar33 *
                                pGVar168[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar246 = (pGVar168->time_range).lower;
      fVar246 = pGVar168->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar246) /
                ((pGVar168->time_range).upper - fVar246));
      auVar174 = vroundss_avx(ZEXT416((uint)fVar246),ZEXT416((uint)fVar246),9);
      auVar174 = vminss_avx(auVar174,ZEXT416((uint)(pGVar168->fnumTimeSegments + -1.0)));
      auVar174 = vmaxss_avx(ZEXT816(0) << 0x20,auVar174);
      fVar246 = fVar246 - auVar174._0_4_;
      _Var36 = pGVar168[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar164 = (long)(int)auVar174._0_4_ * 0x38;
      lVar169 = *(long *)(_Var36 + 0x10 + lVar164);
      lVar167 = *(long *)(_Var36 + 0x38 + lVar164);
      lVar37 = *(long *)(_Var36 + 0x48 + lVar164);
      auVar174 = vshufps_avx(ZEXT416((uint)fVar246),ZEXT416((uint)fVar246),0);
      pfVar1 = (float *)(lVar167 + lVar37 * uVar162);
      fVar244 = auVar174._0_4_;
      fVar260 = auVar174._4_4_;
      fVar262 = auVar174._8_4_;
      fVar243 = auVar174._12_4_;
      lVar166 = uVar162 + 1;
      pfVar2 = (float *)(lVar167 + lVar37 * lVar166);
      p_Var38 = pGVar168[4].occlusionFilterN;
      auVar174 = vshufps_avx(ZEXT416((uint)(1.0 - fVar246)),ZEXT416((uint)(1.0 - fVar246)),0);
      pfVar3 = (float *)(*(long *)(_Var36 + lVar164) + lVar169 * uVar162);
      fVar246 = auVar174._0_4_;
      fVar265 = auVar174._4_4_;
      fVar261 = auVar174._8_4_;
      fVar307 = auVar174._12_4_;
      pfVar4 = (float *)(*(long *)(_Var36 + lVar164) + lVar169 * lVar166);
      pfVar5 = (float *)(*(long *)(p_Var38 + lVar164 + 0x38) +
                        uVar162 * *(long *)(p_Var38 + lVar164 + 0x48));
      pfVar6 = (float *)(*(long *)(p_Var38 + lVar164 + 0x38) +
                        *(long *)(p_Var38 + lVar164 + 0x48) * lVar166);
      pfVar7 = (float *)(*(long *)(p_Var38 + lVar164) +
                        *(long *)(p_Var38 + lVar164 + 0x10) * uVar162);
      pfVar8 = (float *)(*(long *)(p_Var38 + lVar164) +
                        *(long *)(p_Var38 + lVar164 + 0x10) * lVar166);
      uVar34 = (uint)pGVar168[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar166 = (long)(int)uVar34 * 0x44;
      fVar346 = fVar246 * *pfVar3 + fVar244 * *pfVar1;
      fVar359 = fVar265 * pfVar3[1] + fVar260 * pfVar1[1];
      auVar348._0_8_ = CONCAT44(fVar359,fVar346);
      auVar348._8_4_ = fVar261 * pfVar3[2] + fVar262 * pfVar1[2];
      auVar348._12_4_ = fVar307 * pfVar3[3] + fVar243 * pfVar1[3];
      fVar417 = fVar246 * *pfVar4 + fVar244 * *pfVar2;
      fVar423 = fVar265 * pfVar4[1] + fVar260 * pfVar2[1];
      auVar419._0_8_ = CONCAT44(fVar423,fVar417);
      auVar419._8_4_ = fVar261 * pfVar4[2] + fVar262 * pfVar2[2];
      auVar419._12_4_ = fVar307 * pfVar4[3] + fVar243 * pfVar2[3];
      auVar174 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar233 = vinsertps_avx(auVar174,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      fVar325 = fVar346 + (fVar246 * *pfVar7 + fVar244 * *pfVar5) * 0.33333334;
      fVar336 = fVar359 + (fVar265 * pfVar7[1] + fVar260 * pfVar5[1]) * 0.33333334;
      auVar328._0_8_ = CONCAT44(fVar336,fVar325);
      auVar328._8_4_ = auVar348._8_4_ + (fVar261 * pfVar7[2] + fVar262 * pfVar5[2]) * 0.33333334;
      auVar328._12_4_ = auVar348._12_4_ + (fVar307 * pfVar7[3] + fVar243 * pfVar5[3]) * 0.33333334;
      auVar209._0_4_ = (fVar246 * *pfVar8 + fVar244 * *pfVar6) * 0.33333334;
      auVar209._4_4_ = (fVar265 * pfVar8[1] + fVar260 * pfVar6[1]) * 0.33333334;
      auVar209._8_4_ = (fVar261 * pfVar8[2] + fVar262 * pfVar6[2]) * 0.33333334;
      auVar209._12_4_ = (fVar307 * pfVar8[3] + fVar243 * pfVar6[3]) * 0.33333334;
      _local_720 = vsubps_avx(auVar419,auVar209);
      auVar249 = vsubps_avx(auVar348,auVar233);
      auVar174 = vshufps_avx(auVar249,auVar249,0);
      auVar231 = vshufps_avx(auVar249,auVar249,0x55);
      auVar249 = vshufps_avx(auVar249,auVar249,0xaa);
      fVar246 = (local_688->vx).field_0.m128[0];
      fVar244 = (local_688->vx).field_0.m128[1];
      fVar260 = (local_688->vx).field_0.m128[2];
      fVar262 = (local_688->vx).field_0.m128[3];
      fVar243 = (local_688->vy).field_0.m128[0];
      fVar265 = (local_688->vy).field_0.m128[1];
      fVar261 = (local_688->vy).field_0.m128[2];
      fVar307 = (local_688->vy).field_0.m128[3];
      fVar263 = (local_688->vz).field_0.m128[0];
      fVar264 = (local_688->vz).field_0.m128[1];
      fVar266 = (local_688->vz).field_0.m128[2];
      fVar268 = (local_688->vz).field_0.m128[3];
      auVar248._0_8_ =
           CONCAT44(auVar174._4_4_ * fVar244 + auVar231._4_4_ * fVar265 + fVar264 * auVar249._4_4_,
                    auVar174._0_4_ * fVar246 + auVar231._0_4_ * fVar243 + fVar263 * auVar249._0_4_);
      auVar248._8_4_ =
           auVar174._8_4_ * fVar260 + auVar231._8_4_ * fVar261 + fVar266 * auVar249._8_4_;
      auVar248._12_4_ =
           auVar174._12_4_ * fVar262 + auVar231._12_4_ * fVar307 + fVar268 * auVar249._12_4_;
      auVar174 = vblendps_avx(auVar248,auVar348,8);
      auVar43 = vsubps_avx(auVar328,auVar233);
      auVar231 = vshufps_avx(auVar43,auVar43,0);
      auVar249 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar329._0_4_ = auVar231._0_4_ * fVar246 + auVar249._0_4_ * fVar243 + fVar263 * auVar43._0_4_
      ;
      auVar329._4_4_ = auVar231._4_4_ * fVar244 + auVar249._4_4_ * fVar265 + fVar264 * auVar43._4_4_
      ;
      auVar329._8_4_ = auVar231._8_4_ * fVar260 + auVar249._8_4_ * fVar261 + fVar266 * auVar43._8_4_
      ;
      auVar329._12_4_ =
           auVar231._12_4_ * fVar262 + auVar249._12_4_ * fVar307 + fVar268 * auVar43._12_4_;
      auVar231 = vblendps_avx(auVar329,auVar328,8);
      auVar12 = vsubps_avx(_local_720,auVar233);
      auVar249 = vshufps_avx(auVar12,auVar12,0);
      auVar43 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar349._0_4_ = auVar249._0_4_ * fVar246 + auVar43._0_4_ * fVar243 + auVar12._0_4_ * fVar263;
      auVar349._4_4_ = auVar249._4_4_ * fVar244 + auVar43._4_4_ * fVar265 + auVar12._4_4_ * fVar264;
      auVar349._8_4_ = auVar249._8_4_ * fVar260 + auVar43._8_4_ * fVar261 + auVar12._8_4_ * fVar266;
      auVar349._12_4_ =
           auVar249._12_4_ * fVar262 + auVar43._12_4_ * fVar307 + auVar12._12_4_ * fVar268;
      auVar249 = vblendps_avx(auVar349,_local_720,8);
      auVar12 = vsubps_avx(auVar419,auVar233);
      auVar233 = vshufps_avx(auVar12,auVar12,0);
      auVar43 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar210._0_4_ = auVar233._0_4_ * fVar246 + auVar43._0_4_ * fVar243 + fVar263 * auVar12._0_4_;
      auVar210._4_4_ = auVar233._4_4_ * fVar244 + auVar43._4_4_ * fVar265 + fVar264 * auVar12._4_4_;
      auVar210._8_4_ = auVar233._8_4_ * fVar260 + auVar43._8_4_ * fVar261 + fVar266 * auVar12._8_4_;
      auVar210._12_4_ =
           auVar233._12_4_ * fVar262 + auVar43._12_4_ * fVar307 + fVar268 * auVar12._12_4_;
      auVar233 = vblendps_avx(auVar210,auVar419,8);
      auVar271._8_4_ = 0x7fffffff;
      auVar271._0_8_ = 0x7fffffff7fffffff;
      auVar271._12_4_ = 0x7fffffff;
      auVar174 = vandps_avx(auVar174,auVar271);
      auVar231 = vandps_avx(auVar231,auVar271);
      auVar43 = vmaxps_avx(auVar174,auVar231);
      auVar174 = vandps_avx(auVar249,auVar271);
      auVar231 = vandps_avx(auVar233,auVar271);
      auVar174 = vmaxps_avx(auVar174,auVar231);
      auVar174 = vmaxps_avx(auVar43,auVar174);
      auVar231 = vmovshdup_avx(auVar174);
      auVar231 = vmaxss_avx(auVar231,auVar174);
      auVar174 = vshufpd_avx(auVar174,auVar174,1);
      auVar174 = vmaxss_avx(auVar174,auVar231);
      fVar285 = *(float *)(bezier_basis0 + lVar166 + 0x908);
      fVar289 = *(float *)(bezier_basis0 + lVar166 + 0x90c);
      fVar290 = *(float *)(bezier_basis0 + lVar166 + 0x910);
      fVar291 = *(float *)(bezier_basis0 + lVar166 + 0x914);
      fVar292 = *(float *)(bezier_basis0 + lVar166 + 0x918);
      fVar302 = *(float *)(bezier_basis0 + lVar166 + 0x91c);
      fVar303 = *(float *)(bezier_basis0 + lVar166 + 0x920);
      auVar231 = vshufps_avx(auVar349,auVar349,0);
      register0x00001310 = auVar231;
      _local_700 = auVar231;
      auVar249 = vshufps_avx(auVar349,auVar349,0x55);
      register0x00001290 = auVar249;
      _local_580 = auVar249;
      fVar246 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar166 + 0xd8c);
      fVar244 = *(float *)(bezier_basis0 + lVar166 + 0xd90);
      fVar260 = *(float *)(bezier_basis0 + lVar166 + 0xd94);
      fVar262 = *(float *)(bezier_basis0 + lVar166 + 0xd98);
      fVar243 = *(float *)(bezier_basis0 + lVar166 + 0xd9c);
      fVar265 = *(float *)(bezier_basis0 + lVar166 + 0xda0);
      fVar261 = *(float *)(bezier_basis0 + lVar166 + 0xda4);
      auVar154 = *(undefined1 (*) [28])(bezier_basis0 + lVar166 + 0xd8c);
      auVar233 = vshufps_avx(auVar210,auVar210,0);
      register0x00001510 = auVar233;
      _local_500 = auVar233;
      fVar394 = auVar233._0_4_;
      fVar403 = auVar233._4_4_;
      fVar404 = auVar233._8_4_;
      fVar405 = auVar233._12_4_;
      fVar344 = auVar231._0_4_;
      fVar278 = auVar231._4_4_;
      fVar282 = auVar231._8_4_;
      fVar286 = auVar231._12_4_;
      auVar231 = vshufps_avx(auVar210,auVar210,0x55);
      register0x000015d0 = auVar231;
      _local_520 = auVar231;
      fVar427 = auVar231._0_4_;
      fVar433 = auVar231._4_4_;
      fVar434 = auVar231._8_4_;
      fVar435 = auVar231._12_4_;
      fVar338 = auVar249._0_4_;
      fVar340 = auVar249._4_4_;
      fVar342 = auVar249._8_4_;
      fVar343 = auVar249._12_4_;
      auVar231 = vshufps_avx(_local_720,_local_720,0xff);
      register0x00001390 = auVar231;
      _local_300 = auVar231;
      auVar249 = vshufps_avx(auVar419,auVar419,0xff);
      register0x00001590 = auVar249;
      _local_2e0 = auVar249;
      fVar412 = auVar249._0_4_;
      fVar414 = auVar249._4_4_;
      fVar416 = auVar249._8_4_;
      fVar418 = auVar249._12_4_;
      fVar269 = auVar231._0_4_;
      fVar280 = auVar231._4_4_;
      fVar284 = auVar231._8_4_;
      auVar249 = vshufps_avx(auVar329,auVar329,0);
      register0x00001550 = auVar249;
      _local_540 = auVar249;
      fVar307 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar166 + 0x484);
      fVar263 = *(float *)(bezier_basis0 + lVar166 + 0x488);
      fVar264 = *(float *)(bezier_basis0 + lVar166 + 0x48c);
      fVar266 = *(float *)(bezier_basis0 + lVar166 + 0x490);
      fVar268 = *(float *)(bezier_basis0 + lVar166 + 0x494);
      fVar277 = *(float *)(bezier_basis0 + lVar166 + 0x498);
      fVar281 = *(float *)(bezier_basis0 + lVar166 + 0x49c);
      auVar155 = *(undefined1 (*) [28])(bezier_basis0 + lVar166 + 0x484);
      fVar304 = *(float *)(bezier_basis0 + lVar166 + 0x4a0);
      fVar406 = auVar249._0_4_;
      fVar411 = auVar249._4_4_;
      fVar413 = auVar249._8_4_;
      fVar415 = auVar249._12_4_;
      auVar249 = vshufps_avx(auVar329,auVar329,0x55);
      register0x00001210 = auVar249;
      _local_5a0 = auVar249;
      fVar170 = auVar249._0_4_;
      fVar194 = auVar249._4_4_;
      fVar197 = auVar249._8_4_;
      fVar327 = auVar249._12_4_;
      auVar233 = vpermilps_avx(auVar328,0xff);
      register0x00001410 = auVar233;
      _local_a0 = auVar233;
      fVar288 = auVar233._0_4_;
      fVar347 = auVar233._4_4_;
      fVar360 = auVar233._8_4_;
      auVar138._8_4_ = auVar248._8_4_;
      auVar138._0_8_ = auVar248._0_8_;
      auVar138._12_4_ = auVar248._12_4_;
      auVar249 = vshufps_avx(auVar138,auVar138,0);
      register0x00001310 = auVar249;
      _local_2c0 = auVar249;
      fVar305 = *(float *)(bezier_basis0 + lVar166);
      fVar306 = *(float *)(bezier_basis0 + lVar166 + 4);
      fVar308 = *(float *)(bezier_basis0 + lVar166 + 8);
      fVar363 = *(float *)(bezier_basis0 + lVar166 + 0xc);
      fVar364 = *(float *)(bezier_basis0 + lVar166 + 0x10);
      fVar267 = *(float *)(bezier_basis0 + lVar166 + 0x14);
      fVar245 = *(float *)(bezier_basis0 + lVar166 + 0x18);
      fVar345 = auVar249._0_4_;
      fVar279 = auVar249._4_4_;
      fVar283 = auVar249._8_4_;
      fVar287 = auVar249._12_4_;
      auVar391._0_4_ = fVar345 * fVar305 + fVar406 * fVar307 + fVar344 * fVar285 + fVar394 * fVar246
      ;
      auVar391._4_4_ = fVar279 * fVar306 + fVar411 * fVar263 + fVar278 * fVar289 + fVar403 * fVar244
      ;
      auVar391._8_4_ = fVar283 * fVar308 + fVar413 * fVar264 + fVar282 * fVar290 + fVar404 * fVar260
      ;
      auVar391._12_4_ =
           fVar287 * fVar363 + fVar415 * fVar266 + fVar286 * fVar291 + fVar405 * fVar262;
      auVar391._16_4_ =
           fVar345 * fVar364 + fVar406 * fVar268 + fVar344 * fVar292 + fVar394 * fVar243;
      auVar391._20_4_ =
           fVar279 * fVar267 + fVar411 * fVar277 + fVar278 * fVar302 + fVar403 * fVar265;
      auVar391._24_4_ =
           fVar283 * fVar245 + fVar413 * fVar281 + fVar282 * fVar303 + fVar404 * fVar261;
      auVar391._28_4_ = fVar304 + 0.0;
      auVar249 = vshufps_avx(auVar138,auVar138,0x55);
      register0x000013d0 = auVar249;
      _local_320 = auVar249;
      fVar326 = auVar249._0_4_;
      fVar337 = auVar249._4_4_;
      fVar339 = auVar249._8_4_;
      fVar341 = auVar249._12_4_;
      auVar369._0_4_ = fVar326 * fVar305 + fVar170 * fVar307 + fVar338 * fVar285 + fVar427 * fVar246
      ;
      auVar369._4_4_ = fVar337 * fVar306 + fVar194 * fVar263 + fVar340 * fVar289 + fVar433 * fVar244
      ;
      auVar369._8_4_ = fVar339 * fVar308 + fVar197 * fVar264 + fVar342 * fVar290 + fVar434 * fVar260
      ;
      auVar369._12_4_ =
           fVar341 * fVar363 + fVar327 * fVar266 + fVar343 * fVar291 + fVar435 * fVar262;
      auVar369._16_4_ =
           fVar326 * fVar364 + fVar170 * fVar268 + fVar338 * fVar292 + fVar427 * fVar243;
      auVar369._20_4_ =
           fVar337 * fVar267 + fVar194 * fVar277 + fVar340 * fVar302 + fVar433 * fVar265;
      auVar369._24_4_ =
           fVar339 * fVar245 + fVar197 * fVar281 + fVar342 * fVar303 + fVar434 * fVar261;
      auVar369._28_4_ = fVar327 + fVar343 + 0.0 + 0.0;
      auVar249 = vpermilps_avx(auVar348,0xff);
      register0x00001490 = auVar249;
      _local_c0 = auVar249;
      fVar361 = auVar249._0_4_;
      fVar362 = auVar249._4_4_;
      fVar385 = auVar249._8_4_;
      local_980._0_4_ =
           fVar361 * fVar305 + fVar288 * fVar307 + fVar269 * fVar285 + fVar412 * fVar246;
      local_980._4_4_ =
           fVar362 * fVar306 + fVar347 * fVar263 + fVar280 * fVar289 + fVar414 * fVar244;
      fStack_978 = fVar385 * fVar308 + fVar360 * fVar264 + fVar284 * fVar290 + fVar416 * fVar260;
      fStack_974 = auVar249._12_4_ * fVar363 +
                   auVar233._12_4_ * fVar266 + auVar231._12_4_ * fVar291 + fVar418 * fVar262;
      fStack_970 = fVar361 * fVar364 + fVar288 * fVar268 + fVar269 * fVar292 + fVar412 * fVar243;
      fStack_96c = fVar362 * fVar267 + fVar347 * fVar277 + fVar280 * fVar302 + fVar414 * fVar265;
      fStack_968 = fVar385 * fVar245 + fVar360 * fVar281 + fVar284 * fVar303 + fVar416 * fVar261;
      fStack_964 = *(float *)(bezier_basis0 + lVar166 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar171 = *(float *)(bezier_basis1 + lVar166 + 0x908);
      fVar309 = *(float *)(bezier_basis1 + lVar166 + 0x90c);
      fVar195 = *(float *)(bezier_basis1 + lVar166 + 0x910);
      fVar376 = *(float *)(bezier_basis1 + lVar166 + 0x914);
      fVar198 = *(float *)(bezier_basis1 + lVar166 + 0x918);
      fVar199 = *(float *)(bezier_basis1 + lVar166 + 0x91c);
      fVar172 = *(float *)(bezier_basis1 + lVar166 + 0x920);
      fVar196 = *(float *)(bezier_basis1 + lVar166 + 0xd8c);
      fVar200 = *(float *)(bezier_basis1 + lVar166 + 0xd90);
      fVar201 = *(float *)(bezier_basis1 + lVar166 + 0xd94);
      fVar202 = *(float *)(bezier_basis1 + lVar166 + 0xd98);
      fStack_5d0 = *(float *)(bezier_basis1 + lVar166 + 0xd9c);
      fStack_5cc = *(float *)(bezier_basis1 + lVar166 + 0xda0);
      fStack_5c8 = *(float *)(bezier_basis1 + lVar166 + 0xda4);
      fStack_5c4 = *(float *)(bezier_basis1 + lVar166 + 0xda8);
      fVar203 = *(float *)(bezier_basis1 + lVar166 + 0x484);
      fVar204 = *(float *)(bezier_basis1 + lVar166 + 0x488);
      fVar205 = *(float *)(bezier_basis1 + lVar166 + 0x48c);
      fVar206 = *(float *)(bezier_basis1 + lVar166 + 0x490);
      fVar226 = *(float *)(bezier_basis1 + lVar166 + 0x494);
      fVar310 = *(float *)(bezier_basis1 + lVar166 + 0x498);
      fVar318 = *(float *)(bezier_basis1 + lVar166 + 0x49c);
      fVar244 = fVar415 + fStack_964 + 0.0;
      fVar319 = *(float *)(bezier_basis1 + lVar166);
      fVar320 = *(float *)(bezier_basis1 + lVar166 + 4);
      fVar321 = *(float *)(bezier_basis1 + lVar166 + 8);
      fVar322 = *(float *)(bezier_basis1 + lVar166 + 0xc);
      fVar323 = *(float *)(bezier_basis1 + lVar166 + 0x10);
      fVar324 = *(float *)(bezier_basis1 + lVar166 + 0x14);
      fVar375 = *(float *)(bezier_basis1 + lVar166 + 0x18);
      auVar272._0_4_ = fVar345 * fVar319 + fVar406 * fVar203 + fVar344 * fVar171 + fVar394 * fVar196
      ;
      auVar272._4_4_ = fVar279 * fVar320 + fVar411 * fVar204 + fVar278 * fVar309 + fVar403 * fVar200
      ;
      auVar272._8_4_ = fVar283 * fVar321 + fVar413 * fVar205 + fVar282 * fVar195 + fVar404 * fVar201
      ;
      auVar272._12_4_ =
           fVar287 * fVar322 + fVar415 * fVar206 + fVar286 * fVar376 + fVar405 * fVar202;
      auVar272._16_4_ =
           fVar345 * fVar323 + fVar406 * fVar226 + fVar344 * fVar198 + fVar394 * fStack_5d0;
      auVar272._20_4_ =
           fVar279 * fVar324 + fVar411 * fVar310 + fVar278 * fVar199 + fVar403 * fStack_5cc;
      auVar272._24_4_ =
           fVar283 * fVar375 + fVar413 * fVar318 + fVar282 * fVar172 + fVar404 * fStack_5c8;
      auVar272._28_4_ = fVar418 + fVar244;
      auVar254._0_4_ = fVar326 * fVar319 + fVar170 * fVar203 + fVar171 * fVar338 + fVar427 * fVar196
      ;
      auVar254._4_4_ = fVar337 * fVar320 + fVar194 * fVar204 + fVar309 * fVar340 + fVar433 * fVar200
      ;
      auVar254._8_4_ = fVar339 * fVar321 + fVar197 * fVar205 + fVar195 * fVar342 + fVar434 * fVar201
      ;
      auVar254._12_4_ =
           fVar341 * fVar322 + fVar327 * fVar206 + fVar376 * fVar343 + fVar435 * fVar202;
      auVar254._16_4_ =
           fVar326 * fVar323 + fVar170 * fVar226 + fVar198 * fVar338 + fVar427 * fStack_5d0;
      auVar254._20_4_ =
           fVar337 * fVar324 + fVar194 * fVar310 + fVar199 * fVar340 + fVar433 * fStack_5cc;
      auVar254._24_4_ =
           fVar339 * fVar375 + fVar197 * fVar318 + fVar172 * fVar342 + fVar434 * fStack_5c8;
      auVar254._28_4_ = fVar244 + fVar415 + fVar304 + 0.0;
      local_8c0._0_4_ =
           fVar288 * fVar203 + fVar171 * fVar269 + fVar412 * fVar196 + fVar361 * fVar319;
      local_8c0._4_4_ =
           fVar347 * fVar204 + fVar309 * fVar280 + fVar414 * fVar200 + fVar362 * fVar320;
      fStack_8b8 = fVar360 * fVar205 + fVar195 * fVar284 + fVar416 * fVar201 + fVar385 * fVar321;
      fStack_8b4 = auVar233._12_4_ * fVar206 + fVar376 * auVar231._12_4_ + fVar418 * fVar202 +
                   auVar249._12_4_ * fVar322;
      register0x00001490 =
           fVar288 * fVar226 + fVar198 * fVar269 + fVar412 * fStack_5d0 + fVar361 * fVar323;
      register0x00001494 =
           fVar347 * fVar310 + fVar199 * fVar280 + fVar414 * fStack_5cc + fVar362 * fVar324;
      register0x00001498 =
           fVar360 * fVar318 + fVar172 * fVar284 + fVar416 * fStack_5c8 + fVar385 * fVar375;
      register0x0000149c = fVar415 + fVar286 + fVar304 + fVar244;
      auVar39 = vsubps_avx(auVar272,auVar391);
      auVar335 = ZEXT3264(auVar39);
      auVar40 = vsubps_avx(auVar254,auVar369);
      fVar246 = auVar39._0_4_;
      fVar260 = auVar39._4_4_;
      auVar46._4_4_ = auVar369._4_4_ * fVar260;
      auVar46._0_4_ = auVar369._0_4_ * fVar246;
      fVar243 = auVar39._8_4_;
      auVar46._8_4_ = auVar369._8_4_ * fVar243;
      fVar261 = auVar39._12_4_;
      auVar46._12_4_ = auVar369._12_4_ * fVar261;
      fVar263 = auVar39._16_4_;
      auVar46._16_4_ = auVar369._16_4_ * fVar263;
      fVar266 = auVar39._20_4_;
      auVar46._20_4_ = auVar369._20_4_ * fVar266;
      fVar277 = auVar39._24_4_;
      auVar46._24_4_ = auVar369._24_4_ * fVar277;
      auVar46._28_4_ = fVar244;
      fVar244 = auVar40._0_4_;
      fVar262 = auVar40._4_4_;
      auVar47._4_4_ = auVar391._4_4_ * fVar262;
      auVar47._0_4_ = auVar391._0_4_ * fVar244;
      fVar265 = auVar40._8_4_;
      auVar47._8_4_ = auVar391._8_4_ * fVar265;
      fVar307 = auVar40._12_4_;
      auVar47._12_4_ = auVar391._12_4_ * fVar307;
      fVar264 = auVar40._16_4_;
      auVar47._16_4_ = auVar391._16_4_ * fVar264;
      fVar268 = auVar40._20_4_;
      auVar47._20_4_ = auVar391._20_4_ * fVar268;
      fVar281 = auVar40._24_4_;
      auVar47._24_4_ = auVar391._24_4_ * fVar281;
      auVar47._28_4_ = auVar254._28_4_;
      auVar186 = vsubps_avx(auVar46,auVar47);
      auVar176 = vmaxps_avx(_local_980,_local_8c0);
      auVar48._4_4_ = auVar176._4_4_ * auVar176._4_4_ * (fVar260 * fVar260 + fVar262 * fVar262);
      auVar48._0_4_ = auVar176._0_4_ * auVar176._0_4_ * (fVar246 * fVar246 + fVar244 * fVar244);
      auVar48._8_4_ = auVar176._8_4_ * auVar176._8_4_ * (fVar243 * fVar243 + fVar265 * fVar265);
      auVar48._12_4_ = auVar176._12_4_ * auVar176._12_4_ * (fVar261 * fVar261 + fVar307 * fVar307);
      auVar48._16_4_ = auVar176._16_4_ * auVar176._16_4_ * (fVar263 * fVar263 + fVar264 * fVar264);
      auVar48._20_4_ = auVar176._20_4_ * auVar176._20_4_ * (fVar266 * fVar266 + fVar268 * fVar268);
      auVar48._24_4_ = auVar176._24_4_ * auVar176._24_4_ * (fVar277 * fVar277 + fVar281 * fVar281);
      auVar48._28_4_ = auVar272._28_4_ + auVar254._28_4_;
      auVar49._4_4_ = auVar186._4_4_ * auVar186._4_4_;
      auVar49._0_4_ = auVar186._0_4_ * auVar186._0_4_;
      auVar49._8_4_ = auVar186._8_4_ * auVar186._8_4_;
      auVar49._12_4_ = auVar186._12_4_ * auVar186._12_4_;
      auVar49._16_4_ = auVar186._16_4_ * auVar186._16_4_;
      auVar49._20_4_ = auVar186._20_4_ * auVar186._20_4_;
      auVar49._24_4_ = auVar186._24_4_ * auVar186._24_4_;
      auVar49._28_4_ = auVar186._28_4_;
      auVar176 = vcmpps_avx(auVar49,auVar48,2);
      auVar242 = ZEXT3264(auVar176);
      auVar231 = ZEXT416((uint)(float)(int)uVar34);
      local_560._0_16_ = auVar231;
      auVar231 = vshufps_avx(auVar231,auVar231,0);
      auVar255._16_16_ = auVar231;
      auVar255._0_16_ = auVar231;
      auVar186 = vcmpps_avx(_DAT_02020f40,auVar255,1);
      auVar259 = ZEXT3264(auVar186);
      auVar139._8_4_ = auVar248._8_4_;
      auVar139._0_8_ = auVar248._0_8_;
      auVar139._12_4_ = auVar248._12_4_;
      auVar231 = vpermilps_avx(auVar139,0xaa);
      auVar356._16_16_ = auVar231;
      auVar356._0_16_ = auVar231;
      auVar249 = vpermilps_avx(auVar329,0xaa);
      register0x00001550 = auVar249;
      _local_4e0 = auVar249;
      auVar233 = vpermilps_avx(auVar349,0xaa);
      register0x00001590 = auVar233;
      _local_e0 = auVar233;
      auVar43 = vpermilps_avx(auVar210,0xaa);
      register0x00001310 = auVar43;
      _local_6e0 = auVar43;
      auVar41 = auVar186 & auVar176;
      uVar165 = *(uint *)(ray + k * 4 + 0x60);
      auVar174 = ZEXT416((uint)(auVar174._0_4_ * 4.7683716e-07));
      local_8a0._0_16_ = auVar174;
      uStack_908 = auVar348._8_8_;
      auVar371 = local_660;
      auVar357 = local_640;
      if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar41 >> 0x7f,0) != '\0') ||
            (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar41 >> 0xbf,0) != '\0') ||
          (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar41[0x1f] < '\0') {
        local_340 = vandps_avx(auVar176,auVar186);
        fVar347 = auVar231._0_4_;
        fVar360 = auVar231._4_4_;
        fVar361 = auVar231._8_4_;
        fVar362 = auVar231._12_4_;
        fVar385 = auVar249._0_4_;
        fVar412 = auVar249._4_4_;
        fVar414 = auVar249._8_4_;
        fVar416 = auVar249._12_4_;
        fVar418 = auVar233._0_4_;
        fVar424 = auVar233._4_4_;
        fVar425 = auVar233._8_4_;
        fVar426 = auVar233._12_4_;
        fVar269 = auVar43._0_4_;
        fVar280 = auVar43._4_4_;
        fVar284 = auVar43._8_4_;
        fVar288 = auVar43._12_4_;
        fVar246 = auVar186._28_4_ +
                  *(float *)(bezier_basis1 + lVar166 + 0x924) +
                  *(float *)(bezier_basis1 + lVar166 + 0x4a0);
        local_5e0 = fVar347 * fVar319 + fVar385 * fVar203 + fVar418 * fVar171 + fVar269 * fVar196;
        fStack_5dc = fVar360 * fVar320 + fVar412 * fVar204 + fVar424 * fVar309 + fVar280 * fVar200;
        fStack_5d8 = fVar361 * fVar321 + fVar414 * fVar205 + fVar425 * fVar195 + fVar284 * fVar201;
        fStack_5d4 = fVar362 * fVar322 + fVar416 * fVar206 + fVar426 * fVar376 + fVar288 * fVar202;
        fStack_5d0 = fVar347 * fVar323 +
                     fVar385 * fVar226 + fVar418 * fVar198 + fVar269 * fStack_5d0;
        fStack_5cc = fVar360 * fVar324 +
                     fVar412 * fVar310 + fVar424 * fVar199 + fVar280 * fStack_5cc;
        fStack_5c8 = fVar361 * fVar375 +
                     fVar414 * fVar318 + fVar425 * fVar172 + fVar284 * fStack_5c8;
        fStack_5c4 = local_340._28_4_ + fVar246;
        local_880._0_4_ = auVar155._0_4_;
        local_880._4_4_ = auVar155._4_4_;
        uStack_878._0_4_ = auVar155._8_4_;
        uStack_878._4_4_ = auVar155._12_4_;
        uStack_870._0_4_ = auVar155._16_4_;
        uStack_870._4_4_ = auVar155._20_4_;
        uStack_868._0_4_ = auVar155._24_4_;
        local_860._0_4_ = auVar154._0_4_;
        local_860._4_4_ = auVar154._4_4_;
        uStack_858._0_4_ = auVar154._8_4_;
        uStack_858._4_4_ = auVar154._12_4_;
        fStack_850 = auVar154._16_4_;
        fStack_84c = auVar154._20_4_;
        fStack_848 = auVar154._24_4_;
        fVar171 = fVar347 * fVar305 +
                  fVar385 * (float)local_880._0_4_ +
                  fVar418 * fVar285 + fVar269 * (float)local_860._0_4_;
        fVar195 = fVar360 * fVar306 +
                  fVar412 * (float)local_880._4_4_ +
                  fVar424 * fVar289 + fVar280 * (float)local_860._4_4_;
        fVar198 = fVar361 * fVar308 +
                  fVar414 * (float)uStack_878 + fVar425 * fVar290 + fVar284 * (float)uStack_858;
        fVar172 = fVar362 * fVar363 +
                  fVar416 * uStack_878._4_4_ + fVar426 * fVar291 + fVar288 * uStack_858._4_4_;
        fStack_830 = fVar347 * fVar364 +
                     fVar385 * (float)uStack_870 + fVar418 * fVar292 + fVar269 * fStack_850;
        fStack_82c = fVar360 * fVar267 +
                     fVar412 * uStack_870._4_4_ + fVar424 * fVar302 + fVar280 * fStack_84c;
        fStack_828 = fVar361 * fVar245 +
                     fVar414 * (float)uStack_868 + fVar425 * fVar303 + fVar284 * fStack_848;
        fStack_824 = fStack_5c4 + fVar246 + local_340._28_4_ + auVar186._28_4_;
        fVar246 = *(float *)(bezier_basis0 + lVar166 + 0x1210);
        fVar244 = *(float *)(bezier_basis0 + lVar166 + 0x1214);
        fVar260 = *(float *)(bezier_basis0 + lVar166 + 0x1218);
        fVar262 = *(float *)(bezier_basis0 + lVar166 + 0x121c);
        fVar243 = *(float *)(bezier_basis0 + lVar166 + 0x1220);
        fVar265 = *(float *)(bezier_basis0 + lVar166 + 0x1224);
        fVar261 = *(float *)(bezier_basis0 + lVar166 + 0x1228);
        fVar307 = *(float *)(bezier_basis0 + lVar166 + 0x1694);
        fVar263 = *(float *)(bezier_basis0 + lVar166 + 0x1698);
        fVar264 = *(float *)(bezier_basis0 + lVar166 + 0x169c);
        fVar266 = *(float *)(bezier_basis0 + lVar166 + 0x16a0);
        fVar268 = *(float *)(bezier_basis0 + lVar166 + 0x16a4);
        fVar277 = *(float *)(bezier_basis0 + lVar166 + 0x16a8);
        fVar281 = *(float *)(bezier_basis0 + lVar166 + 0x16ac);
        fVar285 = *(float *)(bezier_basis0 + lVar166 + 0x1b18);
        fVar289 = *(float *)(bezier_basis0 + lVar166 + 0x1b1c);
        fVar290 = *(float *)(bezier_basis0 + lVar166 + 0x1b20);
        fVar291 = *(float *)(bezier_basis0 + lVar166 + 0x1b24);
        fVar292 = *(float *)(bezier_basis0 + lVar166 + 0x1b28);
        fVar302 = *(float *)(bezier_basis0 + lVar166 + 0x1b2c);
        fVar303 = *(float *)(bezier_basis0 + lVar166 + 0x1b30);
        fVar304 = *(float *)(bezier_basis0 + lVar166 + 0x1f9c);
        fVar305 = *(float *)(bezier_basis0 + lVar166 + 0x1fa0);
        fVar306 = *(float *)(bezier_basis0 + lVar166 + 0x1fa4);
        fVar308 = *(float *)(bezier_basis0 + lVar166 + 0x1fa8);
        fVar363 = *(float *)(bezier_basis0 + lVar166 + 0x1fac);
        fVar364 = *(float *)(bezier_basis0 + lVar166 + 0x1fb0);
        fVar267 = *(float *)(bezier_basis0 + lVar166 + 0x1fb4);
        fVar309 = auVar369._28_4_ + *(float *)(bezier_basis1 + lVar166 + 0x4a0);
        fVar245 = *(float *)(bezier_basis0 + lVar166 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar166 + 0x1fb8);
        fVar376 = *(float *)(bezier_basis0 + lVar166 + 0x16b0) + fVar245;
        local_5c0 = fVar345 * fVar246 + fVar406 * fVar307 + fVar344 * fVar285 + fVar394 * fVar304;
        fStack_5bc = fVar279 * fVar244 + fVar411 * fVar263 + fVar278 * fVar289 + fVar403 * fVar305;
        fStack_5b8 = fVar283 * fVar260 + fVar413 * fVar264 + fVar282 * fVar290 + fVar404 * fVar306;
        fStack_5b4 = fVar287 * fVar262 + fVar415 * fVar266 + fVar286 * fVar291 + fVar405 * fVar308;
        fStack_5b0 = fVar345 * fVar243 + fVar406 * fVar268 + fVar344 * fVar292 + fVar394 * fVar363;
        fStack_5ac = fVar279 * fVar265 + fVar411 * fVar277 + fVar278 * fVar302 + fVar403 * fVar364;
        fStack_5a8 = fVar283 * fVar261 + fVar413 * fVar281 + fVar282 * fVar303 + fVar404 * fVar267;
        fStack_5a4 = *(float *)(bezier_basis0 + lVar166 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar166 + 0x1fb8) + fVar309;
        auVar214._0_4_ =
             fVar326 * fVar246 + fVar170 * fVar307 + fVar338 * fVar285 + fVar427 * fVar304;
        auVar214._4_4_ =
             fVar337 * fVar244 + fVar194 * fVar263 + fVar340 * fVar289 + fVar433 * fVar305;
        auVar214._8_4_ =
             fVar339 * fVar260 + fVar197 * fVar264 + fVar342 * fVar290 + fVar434 * fVar306;
        auVar214._12_4_ =
             fVar341 * fVar262 + fVar327 * fVar266 + fVar343 * fVar291 + fVar435 * fVar308;
        auVar214._16_4_ =
             fVar326 * fVar243 + fVar170 * fVar268 + fVar338 * fVar292 + fVar427 * fVar363;
        auVar214._20_4_ =
             fVar337 * fVar265 + fVar194 * fVar277 + fVar340 * fVar302 + fVar433 * fVar364;
        auVar214._24_4_ =
             fVar339 * fVar261 + fVar197 * fVar281 + fVar342 * fVar303 + fVar434 * fVar267;
        auVar214._28_4_ =
             fVar245 + fVar309 + auVar369._28_4_ + *(float *)(bezier_basis1 + lVar166 + 0x1c);
        auVar295._0_4_ =
             fVar385 * fVar307 + fVar418 * fVar285 + fVar269 * fVar304 + fVar347 * fVar246;
        auVar295._4_4_ =
             fVar412 * fVar263 + fVar424 * fVar289 + fVar280 * fVar305 + fVar360 * fVar244;
        auVar295._8_4_ =
             fVar414 * fVar264 + fVar425 * fVar290 + fVar284 * fVar306 + fVar361 * fVar260;
        auVar295._12_4_ =
             fVar416 * fVar266 + fVar426 * fVar291 + fVar288 * fVar308 + fVar362 * fVar262;
        auVar295._16_4_ =
             fVar385 * fVar268 + fVar418 * fVar292 + fVar269 * fVar363 + fVar347 * fVar243;
        auVar295._20_4_ =
             fVar412 * fVar277 + fVar424 * fVar302 + fVar280 * fVar364 + fVar360 * fVar265;
        auVar295._24_4_ =
             fVar414 * fVar281 + fVar425 * fVar303 + fVar284 * fVar267 + fVar361 * fVar261;
        auVar295._28_4_ = fVar376 + *(float *)(bezier_basis0 + lVar166 + 0x122c);
        fVar246 = *(float *)(bezier_basis1 + lVar166 + 0x1b18);
        fVar244 = *(float *)(bezier_basis1 + lVar166 + 0x1b1c);
        fVar260 = *(float *)(bezier_basis1 + lVar166 + 0x1b20);
        fVar262 = *(float *)(bezier_basis1 + lVar166 + 0x1b24);
        fVar243 = *(float *)(bezier_basis1 + lVar166 + 0x1b28);
        fVar265 = *(float *)(bezier_basis1 + lVar166 + 0x1b2c);
        fVar261 = *(float *)(bezier_basis1 + lVar166 + 0x1b30);
        fVar307 = *(float *)(bezier_basis1 + lVar166 + 0x1f9c);
        fVar263 = *(float *)(bezier_basis1 + lVar166 + 0x1fa0);
        fVar264 = *(float *)(bezier_basis1 + lVar166 + 0x1fa4);
        fVar266 = *(float *)(bezier_basis1 + lVar166 + 0x1fa8);
        fVar268 = *(float *)(bezier_basis1 + lVar166 + 0x1fac);
        fVar277 = *(float *)(bezier_basis1 + lVar166 + 0x1fb0);
        fVar281 = *(float *)(bezier_basis1 + lVar166 + 0x1fb4);
        fVar285 = *(float *)(bezier_basis1 + lVar166 + 0x1694);
        fVar289 = *(float *)(bezier_basis1 + lVar166 + 0x1698);
        fVar290 = *(float *)(bezier_basis1 + lVar166 + 0x169c);
        fVar291 = *(float *)(bezier_basis1 + lVar166 + 0x16a0);
        fVar292 = *(float *)(bezier_basis1 + lVar166 + 0x16a4);
        fVar302 = *(float *)(bezier_basis1 + lVar166 + 0x16a8);
        fVar303 = *(float *)(bezier_basis1 + lVar166 + 0x16ac);
        fVar304 = *(float *)(bezier_basis1 + lVar166 + 0x1210);
        fVar305 = *(float *)(bezier_basis1 + lVar166 + 0x1214);
        fVar306 = *(float *)(bezier_basis1 + lVar166 + 0x1218);
        fVar308 = *(float *)(bezier_basis1 + lVar166 + 0x121c);
        fVar363 = *(float *)(bezier_basis1 + lVar166 + 0x1220);
        fVar364 = *(float *)(bezier_basis1 + lVar166 + 0x1224);
        fVar267 = *(float *)(bezier_basis1 + lVar166 + 0x1228);
        auVar313._0_4_ =
             fVar345 * fVar304 + fVar406 * fVar285 + fVar344 * fVar246 + fVar394 * fVar307;
        auVar313._4_4_ =
             fVar279 * fVar305 + fVar411 * fVar289 + fVar278 * fVar244 + fVar403 * fVar263;
        auVar313._8_4_ =
             fVar283 * fVar306 + fVar413 * fVar290 + fVar282 * fVar260 + fVar404 * fVar264;
        auVar313._12_4_ =
             fVar287 * fVar308 + fVar415 * fVar291 + fVar286 * fVar262 + fVar405 * fVar266;
        auVar313._16_4_ =
             fVar345 * fVar363 + fVar406 * fVar292 + fVar344 * fVar243 + fVar394 * fVar268;
        auVar313._20_4_ =
             fVar279 * fVar364 + fVar411 * fVar302 + fVar278 * fVar265 + fVar403 * fVar277;
        auVar313._24_4_ =
             fVar283 * fVar267 + fVar413 * fVar303 + fVar282 * fVar261 + fVar404 * fVar281;
        auVar313._28_4_ = fVar343 + fVar343 + fVar376 + fVar405;
        auVar370._0_4_ =
             fVar326 * fVar304 + fVar170 * fVar285 + fVar338 * fVar246 + fVar427 * fVar307;
        auVar370._4_4_ =
             fVar337 * fVar305 + fVar194 * fVar289 + fVar340 * fVar244 + fVar433 * fVar263;
        auVar370._8_4_ =
             fVar339 * fVar306 + fVar197 * fVar290 + fVar342 * fVar260 + fVar434 * fVar264;
        auVar370._12_4_ =
             fVar341 * fVar308 + fVar327 * fVar291 + fVar343 * fVar262 + fVar435 * fVar266;
        auVar370._16_4_ =
             fVar326 * fVar363 + fVar170 * fVar292 + fVar338 * fVar243 + fVar427 * fVar268;
        auVar370._20_4_ =
             fVar337 * fVar364 + fVar194 * fVar302 + fVar340 * fVar265 + fVar433 * fVar277;
        auVar370._24_4_ =
             fVar339 * fVar267 + fVar197 * fVar303 + fVar342 * fVar261 + fVar434 * fVar281;
        auVar370._28_4_ = fVar343 + fVar343 + fVar343 + fVar376;
        auVar239._0_4_ =
             fVar347 * fVar304 + fVar385 * fVar285 + fVar418 * fVar246 + fVar307 * fVar269;
        auVar239._4_4_ =
             fVar360 * fVar305 + fVar412 * fVar289 + fVar424 * fVar244 + fVar263 * fVar280;
        auVar239._8_4_ =
             fVar361 * fVar306 + fVar414 * fVar290 + fVar425 * fVar260 + fVar264 * fVar284;
        auVar239._12_4_ =
             fVar362 * fVar308 + fVar416 * fVar291 + fVar426 * fVar262 + fVar266 * fVar288;
        auVar239._16_4_ =
             fVar347 * fVar363 + fVar385 * fVar292 + fVar418 * fVar243 + fVar268 * fVar269;
        auVar239._20_4_ =
             fVar360 * fVar364 + fVar412 * fVar302 + fVar424 * fVar265 + fVar277 * fVar280;
        auVar239._24_4_ =
             fVar361 * fVar267 + fVar414 * fVar303 + fVar425 * fVar261 + fVar281 * fVar284;
        auVar239._28_4_ =
             *(float *)(bezier_basis1 + lVar166 + 0x122c) +
             *(float *)(bezier_basis1 + lVar166 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar166 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar166 + 0x1fb8);
        auVar273._8_4_ = 0x7fffffff;
        auVar273._0_8_ = 0x7fffffff7fffffff;
        auVar273._12_4_ = 0x7fffffff;
        auVar273._16_4_ = 0x7fffffff;
        auVar273._20_4_ = 0x7fffffff;
        auVar273._24_4_ = 0x7fffffff;
        auVar273._28_4_ = 0x7fffffff;
        auVar153._4_4_ = fStack_5bc;
        auVar153._0_4_ = local_5c0;
        auVar153._8_4_ = fStack_5b8;
        auVar153._12_4_ = fStack_5b4;
        auVar153._16_4_ = fStack_5b0;
        auVar153._20_4_ = fStack_5ac;
        auVar153._24_4_ = fStack_5a8;
        auVar153._28_4_ = fStack_5a4;
        auVar176 = vandps_avx(auVar153,auVar273);
        auVar186 = vandps_avx(auVar214,auVar273);
        auVar186 = vmaxps_avx(auVar176,auVar186);
        auVar176 = vandps_avx(auVar295,auVar273);
        auVar176 = vmaxps_avx(auVar186,auVar176);
        auVar174 = vpermilps_avx(auVar174,0);
        auVar296._16_16_ = auVar174;
        auVar296._0_16_ = auVar174;
        auVar176 = vcmpps_avx(auVar176,auVar296,1);
        auVar41 = vblendvps_avx(auVar153,auVar39,auVar176);
        auVar371 = vblendvps_avx(auVar214,auVar40,auVar176);
        auVar176 = vandps_avx(auVar313,auVar273);
        auVar186 = vandps_avx(auVar370,auVar273);
        auVar357 = vmaxps_avx(auVar176,auVar186);
        auVar176 = vandps_avx(auVar239,auVar273);
        auVar176 = vmaxps_avx(auVar357,auVar176);
        auVar357 = vcmpps_avx(auVar176,auVar296,1);
        auVar176 = vblendvps_avx(auVar313,auVar39,auVar357);
        auVar39 = vblendvps_avx(auVar370,auVar40,auVar357);
        fVar309 = auVar41._0_4_;
        fVar376 = auVar41._4_4_;
        fVar199 = auVar41._8_4_;
        fVar196 = auVar41._12_4_;
        fVar200 = auVar41._16_4_;
        fVar201 = auVar41._20_4_;
        fVar202 = auVar41._24_4_;
        fVar319 = -auVar41._28_4_;
        fVar203 = auVar176._0_4_;
        fVar204 = auVar176._4_4_;
        fVar205 = auVar176._8_4_;
        fVar206 = auVar176._12_4_;
        fVar226 = auVar176._16_4_;
        fVar310 = auVar176._20_4_;
        fVar318 = auVar176._24_4_;
        fVar246 = auVar371._0_4_;
        fVar243 = auVar371._4_4_;
        fVar263 = auVar371._8_4_;
        fVar277 = auVar371._12_4_;
        fVar290 = auVar371._16_4_;
        fVar303 = auVar371._20_4_;
        fVar308 = auVar371._24_4_;
        auVar179._0_4_ = fVar246 * fVar246 + fVar309 * fVar309;
        auVar179._4_4_ = fVar243 * fVar243 + fVar376 * fVar376;
        auVar179._8_4_ = fVar263 * fVar263 + fVar199 * fVar199;
        auVar179._12_4_ = fVar277 * fVar277 + fVar196 * fVar196;
        auVar179._16_4_ = fVar290 * fVar290 + fVar200 * fVar200;
        auVar179._20_4_ = fVar303 * fVar303 + fVar201 * fVar201;
        auVar179._24_4_ = fVar308 * fVar308 + fVar202 * fVar202;
        auVar179._28_4_ = auVar370._28_4_ + auVar41._28_4_;
        auVar40 = vrsqrtps_avx(auVar179);
        fVar244 = auVar40._0_4_;
        fVar260 = auVar40._4_4_;
        auVar50._4_4_ = fVar260 * 1.5;
        auVar50._0_4_ = fVar244 * 1.5;
        fVar262 = auVar40._8_4_;
        auVar50._8_4_ = fVar262 * 1.5;
        fVar265 = auVar40._12_4_;
        auVar50._12_4_ = fVar265 * 1.5;
        fVar261 = auVar40._16_4_;
        auVar50._16_4_ = fVar261 * 1.5;
        fVar307 = auVar40._20_4_;
        auVar50._20_4_ = fVar307 * 1.5;
        fVar264 = auVar40._24_4_;
        fVar245 = auVar186._28_4_;
        auVar50._24_4_ = fVar264 * 1.5;
        auVar50._28_4_ = fVar245;
        auVar51._4_4_ = fVar260 * fVar260 * fVar260 * auVar179._4_4_ * 0.5;
        auVar51._0_4_ = fVar244 * fVar244 * fVar244 * auVar179._0_4_ * 0.5;
        auVar51._8_4_ = fVar262 * fVar262 * fVar262 * auVar179._8_4_ * 0.5;
        auVar51._12_4_ = fVar265 * fVar265 * fVar265 * auVar179._12_4_ * 0.5;
        auVar51._16_4_ = fVar261 * fVar261 * fVar261 * auVar179._16_4_ * 0.5;
        auVar51._20_4_ = fVar307 * fVar307 * fVar307 * auVar179._20_4_ * 0.5;
        auVar51._24_4_ = fVar264 * fVar264 * fVar264 * auVar179._24_4_ * 0.5;
        auVar51._28_4_ = auVar179._28_4_;
        auVar186 = vsubps_avx(auVar50,auVar51);
        fVar244 = auVar186._0_4_;
        fVar265 = auVar186._4_4_;
        fVar264 = auVar186._8_4_;
        fVar281 = auVar186._12_4_;
        fVar291 = auVar186._16_4_;
        fVar304 = auVar186._20_4_;
        fVar363 = auVar186._24_4_;
        fVar260 = auVar39._0_4_;
        fVar261 = auVar39._4_4_;
        fVar266 = auVar39._8_4_;
        fVar285 = auVar39._12_4_;
        fVar292 = auVar39._16_4_;
        fVar305 = auVar39._20_4_;
        fVar364 = auVar39._24_4_;
        auVar180._0_4_ = fVar260 * fVar260 + fVar203 * fVar203;
        auVar180._4_4_ = fVar261 * fVar261 + fVar204 * fVar204;
        auVar180._8_4_ = fVar266 * fVar266 + fVar205 * fVar205;
        auVar180._12_4_ = fVar285 * fVar285 + fVar206 * fVar206;
        auVar180._16_4_ = fVar292 * fVar292 + fVar226 * fVar226;
        auVar180._20_4_ = fVar305 * fVar305 + fVar310 * fVar310;
        auVar180._24_4_ = fVar364 * fVar364 + fVar318 * fVar318;
        auVar180._28_4_ = auVar176._28_4_ + auVar186._28_4_;
        auVar176 = vrsqrtps_avx(auVar180);
        fVar262 = auVar176._0_4_;
        fVar307 = auVar176._4_4_;
        auVar52._4_4_ = fVar307 * 1.5;
        auVar52._0_4_ = fVar262 * 1.5;
        fVar268 = auVar176._8_4_;
        auVar52._8_4_ = fVar268 * 1.5;
        fVar289 = auVar176._12_4_;
        auVar52._12_4_ = fVar289 * 1.5;
        fVar302 = auVar176._16_4_;
        auVar52._16_4_ = fVar302 * 1.5;
        fVar306 = auVar176._20_4_;
        auVar52._20_4_ = fVar306 * 1.5;
        fVar267 = auVar176._24_4_;
        auVar52._24_4_ = fVar267 * 1.5;
        auVar52._28_4_ = fVar245;
        auVar53._4_4_ = fVar307 * fVar307 * fVar307 * auVar180._4_4_ * 0.5;
        auVar53._0_4_ = fVar262 * fVar262 * fVar262 * auVar180._0_4_ * 0.5;
        auVar53._8_4_ = fVar268 * fVar268 * fVar268 * auVar180._8_4_ * 0.5;
        auVar53._12_4_ = fVar289 * fVar289 * fVar289 * auVar180._12_4_ * 0.5;
        auVar53._16_4_ = fVar302 * fVar302 * fVar302 * auVar180._16_4_ * 0.5;
        auVar53._20_4_ = fVar306 * fVar306 * fVar306 * auVar180._20_4_ * 0.5;
        auVar53._24_4_ = fVar267 * fVar267 * fVar267 * auVar180._24_4_ * 0.5;
        auVar53._28_4_ = auVar180._28_4_;
        auVar176 = vsubps_avx(auVar52,auVar53);
        fVar262 = auVar176._0_4_;
        fVar307 = auVar176._4_4_;
        fVar268 = auVar176._8_4_;
        fVar289 = auVar176._12_4_;
        fVar302 = auVar176._16_4_;
        fVar306 = auVar176._20_4_;
        fVar267 = auVar176._24_4_;
        fVar246 = (float)local_980._0_4_ * fVar246 * fVar244;
        fVar243 = (float)local_980._4_4_ * fVar243 * fVar265;
        auVar54._4_4_ = fVar243;
        auVar54._0_4_ = fVar246;
        fVar263 = fStack_978 * fVar263 * fVar264;
        auVar54._8_4_ = fVar263;
        fVar277 = fStack_974 * fVar277 * fVar281;
        auVar54._12_4_ = fVar277;
        fVar290 = fStack_970 * fVar290 * fVar291;
        auVar54._16_4_ = fVar290;
        fVar303 = fStack_96c * fVar303 * fVar304;
        auVar54._20_4_ = fVar303;
        fVar308 = fStack_968 * fVar308 * fVar363;
        auVar54._24_4_ = fVar308;
        auVar54._28_4_ = fVar245;
        local_860._4_4_ = fVar243 + auVar391._4_4_;
        local_860._0_4_ = fVar246 + auVar391._0_4_;
        uStack_858._0_4_ = fVar263 + auVar391._8_4_;
        uStack_858._4_4_ = fVar277 + auVar391._12_4_;
        fStack_850 = fVar290 + auVar391._16_4_;
        fStack_84c = fVar303 + auVar391._20_4_;
        fStack_848 = fVar308 + auVar391._24_4_;
        fStack_844 = fVar245 + auVar391._28_4_;
        fVar246 = (float)local_980._0_4_ * fVar244 * -fVar309;
        fVar243 = (float)local_980._4_4_ * fVar265 * -fVar376;
        auVar55._4_4_ = fVar243;
        auVar55._0_4_ = fVar246;
        fVar263 = fStack_978 * fVar264 * -fVar199;
        auVar55._8_4_ = fVar263;
        fVar277 = fStack_974 * fVar281 * -fVar196;
        auVar55._12_4_ = fVar277;
        fVar290 = fStack_970 * fVar291 * -fVar200;
        auVar55._16_4_ = fVar290;
        fVar303 = fStack_96c * fVar304 * -fVar201;
        auVar55._20_4_ = fVar303;
        fVar308 = fStack_968 * fVar363 * -fVar202;
        auVar55._24_4_ = fVar308;
        auVar55._28_4_ = fVar319;
        local_880._4_4_ = auVar369._4_4_ + fVar243;
        local_880._0_4_ = auVar369._0_4_ + fVar246;
        uStack_878._0_4_ = auVar369._8_4_ + fVar263;
        uStack_878._4_4_ = auVar369._12_4_ + fVar277;
        uStack_870._0_4_ = auVar369._16_4_ + fVar290;
        uStack_870._4_4_ = auVar369._20_4_ + fVar303;
        uStack_868._0_4_ = auVar369._24_4_ + fVar308;
        uStack_868._4_4_ = auVar369._28_4_ + fVar319;
        fVar246 = fVar244 * 0.0 * (float)local_980._0_4_;
        fVar244 = fVar265 * 0.0 * (float)local_980._4_4_;
        auVar56._4_4_ = fVar244;
        auVar56._0_4_ = fVar246;
        fVar243 = fVar264 * 0.0 * fStack_978;
        auVar56._8_4_ = fVar243;
        fVar265 = fVar281 * 0.0 * fStack_974;
        auVar56._12_4_ = fVar265;
        fVar263 = fVar291 * 0.0 * fStack_970;
        auVar56._16_4_ = fVar263;
        fVar264 = fVar304 * 0.0 * fStack_96c;
        auVar56._20_4_ = fVar264;
        fVar277 = fVar363 * 0.0 * fStack_968;
        auVar56._24_4_ = fVar277;
        auVar56._28_4_ = fVar416;
        auVar141._4_4_ = fVar195;
        auVar141._0_4_ = fVar171;
        auVar141._8_4_ = fVar198;
        auVar141._12_4_ = fVar172;
        auVar141._16_4_ = fStack_830;
        auVar141._20_4_ = fStack_82c;
        auVar141._24_4_ = fStack_828;
        auVar141._28_4_ = fStack_824;
        auVar314._0_4_ = fVar171 + fVar246;
        auVar314._4_4_ = fVar195 + fVar244;
        auVar314._8_4_ = fVar198 + fVar243;
        auVar314._12_4_ = fVar172 + fVar265;
        auVar314._16_4_ = fStack_830 + fVar263;
        auVar314._20_4_ = fStack_82c + fVar264;
        auVar314._24_4_ = fStack_828 + fVar277;
        auVar314._28_4_ = fStack_824 + fVar416;
        fVar246 = (float)local_8c0._0_4_ * fVar260 * fVar262;
        fVar244 = (float)local_8c0._4_4_ * fVar261 * fVar307;
        auVar57._4_4_ = fVar244;
        auVar57._0_4_ = fVar246;
        fVar260 = fStack_8b8 * fVar266 * fVar268;
        auVar57._8_4_ = fVar260;
        fVar243 = fStack_8b4 * fVar285 * fVar289;
        auVar57._12_4_ = fVar243;
        fVar265 = register0x00001490 * fVar292 * fVar302;
        auVar57._16_4_ = fVar265;
        fVar261 = register0x00001494 * fVar305 * fVar306;
        auVar57._20_4_ = fVar261;
        fVar263 = register0x00001498 * fVar364 * fVar267;
        auVar57._24_4_ = fVar263;
        auVar57._28_4_ = auVar39._28_4_;
        auVar357 = vsubps_avx(auVar391,auVar54);
        auVar381._0_4_ = auVar272._0_4_ + fVar246;
        auVar381._4_4_ = auVar272._4_4_ + fVar244;
        auVar381._8_4_ = auVar272._8_4_ + fVar260;
        auVar381._12_4_ = auVar272._12_4_ + fVar243;
        auVar381._16_4_ = auVar272._16_4_ + fVar265;
        auVar381._20_4_ = auVar272._20_4_ + fVar261;
        auVar381._24_4_ = auVar272._24_4_ + fVar263;
        auVar381._28_4_ = auVar272._28_4_ + auVar39._28_4_;
        fVar246 = (float)local_8c0._0_4_ * fVar262 * -fVar203;
        fVar244 = (float)local_8c0._4_4_ * fVar307 * -fVar204;
        auVar58._4_4_ = fVar244;
        auVar58._0_4_ = fVar246;
        fVar260 = fStack_8b8 * fVar268 * -fVar205;
        auVar58._8_4_ = fVar260;
        fVar243 = fStack_8b4 * fVar289 * -fVar206;
        auVar58._12_4_ = fVar243;
        fVar265 = register0x00001490 * fVar302 * -fVar226;
        auVar58._16_4_ = fVar265;
        fVar261 = register0x00001494 * fVar306 * -fVar310;
        auVar58._20_4_ = fVar261;
        fVar263 = register0x00001498 * fVar267 * -fVar318;
        auVar58._24_4_ = fVar263;
        auVar58._28_4_ = fVar426;
        auVar42 = vsubps_avx(auVar369,auVar55);
        auVar392._0_4_ = fVar246 + auVar254._0_4_;
        auVar392._4_4_ = fVar244 + auVar254._4_4_;
        auVar392._8_4_ = fVar260 + auVar254._8_4_;
        auVar392._12_4_ = fVar243 + auVar254._12_4_;
        auVar392._16_4_ = fVar265 + auVar254._16_4_;
        auVar392._20_4_ = fVar261 + auVar254._20_4_;
        auVar392._24_4_ = fVar263 + auVar254._24_4_;
        auVar392._28_4_ = fVar426 + auVar254._28_4_;
        fVar246 = fVar262 * 0.0 * (float)local_8c0._0_4_;
        fVar244 = fVar307 * 0.0 * (float)local_8c0._4_4_;
        auVar59._4_4_ = fVar244;
        auVar59._0_4_ = fVar246;
        fVar260 = fVar268 * 0.0 * fStack_8b8;
        auVar59._8_4_ = fVar260;
        fVar262 = fVar289 * 0.0 * fStack_8b4;
        auVar59._12_4_ = fVar262;
        fVar243 = fVar302 * 0.0 * register0x00001490;
        auVar59._16_4_ = fVar243;
        fVar265 = fVar306 * 0.0 * register0x00001494;
        auVar59._20_4_ = fVar265;
        fVar261 = fVar267 * 0.0 * register0x00001498;
        auVar59._24_4_ = fVar261;
        auVar59._28_4_ = fVar319;
        auVar431 = vsubps_avx(auVar141,auVar56);
        auVar152._4_4_ = fStack_5dc;
        auVar152._0_4_ = local_5e0;
        auVar152._8_4_ = fStack_5d8;
        auVar152._12_4_ = fStack_5d4;
        auVar152._16_4_ = fStack_5d0;
        auVar152._20_4_ = fStack_5cc;
        auVar152._24_4_ = fStack_5c8;
        auVar152._28_4_ = fStack_5c4;
        auVar428._0_4_ = local_5e0 + fVar246;
        auVar428._4_4_ = fStack_5dc + fVar244;
        auVar428._8_4_ = fStack_5d8 + fVar260;
        auVar428._12_4_ = fStack_5d4 + fVar262;
        auVar428._16_4_ = fStack_5d0 + fVar243;
        auVar428._20_4_ = fStack_5cc + fVar265;
        auVar428._24_4_ = fStack_5c8 + fVar261;
        auVar428._28_4_ = fStack_5c4 + fVar319;
        auVar176 = vsubps_avx(auVar272,auVar57);
        auVar186 = vsubps_avx(auVar254,auVar58);
        auVar39 = vsubps_avx(auVar152,auVar59);
        auVar40 = vsubps_avx(auVar392,auVar42);
        auVar41 = vsubps_avx(auVar428,auVar431);
        auVar60._4_4_ = auVar431._4_4_ * auVar40._4_4_;
        auVar60._0_4_ = auVar431._0_4_ * auVar40._0_4_;
        auVar60._8_4_ = auVar431._8_4_ * auVar40._8_4_;
        auVar60._12_4_ = auVar431._12_4_ * auVar40._12_4_;
        auVar60._16_4_ = auVar431._16_4_ * auVar40._16_4_;
        auVar60._20_4_ = auVar431._20_4_ * auVar40._20_4_;
        auVar60._24_4_ = auVar431._24_4_ * auVar40._24_4_;
        auVar60._28_4_ = fVar426;
        auVar61._4_4_ = auVar42._4_4_ * auVar41._4_4_;
        auVar61._0_4_ = auVar42._0_4_ * auVar41._0_4_;
        auVar61._8_4_ = auVar42._8_4_ * auVar41._8_4_;
        auVar61._12_4_ = auVar42._12_4_ * auVar41._12_4_;
        auVar61._16_4_ = auVar42._16_4_ * auVar41._16_4_;
        auVar61._20_4_ = auVar42._20_4_ * auVar41._20_4_;
        auVar61._24_4_ = auVar42._24_4_ * auVar41._24_4_;
        auVar61._28_4_ = auVar254._28_4_;
        auVar371 = vsubps_avx(auVar61,auVar60);
        auVar62._4_4_ = auVar357._4_4_ * auVar41._4_4_;
        auVar62._0_4_ = auVar357._0_4_ * auVar41._0_4_;
        auVar62._8_4_ = auVar357._8_4_ * auVar41._8_4_;
        auVar62._12_4_ = auVar357._12_4_ * auVar41._12_4_;
        auVar62._16_4_ = auVar357._16_4_ * auVar41._16_4_;
        auVar62._20_4_ = auVar357._20_4_ * auVar41._20_4_;
        auVar62._24_4_ = auVar357._24_4_ * auVar41._24_4_;
        auVar62._28_4_ = auVar41._28_4_;
        auVar45 = vsubps_avx(auVar381,auVar357);
        auVar63._4_4_ = auVar431._4_4_ * auVar45._4_4_;
        auVar63._0_4_ = auVar431._0_4_ * auVar45._0_4_;
        auVar63._8_4_ = auVar431._8_4_ * auVar45._8_4_;
        auVar63._12_4_ = auVar431._12_4_ * auVar45._12_4_;
        auVar63._16_4_ = auVar431._16_4_ * auVar45._16_4_;
        auVar63._20_4_ = auVar431._20_4_ * auVar45._20_4_;
        auVar63._24_4_ = auVar431._24_4_ * auVar45._24_4_;
        auVar63._28_4_ = auVar272._28_4_;
        auVar44 = vsubps_avx(auVar63,auVar62);
        auVar64._4_4_ = auVar45._4_4_ * auVar42._4_4_;
        auVar64._0_4_ = auVar45._0_4_ * auVar42._0_4_;
        auVar64._8_4_ = auVar45._8_4_ * auVar42._8_4_;
        auVar64._12_4_ = auVar45._12_4_ * auVar42._12_4_;
        auVar64._16_4_ = auVar45._16_4_ * auVar42._16_4_;
        auVar64._20_4_ = auVar45._20_4_ * auVar42._20_4_;
        auVar64._24_4_ = auVar45._24_4_ * auVar42._24_4_;
        auVar64._28_4_ = auVar41._28_4_;
        auVar65._4_4_ = auVar357._4_4_ * auVar40._4_4_;
        auVar65._0_4_ = auVar357._0_4_ * auVar40._0_4_;
        auVar65._8_4_ = auVar357._8_4_ * auVar40._8_4_;
        auVar65._12_4_ = auVar357._12_4_ * auVar40._12_4_;
        auVar65._16_4_ = auVar357._16_4_ * auVar40._16_4_;
        auVar65._20_4_ = auVar357._20_4_ * auVar40._20_4_;
        auVar65._24_4_ = auVar357._24_4_ * auVar40._24_4_;
        auVar65._28_4_ = auVar40._28_4_;
        auVar40 = vsubps_avx(auVar65,auVar64);
        auVar181._0_4_ = auVar371._0_4_ * 0.0 + auVar40._0_4_ + auVar44._0_4_ * 0.0;
        auVar181._4_4_ = auVar371._4_4_ * 0.0 + auVar40._4_4_ + auVar44._4_4_ * 0.0;
        auVar181._8_4_ = auVar371._8_4_ * 0.0 + auVar40._8_4_ + auVar44._8_4_ * 0.0;
        auVar181._12_4_ = auVar371._12_4_ * 0.0 + auVar40._12_4_ + auVar44._12_4_ * 0.0;
        auVar181._16_4_ = auVar371._16_4_ * 0.0 + auVar40._16_4_ + auVar44._16_4_ * 0.0;
        auVar181._20_4_ = auVar371._20_4_ * 0.0 + auVar40._20_4_ + auVar44._20_4_ * 0.0;
        auVar181._24_4_ = auVar371._24_4_ * 0.0 + auVar40._24_4_ + auVar44._24_4_ * 0.0;
        auVar181._28_4_ = auVar40._28_4_ + auVar40._28_4_ + auVar44._28_4_;
        auVar45 = vcmpps_avx(auVar181,ZEXT432(0) << 0x20,2);
        auVar242 = ZEXT3264(auVar45);
        auVar176 = vblendvps_avx(auVar176,_local_860,auVar45);
        auVar186 = vblendvps_avx(auVar186,_local_880,auVar45);
        auVar39 = vblendvps_avx(auVar39,auVar314,auVar45);
        auVar40 = vblendvps_avx(auVar357,auVar381,auVar45);
        auVar41 = vblendvps_avx(auVar42,auVar392,auVar45);
        auVar371 = vblendvps_avx(auVar431,auVar428,auVar45);
        auVar357 = vblendvps_avx(auVar381,auVar357,auVar45);
        auVar42 = vblendvps_avx(auVar392,auVar42,auVar45);
        auVar174 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        auVar431 = vblendvps_avx(auVar428,auVar431,auVar45);
        auVar357 = vsubps_avx(auVar357,auVar176);
        auVar44 = vsubps_avx(auVar42,auVar186);
        auVar431 = vsubps_avx(auVar431,auVar39);
        auVar177 = vsubps_avx(auVar186,auVar41);
        fVar246 = auVar44._0_4_;
        fVar172 = auVar39._0_4_;
        fVar265 = auVar44._4_4_;
        fVar196 = auVar39._4_4_;
        auVar66._4_4_ = fVar196 * fVar265;
        auVar66._0_4_ = fVar172 * fVar246;
        fVar266 = auVar44._8_4_;
        fVar200 = auVar39._8_4_;
        auVar66._8_4_ = fVar200 * fVar266;
        fVar289 = auVar44._12_4_;
        fVar201 = auVar39._12_4_;
        auVar66._12_4_ = fVar201 * fVar289;
        fVar303 = auVar44._16_4_;
        fVar202 = auVar39._16_4_;
        auVar66._16_4_ = fVar202 * fVar303;
        fVar363 = auVar44._20_4_;
        fVar203 = auVar39._20_4_;
        auVar66._20_4_ = fVar203 * fVar363;
        fVar309 = auVar44._24_4_;
        fVar204 = auVar39._24_4_;
        auVar66._24_4_ = fVar204 * fVar309;
        auVar66._28_4_ = auVar42._28_4_;
        fVar244 = auVar186._0_4_;
        fVar321 = auVar431._0_4_;
        fVar261 = auVar186._4_4_;
        fVar322 = auVar431._4_4_;
        auVar67._4_4_ = fVar322 * fVar261;
        auVar67._0_4_ = fVar321 * fVar244;
        fVar268 = auVar186._8_4_;
        fVar323 = auVar431._8_4_;
        auVar67._8_4_ = fVar323 * fVar268;
        fVar290 = auVar186._12_4_;
        fVar324 = auVar431._12_4_;
        auVar67._12_4_ = fVar324 * fVar290;
        fVar304 = auVar186._16_4_;
        fVar375 = auVar431._16_4_;
        auVar67._16_4_ = fVar375 * fVar304;
        fVar364 = auVar186._20_4_;
        fVar170 = auVar431._20_4_;
        auVar67._20_4_ = fVar170 * fVar364;
        fVar195 = auVar186._24_4_;
        fVar194 = auVar431._24_4_;
        auVar67._24_4_ = fVar194 * fVar195;
        auVar67._28_4_ = auVar392._28_4_;
        auVar186 = vsubps_avx(auVar67,auVar66);
        fVar260 = auVar176._0_4_;
        fVar307 = auVar176._4_4_;
        auVar68._4_4_ = fVar322 * fVar307;
        auVar68._0_4_ = fVar321 * fVar260;
        fVar277 = auVar176._8_4_;
        auVar68._8_4_ = fVar323 * fVar277;
        fVar291 = auVar176._12_4_;
        auVar68._12_4_ = fVar324 * fVar291;
        fVar305 = auVar176._16_4_;
        auVar68._16_4_ = fVar375 * fVar305;
        fVar267 = auVar176._20_4_;
        auVar68._20_4_ = fVar170 * fVar267;
        fVar376 = auVar176._24_4_;
        auVar68._24_4_ = fVar194 * fVar376;
        auVar68._28_4_ = auVar392._28_4_;
        fVar262 = auVar357._0_4_;
        auVar421._0_4_ = fVar172 * fVar262;
        fVar263 = auVar357._4_4_;
        auVar421._4_4_ = fVar196 * fVar263;
        fVar281 = auVar357._8_4_;
        auVar421._8_4_ = fVar200 * fVar281;
        fVar292 = auVar357._12_4_;
        auVar421._12_4_ = fVar201 * fVar292;
        fVar306 = auVar357._16_4_;
        auVar421._16_4_ = fVar202 * fVar306;
        fVar245 = auVar357._20_4_;
        auVar421._20_4_ = fVar203 * fVar245;
        fVar198 = auVar357._24_4_;
        auVar421._24_4_ = fVar204 * fVar198;
        auVar421._28_4_ = 0;
        auVar42 = vsubps_avx(auVar421,auVar68);
        auVar69._4_4_ = fVar261 * fVar263;
        auVar69._0_4_ = fVar244 * fVar262;
        auVar69._8_4_ = fVar268 * fVar281;
        auVar69._12_4_ = fVar290 * fVar292;
        auVar69._16_4_ = fVar304 * fVar306;
        auVar69._20_4_ = fVar364 * fVar245;
        auVar69._24_4_ = fVar195 * fVar198;
        auVar69._28_4_ = auVar392._28_4_;
        auVar70._4_4_ = fVar307 * fVar265;
        auVar70._0_4_ = fVar260 * fVar246;
        auVar70._8_4_ = fVar277 * fVar266;
        auVar70._12_4_ = fVar291 * fVar289;
        auVar70._16_4_ = fVar305 * fVar303;
        auVar70._20_4_ = fVar267 * fVar363;
        auVar70._24_4_ = fVar376 * fVar309;
        auVar70._28_4_ = auVar428._28_4_;
        auVar178 = vsubps_avx(auVar70,auVar69);
        auVar211 = vsubps_avx(auVar39,auVar371);
        fVar243 = auVar178._28_4_ + auVar42._28_4_;
        auVar215._0_4_ = auVar178._0_4_ + auVar42._0_4_ * 0.0 + auVar186._0_4_ * 0.0;
        auVar215._4_4_ = auVar178._4_4_ + auVar42._4_4_ * 0.0 + auVar186._4_4_ * 0.0;
        auVar215._8_4_ = auVar178._8_4_ + auVar42._8_4_ * 0.0 + auVar186._8_4_ * 0.0;
        auVar215._12_4_ = auVar178._12_4_ + auVar42._12_4_ * 0.0 + auVar186._12_4_ * 0.0;
        auVar215._16_4_ = auVar178._16_4_ + auVar42._16_4_ * 0.0 + auVar186._16_4_ * 0.0;
        auVar215._20_4_ = auVar178._20_4_ + auVar42._20_4_ * 0.0 + auVar186._20_4_ * 0.0;
        auVar215._24_4_ = auVar178._24_4_ + auVar42._24_4_ * 0.0 + auVar186._24_4_ * 0.0;
        auVar215._28_4_ = fVar243 + auVar186._28_4_;
        fVar205 = auVar177._0_4_;
        fVar206 = auVar177._4_4_;
        auVar71._4_4_ = fVar206 * auVar371._4_4_;
        auVar71._0_4_ = fVar205 * auVar371._0_4_;
        fVar226 = auVar177._8_4_;
        auVar71._8_4_ = fVar226 * auVar371._8_4_;
        fVar310 = auVar177._12_4_;
        auVar71._12_4_ = fVar310 * auVar371._12_4_;
        fVar318 = auVar177._16_4_;
        auVar71._16_4_ = fVar318 * auVar371._16_4_;
        fVar319 = auVar177._20_4_;
        auVar71._20_4_ = fVar319 * auVar371._20_4_;
        fVar320 = auVar177._24_4_;
        auVar71._24_4_ = fVar320 * auVar371._24_4_;
        auVar71._28_4_ = fVar243;
        fVar243 = auVar211._0_4_;
        fVar264 = auVar211._4_4_;
        auVar72._4_4_ = auVar41._4_4_ * fVar264;
        auVar72._0_4_ = auVar41._0_4_ * fVar243;
        fVar285 = auVar211._8_4_;
        auVar72._8_4_ = auVar41._8_4_ * fVar285;
        fVar302 = auVar211._12_4_;
        auVar72._12_4_ = auVar41._12_4_ * fVar302;
        fVar308 = auVar211._16_4_;
        auVar72._16_4_ = auVar41._16_4_ * fVar308;
        fVar171 = auVar211._20_4_;
        auVar72._20_4_ = auVar41._20_4_ * fVar171;
        fVar199 = auVar211._24_4_;
        auVar72._24_4_ = auVar41._24_4_ * fVar199;
        auVar72._28_4_ = auVar178._28_4_;
        auVar42 = vsubps_avx(auVar72,auVar71);
        auVar177 = vsubps_avx(auVar176,auVar40);
        fVar197 = auVar177._0_4_;
        fVar327 = auVar177._4_4_;
        auVar73._4_4_ = fVar327 * auVar371._4_4_;
        auVar73._0_4_ = fVar197 * auVar371._0_4_;
        fVar338 = auVar177._8_4_;
        auVar73._8_4_ = fVar338 * auVar371._8_4_;
        fVar340 = auVar177._12_4_;
        auVar73._12_4_ = fVar340 * auVar371._12_4_;
        fVar342 = auVar177._16_4_;
        auVar73._16_4_ = fVar342 * auVar371._16_4_;
        fVar343 = auVar177._20_4_;
        auVar73._20_4_ = fVar343 * auVar371._20_4_;
        fVar344 = auVar177._24_4_;
        auVar73._24_4_ = fVar344 * auVar371._24_4_;
        auVar73._28_4_ = auVar371._28_4_;
        auVar74._4_4_ = auVar40._4_4_ * fVar264;
        auVar74._0_4_ = auVar40._0_4_ * fVar243;
        auVar74._8_4_ = auVar40._8_4_ * fVar285;
        auVar74._12_4_ = auVar40._12_4_ * fVar302;
        auVar74._16_4_ = auVar40._16_4_ * fVar308;
        auVar74._20_4_ = auVar40._20_4_ * fVar171;
        auVar74._24_4_ = auVar40._24_4_ * fVar199;
        auVar74._28_4_ = auVar186._28_4_;
        auVar186 = vsubps_avx(auVar73,auVar74);
        auVar75._4_4_ = auVar41._4_4_ * fVar327;
        auVar75._0_4_ = auVar41._0_4_ * fVar197;
        auVar75._8_4_ = auVar41._8_4_ * fVar338;
        auVar75._12_4_ = auVar41._12_4_ * fVar340;
        auVar75._16_4_ = auVar41._16_4_ * fVar342;
        auVar75._20_4_ = auVar41._20_4_ * fVar343;
        auVar75._24_4_ = auVar41._24_4_ * fVar344;
        auVar75._28_4_ = auVar371._28_4_;
        auVar76._4_4_ = auVar40._4_4_ * fVar206;
        auVar76._0_4_ = auVar40._0_4_ * fVar205;
        auVar76._8_4_ = auVar40._8_4_ * fVar226;
        auVar76._12_4_ = auVar40._12_4_ * fVar310;
        auVar76._16_4_ = auVar40._16_4_ * fVar318;
        auVar76._20_4_ = auVar40._20_4_ * fVar319;
        auVar76._24_4_ = auVar40._24_4_ * fVar320;
        auVar76._28_4_ = auVar40._28_4_;
        auVar40 = vsubps_avx(auVar76,auVar75);
        auVar193 = ZEXT864(0) << 0x20;
        auVar274._0_4_ = auVar42._0_4_ * 0.0 + auVar40._0_4_ + auVar186._0_4_ * 0.0;
        auVar274._4_4_ = auVar42._4_4_ * 0.0 + auVar40._4_4_ + auVar186._4_4_ * 0.0;
        auVar274._8_4_ = auVar42._8_4_ * 0.0 + auVar40._8_4_ + auVar186._8_4_ * 0.0;
        auVar274._12_4_ = auVar42._12_4_ * 0.0 + auVar40._12_4_ + auVar186._12_4_ * 0.0;
        auVar274._16_4_ = auVar42._16_4_ * 0.0 + auVar40._16_4_ + auVar186._16_4_ * 0.0;
        auVar274._20_4_ = auVar42._20_4_ * 0.0 + auVar40._20_4_ + auVar186._20_4_ * 0.0;
        auVar274._24_4_ = auVar42._24_4_ * 0.0 + auVar40._24_4_ + auVar186._24_4_ * 0.0;
        auVar274._28_4_ = auVar40._28_4_ + auVar40._28_4_ + auVar186._28_4_;
        auVar186 = vmaxps_avx(auVar215,auVar274);
        auVar186 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,2);
        auVar231 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
        auVar174 = vpand_avx(auVar231,auVar174);
        auVar231 = vpmovsxwd_avx(auVar174);
        auVar249 = vpunpckhwd_avx(auVar174,auVar174);
        auVar256._16_16_ = auVar249;
        auVar256._0_16_ = auVar231;
        if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar256 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar256 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar256 >> 0x7f,0) == '\0') &&
              (auVar256 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar249 >> 0x3f,0) == '\0') &&
            (auVar256 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar249[0xf]) {
LAB_01263a5f:
          auVar299._8_8_ = uStack_678;
          auVar299._0_8_ = local_680;
          auVar299._16_8_ = uStack_670;
          auVar299._24_8_ = uStack_668;
          auVar374 = ZEXT3264(local_660);
          auVar432 = ZEXT3264(local_640);
          auVar259 = ZEXT3264(auVar256);
        }
        else {
          auVar77._4_4_ = fVar264 * fVar265;
          auVar77._0_4_ = fVar243 * fVar246;
          auVar77._8_4_ = fVar285 * fVar266;
          auVar77._12_4_ = fVar302 * fVar289;
          auVar77._16_4_ = fVar308 * fVar303;
          auVar77._20_4_ = fVar171 * fVar363;
          auVar77._24_4_ = fVar199 * fVar309;
          auVar77._28_4_ = auVar249._12_4_;
          auVar399._0_4_ = fVar205 * fVar321;
          auVar399._4_4_ = fVar206 * fVar322;
          auVar399._8_4_ = fVar226 * fVar323;
          auVar399._12_4_ = fVar310 * fVar324;
          auVar399._16_4_ = fVar318 * fVar375;
          auVar399._20_4_ = fVar319 * fVar170;
          auVar399._24_4_ = fVar320 * fVar194;
          auVar399._28_4_ = 0;
          auVar186 = vsubps_avx(auVar399,auVar77);
          auVar78._4_4_ = fVar327 * fVar322;
          auVar78._0_4_ = fVar197 * fVar321;
          auVar78._8_4_ = fVar338 * fVar323;
          auVar78._12_4_ = fVar340 * fVar324;
          auVar78._16_4_ = fVar342 * fVar375;
          auVar78._20_4_ = fVar343 * fVar170;
          auVar78._24_4_ = fVar344 * fVar194;
          auVar78._28_4_ = auVar431._28_4_;
          auVar79._4_4_ = fVar264 * fVar263;
          auVar79._0_4_ = fVar243 * fVar262;
          auVar79._8_4_ = fVar285 * fVar281;
          auVar79._12_4_ = fVar302 * fVar292;
          auVar79._16_4_ = fVar308 * fVar306;
          auVar79._20_4_ = fVar171 * fVar245;
          auVar79._24_4_ = fVar199 * fVar198;
          auVar79._28_4_ = auVar211._28_4_;
          auVar41 = vsubps_avx(auVar79,auVar78);
          auVar80._4_4_ = fVar206 * fVar263;
          auVar80._0_4_ = fVar205 * fVar262;
          auVar80._8_4_ = fVar226 * fVar281;
          auVar80._12_4_ = fVar310 * fVar292;
          auVar80._16_4_ = fVar318 * fVar306;
          auVar80._20_4_ = fVar319 * fVar245;
          auVar80._24_4_ = fVar320 * fVar198;
          auVar80._28_4_ = auVar215._28_4_;
          auVar81._4_4_ = fVar327 * fVar265;
          auVar81._0_4_ = fVar197 * fVar246;
          auVar81._8_4_ = fVar338 * fVar266;
          auVar81._12_4_ = fVar340 * fVar289;
          auVar81._16_4_ = fVar342 * fVar303;
          auVar81._20_4_ = fVar343 * fVar363;
          auVar81._24_4_ = fVar344 * fVar309;
          auVar81._28_4_ = auVar44._28_4_;
          auVar371 = vsubps_avx(auVar81,auVar80);
          auVar334._0_4_ = auVar186._0_4_ * 0.0 + auVar371._0_4_ + auVar41._0_4_ * 0.0;
          auVar334._4_4_ = auVar186._4_4_ * 0.0 + auVar371._4_4_ + auVar41._4_4_ * 0.0;
          auVar334._8_4_ = auVar186._8_4_ * 0.0 + auVar371._8_4_ + auVar41._8_4_ * 0.0;
          auVar334._12_4_ = auVar186._12_4_ * 0.0 + auVar371._12_4_ + auVar41._12_4_ * 0.0;
          auVar334._16_4_ = auVar186._16_4_ * 0.0 + auVar371._16_4_ + auVar41._16_4_ * 0.0;
          auVar334._20_4_ = auVar186._20_4_ * 0.0 + auVar371._20_4_ + auVar41._20_4_ * 0.0;
          auVar334._24_4_ = auVar186._24_4_ * 0.0 + auVar371._24_4_ + auVar41._24_4_ * 0.0;
          auVar334._28_4_ = auVar44._28_4_ + auVar371._28_4_ + auVar215._28_4_;
          auVar40 = vrcpps_avx(auVar334);
          fVar246 = auVar40._0_4_;
          fVar262 = auVar40._4_4_;
          auVar82._4_4_ = auVar334._4_4_ * fVar262;
          auVar82._0_4_ = auVar334._0_4_ * fVar246;
          fVar243 = auVar40._8_4_;
          auVar82._8_4_ = auVar334._8_4_ * fVar243;
          fVar265 = auVar40._12_4_;
          auVar82._12_4_ = auVar334._12_4_ * fVar265;
          fVar263 = auVar40._16_4_;
          auVar82._16_4_ = auVar334._16_4_ * fVar263;
          fVar264 = auVar40._20_4_;
          auVar82._20_4_ = auVar334._20_4_ * fVar264;
          fVar266 = auVar40._24_4_;
          auVar82._24_4_ = auVar334._24_4_ * fVar266;
          auVar82._28_4_ = auVar211._28_4_;
          auVar400._8_4_ = 0x3f800000;
          auVar400._0_8_ = &DAT_3f8000003f800000;
          auVar400._12_4_ = 0x3f800000;
          auVar400._16_4_ = 0x3f800000;
          auVar400._20_4_ = 0x3f800000;
          auVar400._24_4_ = 0x3f800000;
          auVar400._28_4_ = 0x3f800000;
          auVar42 = vsubps_avx(auVar400,auVar82);
          fVar246 = auVar42._0_4_ * fVar246 + fVar246;
          fVar262 = auVar42._4_4_ * fVar262 + fVar262;
          fVar243 = auVar42._8_4_ * fVar243 + fVar243;
          fVar265 = auVar42._12_4_ * fVar265 + fVar265;
          fVar263 = auVar42._16_4_ * fVar263 + fVar263;
          fVar264 = auVar42._20_4_ * fVar264 + fVar264;
          fVar266 = auVar42._24_4_ * fVar266 + fVar266;
          auVar83._4_4_ =
               (auVar186._4_4_ * fVar307 + auVar41._4_4_ * fVar261 + auVar371._4_4_ * fVar196) *
               fVar262;
          auVar83._0_4_ =
               (auVar186._0_4_ * fVar260 + auVar41._0_4_ * fVar244 + auVar371._0_4_ * fVar172) *
               fVar246;
          auVar83._8_4_ =
               (auVar186._8_4_ * fVar277 + auVar41._8_4_ * fVar268 + auVar371._8_4_ * fVar200) *
               fVar243;
          auVar83._12_4_ =
               (auVar186._12_4_ * fVar291 + auVar41._12_4_ * fVar290 + auVar371._12_4_ * fVar201) *
               fVar265;
          auVar83._16_4_ =
               (auVar186._16_4_ * fVar305 + auVar41._16_4_ * fVar304 + auVar371._16_4_ * fVar202) *
               fVar263;
          auVar83._20_4_ =
               (auVar186._20_4_ * fVar267 + auVar41._20_4_ * fVar364 + auVar371._20_4_ * fVar203) *
               fVar264;
          auVar83._24_4_ =
               (auVar186._24_4_ * fVar376 + auVar41._24_4_ * fVar195 + auVar371._24_4_ * fVar204) *
               fVar266;
          auVar83._28_4_ = auVar176._28_4_ + auVar357._28_4_ + auVar39._28_4_;
          auVar231 = vpermilps_avx(ZEXT416(uVar165),0);
          auVar257._16_16_ = auVar231;
          auVar257._0_16_ = auVar231;
          auVar176 = vcmpps_avx(auVar257,auVar83,2);
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar297._4_4_ = uVar11;
          auVar297._0_4_ = uVar11;
          auVar297._8_4_ = uVar11;
          auVar297._12_4_ = uVar11;
          auVar297._16_4_ = uVar11;
          auVar297._20_4_ = uVar11;
          auVar297._24_4_ = uVar11;
          auVar297._28_4_ = uVar11;
          auVar186 = vcmpps_avx(auVar83,auVar297,2);
          auVar176 = vandps_avx(auVar186,auVar176);
          auVar231 = vpackssdw_avx(auVar176._0_16_,auVar176._16_16_);
          auVar174 = vpand_avx(auVar174,auVar231);
          auVar231 = vpmovsxwd_avx(auVar174);
          auVar249 = vpshufd_avx(auVar174,0xee);
          auVar249 = vpmovsxwd_avx(auVar249);
          auVar256._16_16_ = auVar249;
          auVar256._0_16_ = auVar231;
          auVar432 = ZEXT3264(local_640);
          auVar374 = ZEXT3264(local_660);
          if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar256 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar256 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar256 >> 0x7f,0) == '\0') &&
                (auVar256 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar249 >> 0x3f,0) == '\0') &&
              (auVar256 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar249[0xf]) goto LAB_01263a5f;
          auVar176 = vcmpps_avx(ZEXT832(0) << 0x20,auVar334,4);
          auVar231 = vpackssdw_avx(auVar176._0_16_,auVar176._16_16_);
          auVar174 = vpand_avx(auVar174,auVar231);
          auVar231 = vpmovsxwd_avx(auVar174);
          auVar174 = vpunpckhwd_avx(auVar174,auVar174);
          auVar259 = ZEXT1664(auVar174);
          auVar315._16_16_ = auVar174;
          auVar315._0_16_ = auVar231;
          auVar299._8_8_ = uStack_678;
          auVar299._0_8_ = local_680;
          auVar299._16_8_ = uStack_670;
          auVar299._24_8_ = uStack_668;
          if ((((((((auVar315 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar315 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar315 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar315 >> 0x7f,0) != '\0') ||
                (auVar315 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar174 >> 0x3f,0) != '\0') ||
              (auVar315 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar174[0xf] < '\0') {
            auVar258._0_4_ = auVar215._0_4_ * fVar246;
            auVar258._4_4_ = auVar215._4_4_ * fVar262;
            auVar258._8_4_ = auVar215._8_4_ * fVar243;
            auVar258._12_4_ = auVar215._12_4_ * fVar265;
            auVar258._16_4_ = auVar215._16_4_ * fVar263;
            auVar258._20_4_ = auVar215._20_4_ * fVar264;
            auVar258._24_4_ = auVar215._24_4_ * fVar266;
            auVar258._28_4_ = 0;
            auVar84._4_4_ = auVar274._4_4_ * fVar262;
            auVar84._0_4_ = auVar274._0_4_ * fVar246;
            auVar84._8_4_ = auVar274._8_4_ * fVar243;
            auVar84._12_4_ = auVar274._12_4_ * fVar265;
            auVar84._16_4_ = auVar274._16_4_ * fVar263;
            auVar84._20_4_ = auVar274._20_4_ * fVar264;
            auVar84._24_4_ = auVar274._24_4_ * fVar266;
            auVar84._28_4_ = auVar42._28_4_ + auVar40._28_4_;
            auVar298._8_4_ = 0x3f800000;
            auVar298._0_8_ = &DAT_3f8000003f800000;
            auVar298._12_4_ = 0x3f800000;
            auVar298._16_4_ = 0x3f800000;
            auVar298._20_4_ = 0x3f800000;
            auVar298._24_4_ = 0x3f800000;
            auVar298._28_4_ = 0x3f800000;
            auVar176 = vsubps_avx(auVar298,auVar258);
            auVar176 = vblendvps_avx(auVar176,auVar258,auVar45);
            auVar432 = ZEXT3264(auVar176);
            auVar176 = vsubps_avx(auVar298,auVar84);
            auVar259 = ZEXT3264(auVar176);
            _local_360 = vblendvps_avx(auVar176,auVar84,auVar45);
            auVar374 = ZEXT3264(auVar83);
            auVar299 = auVar315;
          }
        }
        auVar393 = ZEXT3264(auVar356);
        auVar335 = ZEXT3264(_local_980);
        local_640 = auVar432._0_32_;
        local_660 = auVar374._0_32_;
        auVar371 = local_660;
        auVar357 = local_640;
        if ((((((((auVar299 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar299 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar299 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar299 >> 0x7f,0) != '\0') ||
              (auVar299 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar299 >> 0xbf,0) != '\0') ||
            (auVar299 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar299[0x1f] < '\0') {
          auVar176 = vsubps_avx(_local_8c0,_local_980);
          local_980._0_4_ = (float)local_980._0_4_ + auVar432._0_4_ * auVar176._0_4_;
          local_980._4_4_ = (float)local_980._4_4_ + auVar432._4_4_ * auVar176._4_4_;
          fStack_978 = fStack_978 + auVar432._8_4_ * auVar176._8_4_;
          fStack_974 = fStack_974 + auVar432._12_4_ * auVar176._12_4_;
          fStack_970 = fStack_970 + auVar432._16_4_ * auVar176._16_4_;
          fStack_96c = fStack_96c + auVar432._20_4_ * auVar176._20_4_;
          fStack_968 = fStack_968 + auVar432._24_4_ * auVar176._24_4_;
          fStack_964 = fStack_964 + auVar176._28_4_;
          fVar246 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar85._4_4_ = ((float)local_980._4_4_ + (float)local_980._4_4_) * fVar246;
          auVar85._0_4_ = ((float)local_980._0_4_ + (float)local_980._0_4_) * fVar246;
          auVar85._8_4_ = (fStack_978 + fStack_978) * fVar246;
          auVar85._12_4_ = (fStack_974 + fStack_974) * fVar246;
          auVar85._16_4_ = (fStack_970 + fStack_970) * fVar246;
          auVar85._20_4_ = (fStack_96c + fStack_96c) * fVar246;
          auVar85._24_4_ = (fStack_968 + fStack_968) * fVar246;
          auVar85._28_4_ = fStack_964 + fStack_964;
          auVar176 = vcmpps_avx(local_660,auVar85,6);
          auVar186 = auVar299 & auVar176;
          if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar186 >> 0x7f,0) != '\0') ||
                (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar186 >> 0xbf,0) != '\0') ||
              (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar186[0x1f] < '\0') {
            local_400 = vandps_avx(auVar176,auVar299);
            auVar242 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_360._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
            local_360._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
            fStack_358 = fStack_358 + fStack_358 + -1.0;
            fStack_354 = fStack_354 + fStack_354 + -1.0;
            uStack_350._0_4_ = (float)uStack_350 + (float)uStack_350 + -1.0;
            uStack_350._4_4_ = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
            uStack_348._0_4_ = (float)uStack_348 + (float)uStack_348 + -1.0;
            uStack_348._4_4_ = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
            auVar176 = _local_360;
            local_4a0._4_4_ = local_360._4_4_;
            local_4a0._0_4_ = local_360._0_4_;
            fStack_498 = fStack_358;
            fStack_494 = fStack_354;
            fStack_490 = (float)uStack_350;
            fStack_48c = uStack_350._4_4_;
            fStack_488 = (float)uStack_348;
            fStack_484 = uStack_348._4_4_;
            local_460 = 0;
            uStack_448 = uStack_908;
            uStack_788 = auVar328._8_8_;
            uStack_438 = uStack_788;
            local_430 = local_720;
            uStack_428 = uStack_718;
            uStack_708 = auVar419._8_8_;
            uStack_418 = uStack_708;
            _local_360 = auVar176;
            if ((pGVar168->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              auVar228._0_4_ = 1.0 / (float)(int)uVar34;
              auVar228._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar174 = vshufps_avx(auVar228,auVar228,0);
              local_3e0[0] = auVar174._0_4_ * (auVar432._0_4_ + 0.0);
              local_3e0[1] = auVar174._4_4_ * (auVar432._4_4_ + 1.0);
              local_3e0[2] = auVar174._8_4_ * (auVar432._8_4_ + 2.0);
              local_3e0[3] = auVar174._12_4_ * (auVar432._12_4_ + 3.0);
              fStack_3d0 = auVar174._0_4_ * (auVar432._16_4_ + 4.0);
              fStack_3cc = auVar174._4_4_ * (auVar432._20_4_ + 5.0);
              fStack_3c8 = auVar174._8_4_ * (auVar432._24_4_ + 6.0);
              fStack_3c4 = auVar432._28_4_ + 7.0;
              uStack_348 = auVar176._24_8_;
              local_3c0._16_8_ = uStack_350;
              local_3c0._0_16_ = _local_360;
              local_3c0._24_8_ = uStack_348;
              local_3a0 = local_660;
              auVar216._8_4_ = 0x7f800000;
              auVar216._0_8_ = 0x7f8000007f800000;
              auVar216._12_4_ = 0x7f800000;
              auVar216._16_4_ = 0x7f800000;
              auVar216._20_4_ = 0x7f800000;
              auVar216._24_4_ = 0x7f800000;
              auVar216._28_4_ = 0x7f800000;
              auVar176 = vblendvps_avx(auVar216,local_660,local_400);
              auVar186 = vshufps_avx(auVar176,auVar176,0xb1);
              auVar186 = vminps_avx(auVar176,auVar186);
              auVar39 = vshufpd_avx(auVar186,auVar186,5);
              auVar186 = vminps_avx(auVar186,auVar39);
              auVar39 = vperm2f128_avx(auVar186,auVar186,1);
              auVar186 = vminps_avx(auVar186,auVar39);
              auVar186 = vcmpps_avx(auVar176,auVar186,0);
              auVar39 = local_400 & auVar186;
              auVar176 = local_400;
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                auVar176 = vandps_avx(auVar186,local_400);
              }
              uVar160 = vmovmskps_avx(auVar176);
              uVar161 = 0;
              if (uVar160 != 0) {
                for (; (uVar160 >> uVar161 & 1) == 0; uVar161 = uVar161 + 1) {
                }
              }
              uVar162 = (ulong)uVar161;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar168->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar246 = local_3e0[uVar162];
                uVar11 = *(undefined4 *)(local_3c0 + uVar162 * 4);
                fVar260 = 1.0 - fVar246;
                fVar244 = fVar246 * fVar260 + fVar246 * fVar260;
                auVar174 = ZEXT416((uint)(fVar246 * fVar246 * 3.0));
                auVar174 = vshufps_avx(auVar174,auVar174,0);
                auVar231 = ZEXT416((uint)((fVar244 - fVar246 * fVar246) * 3.0));
                auVar231 = vshufps_avx(auVar231,auVar231,0);
                auVar249 = ZEXT416((uint)((fVar260 * fVar260 - fVar244) * 3.0));
                auVar249 = vshufps_avx(auVar249,auVar249,0);
                auVar233 = ZEXT416((uint)(fVar260 * fVar260 * -3.0));
                auVar233 = vshufps_avx(auVar233,auVar233,0);
                auVar229._0_4_ =
                     auVar233._0_4_ * fVar346 +
                     auVar249._0_4_ * fVar325 +
                     auVar174._0_4_ * fVar417 + auVar231._0_4_ * (float)local_720._0_4_;
                auVar229._4_4_ =
                     auVar233._4_4_ * fVar359 +
                     auVar249._4_4_ * fVar336 +
                     auVar174._4_4_ * fVar423 + auVar231._4_4_ * (float)local_720._4_4_;
                auVar229._8_4_ =
                     auVar233._8_4_ * auVar348._8_4_ +
                     auVar249._8_4_ * auVar328._8_4_ +
                     auVar174._8_4_ * auVar419._8_4_ + auVar231._8_4_ * (float)uStack_718;
                auVar229._12_4_ =
                     auVar233._12_4_ * auVar348._12_4_ +
                     auVar249._12_4_ * auVar328._12_4_ +
                     auVar174._12_4_ * auVar419._12_4_ + auVar231._12_4_ * uStack_718._4_4_;
                auVar242 = ZEXT1664(auVar229);
                auVar259 = ZEXT464(*(uint *)(local_3a0 + uVar162 * 4));
                *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3a0 + uVar162 * 4);
                *(float *)(ray + k * 4 + 0x180) = auVar229._0_4_;
                uVar35 = vextractps_avx(auVar229,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar35;
                uVar35 = vextractps_avx(auVar229,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar35;
                *(float *)(ray + k * 4 + 0x1e0) = fVar246;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar11;
                *(uint *)(ray + k * 4 + 0x220) = uVar33;
                *(uint *)(ray + k * 4 + 0x240) = uVar32;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                auVar174 = vshufps_avx(ZEXT416(uVar32),ZEXT416(uVar32),0);
                auStack_730 = auVar174;
                _local_740 = auVar174;
                auVar174 = vshufps_avx(ZEXT416(uVar33),ZEXT416(uVar33),0);
                register0x00001210 = auVar174;
                _local_820 = auVar174;
                _auStack_750 = auVar254._16_16_;
                auStack_758 = (undefined1  [8])uStack_788;
                local_760 = (Geometry *)auVar328._0_8_;
                uStack_858 = uStack_708;
                local_860 = (undefined1  [8])auVar419._0_8_;
                uStack_870 = *local_778;
                _local_880 = *local_770;
                uStack_868 = local_778[1];
                local_840 = (float)local_720._0_4_;
                fStack_83c = (float)local_720._4_4_;
                fStack_838 = (float)uStack_718;
                fStack_834 = uStack_718._4_4_;
                _local_7e0 = auVar356;
                _local_790 = auVar328;
                _local_710 = auVar419;
                local_6c0 = local_400;
                local_4c0 = local_640;
                local_480 = local_660;
                local_45c = uVar34;
                local_450 = auVar348._0_8_;
                local_440 = auVar328._0_8_;
                local_420 = auVar419._0_8_;
                do {
                  uVar161 = *(uint *)(ray + k * 4 + 0x100);
                  local_240 = local_3e0[uVar162];
                  local_220 = *(undefined4 *)(local_3c0 + uVar162 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3a0 + uVar162 * 4);
                  fVar244 = 1.0 - local_240;
                  fVar246 = local_240 * fVar244 + local_240 * fVar244;
                  auVar174 = ZEXT416((uint)(local_240 * local_240 * 3.0));
                  auVar174 = vshufps_avx(auVar174,auVar174,0);
                  auVar231 = ZEXT416((uint)((fVar246 - local_240 * local_240) * 3.0));
                  auVar231 = vshufps_avx(auVar231,auVar231,0);
                  auVar249 = ZEXT416((uint)((fVar244 * fVar244 - fVar246) * 3.0));
                  auVar249 = vshufps_avx(auVar249,auVar249,0);
                  local_8f0.context = context->user;
                  auVar233 = ZEXT416((uint)(fVar244 * fVar244 * -3.0));
                  auVar233 = vshufps_avx(auVar233,auVar233,0);
                  auVar235._0_4_ =
                       auVar233._0_4_ * fVar346 +
                       auVar249._0_4_ * (float)local_760 +
                       auVar174._0_4_ * (float)local_860._0_4_ + auVar231._0_4_ * local_840;
                  auVar235._4_4_ =
                       auVar233._4_4_ * fVar359 +
                       auVar249._4_4_ * local_760._4_4_ +
                       auVar174._4_4_ * (float)local_860._4_4_ + auVar231._4_4_ * fStack_83c;
                  auVar235._8_4_ =
                       auVar233._8_4_ * auVar348._8_4_ +
                       auVar249._8_4_ * (float)auStack_758._0_4_ +
                       auVar174._8_4_ * (float)uStack_858 + auVar231._8_4_ * fStack_838;
                  auVar235._12_4_ =
                       auVar233._12_4_ * auVar348._12_4_ +
                       auVar249._12_4_ * (float)auStack_758._4_4_ +
                       auVar174._12_4_ * uStack_858._4_4_ + auVar231._12_4_ * fStack_834;
                  auStack_290 = vshufps_avx(auVar235,auVar235,0);
                  local_2a0[0] = (RTCHitN)auStack_290[0];
                  local_2a0[1] = (RTCHitN)auStack_290[1];
                  local_2a0[2] = (RTCHitN)auStack_290[2];
                  local_2a0[3] = (RTCHitN)auStack_290[3];
                  local_2a0[4] = (RTCHitN)auStack_290[4];
                  local_2a0[5] = (RTCHitN)auStack_290[5];
                  local_2a0[6] = (RTCHitN)auStack_290[6];
                  local_2a0[7] = (RTCHitN)auStack_290[7];
                  local_2a0[8] = (RTCHitN)auStack_290[8];
                  local_2a0[9] = (RTCHitN)auStack_290[9];
                  local_2a0[10] = (RTCHitN)auStack_290[10];
                  local_2a0[0xb] = (RTCHitN)auStack_290[0xb];
                  local_2a0[0xc] = (RTCHitN)auStack_290[0xc];
                  local_2a0[0xd] = (RTCHitN)auStack_290[0xd];
                  local_2a0[0xe] = (RTCHitN)auStack_290[0xe];
                  local_2a0[0xf] = (RTCHitN)auStack_290[0xf];
                  auStack_270 = vshufps_avx(auVar235,auVar235,0x55);
                  auVar259 = ZEXT1664(auStack_270);
                  local_280 = auStack_270;
                  auStack_250 = vshufps_avx(auVar235,auVar235,0xaa);
                  local_260 = auStack_250;
                  fStack_23c = local_240;
                  fStack_238 = local_240;
                  fStack_234 = local_240;
                  fStack_230 = local_240;
                  fStack_22c = local_240;
                  fStack_228 = local_240;
                  fStack_224 = local_240;
                  uStack_21c = local_220;
                  uStack_218 = local_220;
                  uStack_214 = local_220;
                  uStack_210 = local_220;
                  uStack_20c = local_220;
                  uStack_208 = local_220;
                  uStack_204 = local_220;
                  local_200 = local_820;
                  uStack_1f8 = uStack_818;
                  uStack_1f0 = uStack_810;
                  uStack_1e8 = uStack_808;
                  local_1e0 = local_740;
                  uStack_1d8 = uStack_738;
                  uStack_1d0 = auStack_730._0_8_;
                  uStack_1c8 = auStack_730._8_8_;
                  _local_800 = vcmpps_avx(auVar193._0_32_,auVar193._0_32_,0xf);
                  local_768[1] = _local_800;
                  *local_768 = _local_800;
                  local_1c0 = (local_8f0.context)->instID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_1a0 = (local_8f0.context)->instPrimID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_7c0 = local_880;
                  uStack_7b8 = uStack_878;
                  uStack_7b0 = uStack_870;
                  uStack_7a8 = uStack_868;
                  local_8f0.valid = (int *)&local_7c0;
                  local_8f0.geometryUserPtr = pGVar168->userPtr;
                  local_8f0.hit = local_2a0;
                  local_8f0.N = 8;
                  local_8f0.ray = (RTCRayN *)ray;
                  if (pGVar168->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_8c0._0_4_ = uVar161;
                    auVar259 = ZEXT1664(auStack_270);
                    (*pGVar168->intersectionFilterN)(&local_8f0);
                    auVar393 = ZEXT3264(_local_7e0);
                    auVar374 = ZEXT3264(local_660);
                    auVar432 = ZEXT3264(local_640);
                    auVar193 = ZEXT1664(ZEXT816(0) << 0x40);
                    uVar161 = local_8c0._0_4_;
                  }
                  auVar335 = ZEXT464(uVar161);
                  auVar145._8_8_ = uStack_7b8;
                  auVar145._0_8_ = local_7c0;
                  auVar174 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar145);
                  auVar149._8_8_ = uStack_7a8;
                  auVar149._0_8_ = uStack_7b0;
                  auVar231 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar149);
                  auVar190._16_16_ = auVar231;
                  auVar190._0_16_ = auVar174;
                  auVar176 = _local_800 & ~auVar190;
                  if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar176 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar176 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar176 >> 0x7f,0) == '\0') &&
                        (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar176 >> 0xbf,0) == '\0') &&
                      (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar176[0x1f]) {
                    auVar191._0_4_ = auVar174._0_4_ ^ local_800._0_4_;
                    auVar191._4_4_ = auVar174._4_4_ ^ local_800._4_4_;
                    auVar191._8_4_ = auVar174._8_4_ ^ local_800._8_4_;
                    auVar191._12_4_ = auVar174._12_4_ ^ local_800._12_4_;
                    auVar191._16_4_ = auVar231._0_4_ ^ local_800._16_4_;
                    auVar191._20_4_ = auVar231._4_4_ ^ local_800._20_4_;
                    auVar191._24_4_ = auVar231._8_4_ ^ local_800._24_4_;
                    auVar191._28_4_ = auVar231._12_4_ ^ local_800._28_4_;
                  }
                  else {
                    p_Var38 = context->args->filter;
                    if ((p_Var38 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar168->field_8).field_0x2 & 0x40) != 0)))) {
                      local_8c0._0_4_ = uVar161;
                      auVar259 = ZEXT1664(auVar259._0_16_);
                      (*p_Var38)(&local_8f0);
                      auVar335 = ZEXT464((uint)local_8c0._0_4_);
                      auVar393 = ZEXT3264(_local_7e0);
                      auVar374 = ZEXT3264(local_660);
                      auVar432 = ZEXT3264(local_640);
                      auVar193 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar146._8_8_ = uStack_7b8;
                    auVar146._0_8_ = local_7c0;
                    auVar174 = vpcmpeqd_avx((undefined1  [16])0x0,auVar146);
                    auVar150._8_8_ = uStack_7a8;
                    auVar150._0_8_ = uStack_7b0;
                    auVar231 = vpcmpeqd_avx((undefined1  [16])0x0,auVar150);
                    auVar224._16_16_ = auVar231;
                    auVar224._0_16_ = auVar174;
                    auVar191._0_4_ = auVar174._0_4_ ^ local_800._0_4_;
                    auVar191._4_4_ = auVar174._4_4_ ^ local_800._4_4_;
                    auVar191._8_4_ = auVar174._8_4_ ^ local_800._8_4_;
                    auVar191._12_4_ = auVar174._12_4_ ^ local_800._12_4_;
                    auVar191._16_4_ = auVar231._0_4_ ^ local_800._16_4_;
                    auVar191._20_4_ = auVar231._4_4_ ^ local_800._20_4_;
                    auVar191._24_4_ = auVar231._8_4_ ^ local_800._24_4_;
                    auVar191._28_4_ = auVar231._12_4_ ^ local_800._28_4_;
                    _local_800 = _local_800 & ~auVar224;
                    if ((((((((_local_800 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             || (_local_800 >> 0x3f & (undefined1  [32])0x1) !=
                                (undefined1  [32])0x0) ||
                            (_local_800 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                           || SUB321(_local_800 >> 0x7f,0) != '\0') ||
                          (_local_800 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(_local_800 >> 0xbf,0) != '\0') ||
                        (_local_800 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        local_800[0x1f] < '\0') {
                      auVar176 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])local_8f0.hit);
                      *(undefined1 (*) [32])(local_8f0.ray + 0x180) = auVar176;
                      auVar176 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0x20));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x1a0) = auVar176;
                      auVar176 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0x40));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x1c0) = auVar176;
                      auVar176 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0x60));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x1e0) = auVar176;
                      auVar176 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0x80));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x200) = auVar176;
                      auVar176 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x220) = auVar176;
                      auVar176 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x240) = auVar176;
                      auVar176 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x260) = auVar176;
                      auVar176 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0x100));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x280) = auVar176;
                    }
                  }
                  auVar356 = auVar393._0_32_;
                  auVar371 = auVar374._0_32_;
                  if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar191 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar191 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar191 >> 0x7f,0) == '\0') &&
                        (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar191 >> 0xbf,0) == '\0') &&
                      (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar191[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar335._0_4_;
                  }
                  *(undefined4 *)(local_6c0 + uVar162 * 4) = 0;
                  uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar192._4_4_ = uVar11;
                  auVar192._0_4_ = uVar11;
                  auVar192._8_4_ = uVar11;
                  auVar192._12_4_ = uVar11;
                  auVar192._16_4_ = uVar11;
                  auVar192._20_4_ = uVar11;
                  auVar192._24_4_ = uVar11;
                  auVar192._28_4_ = uVar11;
                  auVar186 = vcmpps_avx(auVar371,auVar192,2);
                  auVar176 = vandps_avx(auVar186,local_6c0);
                  auVar186 = local_6c0 & auVar186;
                  bVar136 = (auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar137 = (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar135 = (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar134 = SUB321(auVar186 >> 0x7f,0) != '\0';
                  bVar133 = (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar132 = SUB321(auVar186 >> 0xbf,0) != '\0';
                  bVar131 = (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar130 = auVar186[0x1f] < '\0';
                  if (((((((bVar136 || bVar137) || bVar135) || bVar134) || bVar133) || bVar132) ||
                      bVar131) || bVar130) {
                    auVar225._8_4_ = 0x7f800000;
                    auVar225._0_8_ = 0x7f8000007f800000;
                    auVar225._12_4_ = 0x7f800000;
                    auVar225._16_4_ = 0x7f800000;
                    auVar225._20_4_ = 0x7f800000;
                    auVar225._24_4_ = 0x7f800000;
                    auVar225._28_4_ = 0x7f800000;
                    auVar186 = vblendvps_avx(auVar225,auVar371,auVar176);
                    auVar39 = vshufps_avx(auVar186,auVar186,0xb1);
                    auVar39 = vminps_avx(auVar186,auVar39);
                    auVar40 = vshufpd_avx(auVar39,auVar39,5);
                    auVar39 = vminps_avx(auVar39,auVar40);
                    auVar40 = vperm2f128_avx(auVar39,auVar39,1);
                    auVar259 = ZEXT3264(auVar40);
                    local_6c0 = vminps_avx(auVar39,auVar40);
                    auVar39 = vcmpps_avx(auVar186,local_6c0,0);
                    auVar40 = auVar176 & auVar39;
                    auVar186 = auVar176;
                    if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar40 >> 0x7f,0) != '\0') ||
                          (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar40 >> 0xbf,0) != '\0') ||
                        (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar40[0x1f] < '\0') {
                      auVar186 = vandps_avx(auVar39,auVar176);
                    }
                    uVar160 = vmovmskps_avx(auVar186);
                    uVar161 = 0;
                    if (uVar160 != 0) {
                      for (; (uVar160 >> uVar161 & 1) == 0; uVar161 = uVar161 + 1) {
                      }
                    }
                    uVar162 = (ulong)uVar161;
                  }
                  auVar242 = ZEXT3264(local_6c0);
                  auVar357 = auVar432._0_32_;
                  auVar328 = _local_790;
                  auVar419 = _local_710;
                  local_6c0 = auVar176;
                } while (((((((bVar136 || bVar137) || bVar135) || bVar134) || bVar133) || bVar132)
                         || bVar131) || bVar130);
              }
            }
          }
        }
      }
      _local_710 = auVar419;
      _local_790 = auVar328;
      local_660 = auVar371;
      local_640 = auVar357;
      if (8 < (int)uVar34) {
        auVar174 = vpshufd_avx(ZEXT416(uVar34),0);
        local_5e0 = auVar174._0_4_;
        fStack_5dc = auVar174._4_4_;
        fStack_5d8 = auVar174._8_4_;
        fStack_5d4 = auVar174._12_4_;
        auVar174 = vshufps_avx(local_8a0._0_16_,local_8a0._0_16_,0);
        local_100._16_16_ = auVar174;
        local_100._0_16_ = auVar174;
        auVar174 = vpermilps_avx(ZEXT416(uVar165),0);
        local_120._16_16_ = auVar174;
        local_120._0_16_ = auVar174;
        auVar175._0_4_ = 1.0 / (float)local_560._0_4_;
        auVar175._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar174 = vshufps_avx(auVar175,auVar175,0);
        register0x00001210 = auVar174;
        _local_140 = auVar174;
        auVar174 = vshufps_avx(ZEXT416(uVar32),ZEXT416(uVar32),0);
        local_160._16_16_ = auVar174;
        local_160._0_16_ = auVar174;
        auVar174 = vshufps_avx(ZEXT416(uVar33),ZEXT416(uVar33),0);
        local_180._16_16_ = auVar174;
        local_180._0_16_ = auVar174;
        auVar193 = ZEXT3264(local_180);
        lVar169 = 8;
        _local_7e0 = auVar356;
        do {
          pauVar9 = (undefined1 (*) [28])(bezier_basis0 + lVar169 * 4 + lVar166);
          fVar246 = *(float *)*pauVar9;
          fVar244 = *(float *)(*pauVar9 + 4);
          fVar260 = *(float *)(*pauVar9 + 8);
          fVar262 = *(float *)(*pauVar9 + 0xc);
          fVar243 = *(float *)(*pauVar9 + 0x10);
          fVar265 = *(float *)(*pauVar9 + 0x14);
          fVar261 = *(float *)(*pauVar9 + 0x18);
          auVar156 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar166 + 0x2227768 + lVar169 * 4);
          fVar307 = *(float *)*pauVar9;
          fVar263 = *(float *)(*pauVar9 + 4);
          fVar264 = *(float *)(*pauVar9 + 8);
          fVar266 = *(float *)(*pauVar9 + 0xc);
          fVar268 = *(float *)(*pauVar9 + 0x10);
          fVar277 = *(float *)(*pauVar9 + 0x14);
          fVar281 = *(float *)(*pauVar9 + 0x18);
          auVar155 = *pauVar9;
          pfVar1 = (float *)(lVar166 + 0x2227bec + lVar169 * 4);
          fVar304 = *pfVar1;
          fVar305 = pfVar1[1];
          fVar306 = pfVar1[2];
          fVar308 = pfVar1[3];
          fVar363 = pfVar1[4];
          fVar364 = pfVar1[5];
          fVar267 = pfVar1[6];
          pauVar9 = (undefined1 (*) [28])(lVar166 + 0x2228070 + lVar169 * 4);
          fVar285 = *(float *)*pauVar9;
          fVar289 = *(float *)(*pauVar9 + 4);
          fVar290 = *(float *)(*pauVar9 + 8);
          fVar291 = *(float *)(*pauVar9 + 0xc);
          fVar292 = *(float *)(*pauVar9 + 0x10);
          fVar302 = *(float *)(*pauVar9 + 0x14);
          fVar303 = *(float *)(*pauVar9 + 0x18);
          auVar154 = *pauVar9;
          fVar171 = auVar259._28_4_;
          fVar245 = fVar171 + auVar242._28_4_;
          fVar205 = fVar171 + fVar171 + auVar193._28_4_;
          auVar429._0_4_ =
               (float)local_2c0._0_4_ * fVar246 +
               (float)local_540._0_4_ * fVar307 +
               fVar304 * (float)local_700._0_4_ + (float)local_500._0_4_ * fVar285;
          auVar429._4_4_ =
               (float)local_2c0._4_4_ * fVar244 +
               (float)local_540._4_4_ * fVar263 +
               fVar305 * (float)local_700._4_4_ + (float)local_500._4_4_ * fVar289;
          auVar429._8_4_ =
               fStack_2b8 * fVar260 +
               fStack_538 * fVar264 + fVar306 * fStack_6f8 + fStack_4f8 * fVar290;
          auVar429._12_4_ =
               fStack_2b4 * fVar262 +
               fStack_534 * fVar266 + fVar308 * fStack_6f4 + fStack_4f4 * fVar291;
          auVar429._16_4_ =
               fStack_2b0 * fVar243 +
               fStack_530 * fVar268 + fVar363 * fStack_6f0 + fStack_4f0 * fVar292;
          auVar429._20_4_ =
               fStack_2ac * fVar265 +
               fStack_52c * fVar277 + fVar364 * fStack_6ec + fStack_4ec * fVar302;
          auVar429._24_4_ =
               fStack_2a8 * fVar261 +
               fStack_528 * fVar281 + fVar267 * fStack_6e8 + fStack_4e8 * fVar303;
          auVar429._28_4_ = fVar245 + fVar205;
          local_8a0._0_4_ =
               (float)local_5a0._0_4_ * fVar307 +
               fVar304 * (float)local_580._0_4_ + (float)local_520._0_4_ * fVar285 +
               (float)local_320._0_4_ * fVar246;
          local_8a0._4_4_ =
               (float)local_5a0._4_4_ * fVar263 +
               fVar305 * (float)local_580._4_4_ + (float)local_520._4_4_ * fVar289 +
               (float)local_320._4_4_ * fVar244;
          local_8a0._8_4_ =
               fStack_598 * fVar264 + fVar306 * fStack_578 + fStack_518 * fVar290 +
               fStack_318 * fVar260;
          local_8a0._12_4_ =
               fStack_594 * fVar266 + fVar308 * fStack_574 + fStack_514 * fVar291 +
               fStack_314 * fVar262;
          local_8a0._16_4_ =
               fStack_590 * fVar268 + fVar363 * fStack_570 + fStack_510 * fVar292 +
               fStack_310 * fVar243;
          local_8a0._20_4_ =
               fStack_58c * fVar277 + fVar364 * fStack_56c + fStack_50c * fVar302 +
               fStack_30c * fVar265;
          local_8a0._24_4_ =
               fStack_588 * fVar281 + fVar267 * fStack_568 + fStack_508 * fVar303 +
               fStack_308 * fVar261;
          local_8a0._28_4_ = fVar171 + fVar171 + auVar335._28_4_ + fVar205;
          auVar259 = ZEXT3264(local_8a0);
          fVar172 = (float)local_c0._0_4_ * fVar246 +
                    (float)local_a0._0_4_ * fVar307 +
                    fVar304 * (float)local_300._0_4_ + fVar285 * (float)local_2e0._0_4_;
          fVar196 = (float)local_c0._4_4_ * fVar244 +
                    (float)local_a0._4_4_ * fVar263 +
                    fVar305 * (float)local_300._4_4_ + fVar289 * (float)local_2e0._4_4_;
          fVar200 = fStack_b8 * fVar260 +
                    fStack_98 * fVar264 + fVar306 * fStack_2f8 + fVar290 * fStack_2d8;
          fVar201 = fStack_b4 * fVar262 +
                    fStack_94 * fVar266 + fVar308 * fStack_2f4 + fVar291 * fStack_2d4;
          fVar202 = fStack_b0 * fVar243 +
                    fStack_90 * fVar268 + fVar363 * fStack_2f0 + fVar292 * fStack_2d0;
          fVar203 = fStack_ac * fVar265 +
                    fStack_8c * fVar277 + fVar364 * fStack_2ec + fVar302 * fStack_2cc;
          fVar204 = fStack_a8 * fVar261 +
                    fStack_88 * fVar281 + fVar267 * fStack_2e8 + fVar303 * fStack_2c8;
          fVar205 = fVar205 + fVar171 + fVar245;
          pauVar10 = (undefined1 (*) [32])(bezier_basis1 + lVar169 * 4 + lVar166);
          auVar157 = *(undefined1 (*) [28])*pauVar10;
          pfVar1 = (float *)(lVar166 + 0x2229b88 + lVar169 * 4);
          fVar245 = *pfVar1;
          fVar171 = pfVar1[1];
          fVar309 = pfVar1[2];
          fVar195 = pfVar1[3];
          fVar376 = pfVar1[4];
          fVar198 = pfVar1[5];
          fVar199 = pfVar1[6];
          pauVar9 = (undefined1 (*) [28])(lVar166 + 0x222a00c + lVar169 * 4);
          fVar244 = *(float *)*pauVar9;
          fVar260 = *(float *)(*pauVar9 + 4);
          fVar243 = *(float *)(*pauVar9 + 8);
          fVar265 = *(float *)(*pauVar9 + 0xc);
          fVar307 = *(float *)(*pauVar9 + 0x10);
          fVar263 = *(float *)(*pauVar9 + 0x14);
          fVar266 = *(float *)(*pauVar9 + 0x18);
          auVar158 = *pauVar9;
          pfVar1 = (float *)(lVar166 + 0x222a490 + lVar169 * 4);
          local_5c0 = *pfVar1;
          fStack_5bc = pfVar1[1];
          fStack_5b8 = pfVar1[2];
          fStack_5b4 = pfVar1[3];
          fStack_5b0 = pfVar1[4];
          fStack_5ac = pfVar1[5];
          fStack_5a8 = pfVar1[6];
          fStack_5a4 = pfVar1[7];
          fVar268 = fStack_5a4 + fStack_5a4 + *(float *)(*pauVar10 + 0x1c);
          auVar193 = ZEXT3264(*pauVar10);
          fVar246 = auVar157._0_4_;
          fVar262 = auVar157._4_4_;
          fVar261 = auVar157._8_4_;
          fVar264 = auVar157._12_4_;
          fVar277 = auVar157._16_4_;
          fVar289 = auVar157._20_4_;
          fVar292 = auVar157._24_4_;
          auVar316._0_4_ =
               (float)local_2c0._0_4_ * fVar246 +
               fVar245 * (float)local_540._0_4_ +
               fVar244 * (float)local_700._0_4_ + (float)local_500._0_4_ * local_5c0;
          auVar316._4_4_ =
               (float)local_2c0._4_4_ * fVar262 +
               fVar171 * (float)local_540._4_4_ +
               fVar260 * (float)local_700._4_4_ + (float)local_500._4_4_ * fStack_5bc;
          auVar316._8_4_ =
               fStack_2b8 * fVar261 +
               fVar309 * fStack_538 + fVar243 * fStack_6f8 + fStack_4f8 * fStack_5b8;
          auVar316._12_4_ =
               fStack_2b4 * fVar264 +
               fVar195 * fStack_534 + fVar265 * fStack_6f4 + fStack_4f4 * fStack_5b4;
          auVar316._16_4_ =
               fStack_2b0 * fVar277 +
               fVar376 * fStack_530 + fVar307 * fStack_6f0 + fStack_4f0 * fStack_5b0;
          auVar316._20_4_ =
               fStack_2ac * fVar289 +
               fVar198 * fStack_52c + fVar263 * fStack_6ec + fStack_4ec * fStack_5ac;
          auVar316._24_4_ =
               fStack_2a8 * fVar292 +
               fVar199 * fStack_528 + fVar266 * fStack_6e8 + fStack_4e8 * fStack_5a8;
          auVar316._28_4_ = fStack_524 + fVar268;
          auVar300._0_4_ =
               (float)local_320._0_4_ * fVar246 +
               (float)local_5a0._0_4_ * fVar245 +
               (float)local_520._0_4_ * local_5c0 + fVar244 * (float)local_580._0_4_;
          auVar300._4_4_ =
               (float)local_320._4_4_ * fVar262 +
               (float)local_5a0._4_4_ * fVar171 +
               (float)local_520._4_4_ * fStack_5bc + fVar260 * (float)local_580._4_4_;
          auVar300._8_4_ =
               fStack_318 * fVar261 +
               fStack_598 * fVar309 + fStack_518 * fStack_5b8 + fVar243 * fStack_578;
          auVar300._12_4_ =
               fStack_314 * fVar264 +
               fStack_594 * fVar195 + fStack_514 * fStack_5b4 + fVar265 * fStack_574;
          auVar300._16_4_ =
               fStack_310 * fVar277 +
               fStack_590 * fVar376 + fStack_510 * fStack_5b0 + fVar307 * fStack_570;
          auVar300._20_4_ =
               fStack_30c * fVar289 +
               fStack_58c * fVar198 + fStack_50c * fStack_5ac + fVar263 * fStack_56c;
          auVar300._24_4_ =
               fStack_308 * fVar292 +
               fStack_588 * fVar199 + fStack_508 * fStack_5a8 + fVar266 * fStack_568;
          auVar300._28_4_ = fVar268 + fStack_5a4 + fStack_4e4 + fStack_5a4;
          auVar422._0_4_ =
               (float)local_a0._0_4_ * fVar245 +
               fVar244 * (float)local_300._0_4_ + local_5c0 * (float)local_2e0._0_4_ +
               (float)local_c0._0_4_ * fVar246;
          auVar422._4_4_ =
               (float)local_a0._4_4_ * fVar171 +
               fVar260 * (float)local_300._4_4_ + fStack_5bc * (float)local_2e0._4_4_ +
               (float)local_c0._4_4_ * fVar262;
          auVar422._8_4_ =
               fStack_98 * fVar309 + fVar243 * fStack_2f8 + fStack_5b8 * fStack_2d8 +
               fStack_b8 * fVar261;
          auVar422._12_4_ =
               fStack_94 * fVar195 + fVar265 * fStack_2f4 + fStack_5b4 * fStack_2d4 +
               fStack_b4 * fVar264;
          auVar422._16_4_ =
               fStack_90 * fVar376 + fVar307 * fStack_2f0 + fStack_5b0 * fStack_2d0 +
               fStack_b0 * fVar277;
          auVar422._20_4_ =
               fStack_8c * fVar198 + fVar263 * fStack_2ec + fStack_5ac * fStack_2cc +
               fStack_ac * fVar289;
          auVar422._24_4_ =
               fStack_88 * fVar199 + fVar266 * fStack_2e8 + fStack_5a8 * fStack_2c8 +
               fStack_a8 * fVar292;
          auVar422._28_4_ = fStack_5a4 + fStack_5a4 + fStack_504 + fVar268;
          auVar186 = vsubps_avx(auVar316,auVar429);
          auVar335 = ZEXT3264(auVar186);
          local_340 = vsubps_avx(auVar300,local_8a0);
          fVar244 = auVar186._0_4_;
          fVar243 = auVar186._4_4_;
          auVar86._4_4_ = local_8a0._4_4_ * fVar243;
          auVar86._0_4_ = local_8a0._0_4_ * fVar244;
          fVar307 = auVar186._8_4_;
          auVar86._8_4_ = local_8a0._8_4_ * fVar307;
          fVar266 = auVar186._12_4_;
          auVar86._12_4_ = local_8a0._12_4_ * fVar266;
          fVar281 = auVar186._16_4_;
          auVar86._16_4_ = local_8a0._16_4_ * fVar281;
          fVar290 = auVar186._20_4_;
          auVar86._20_4_ = local_8a0._20_4_ * fVar290;
          fVar302 = auVar186._24_4_;
          auVar86._24_4_ = local_8a0._24_4_ * fVar302;
          auVar86._28_4_ = fVar268;
          fVar260 = local_340._0_4_;
          fVar265 = local_340._4_4_;
          auVar87._4_4_ = auVar429._4_4_ * fVar265;
          auVar87._0_4_ = auVar429._0_4_ * fVar260;
          fVar263 = local_340._8_4_;
          auVar87._8_4_ = auVar429._8_4_ * fVar263;
          fVar268 = local_340._12_4_;
          auVar87._12_4_ = auVar429._12_4_ * fVar268;
          fVar285 = local_340._16_4_;
          auVar87._16_4_ = auVar429._16_4_ * fVar285;
          fVar291 = local_340._20_4_;
          auVar87._20_4_ = auVar429._20_4_ * fVar291;
          fVar303 = local_340._24_4_;
          auVar87._24_4_ = auVar429._24_4_ * fVar303;
          auVar87._28_4_ = auVar300._28_4_;
          auVar39 = vsubps_avx(auVar86,auVar87);
          auVar140._4_4_ = fVar196;
          auVar140._0_4_ = fVar172;
          auVar140._8_4_ = fVar200;
          auVar140._12_4_ = fVar201;
          auVar140._16_4_ = fVar202;
          auVar140._20_4_ = fVar203;
          auVar140._24_4_ = fVar204;
          auVar140._28_4_ = fVar205;
          auVar176 = vmaxps_avx(auVar140,auVar422);
          auVar88._4_4_ = auVar176._4_4_ * auVar176._4_4_ * (fVar243 * fVar243 + fVar265 * fVar265);
          auVar88._0_4_ = auVar176._0_4_ * auVar176._0_4_ * (fVar244 * fVar244 + fVar260 * fVar260);
          auVar88._8_4_ = auVar176._8_4_ * auVar176._8_4_ * (fVar307 * fVar307 + fVar263 * fVar263);
          auVar88._12_4_ =
               auVar176._12_4_ * auVar176._12_4_ * (fVar266 * fVar266 + fVar268 * fVar268);
          auVar88._16_4_ =
               auVar176._16_4_ * auVar176._16_4_ * (fVar281 * fVar281 + fVar285 * fVar285);
          auVar88._20_4_ =
               auVar176._20_4_ * auVar176._20_4_ * (fVar290 * fVar290 + fVar291 * fVar291);
          auVar88._24_4_ =
               auVar176._24_4_ * auVar176._24_4_ * (fVar302 * fVar302 + fVar303 * fVar303);
          auVar88._28_4_ = auVar316._28_4_ + auVar300._28_4_;
          auVar89._4_4_ = auVar39._4_4_ * auVar39._4_4_;
          auVar89._0_4_ = auVar39._0_4_ * auVar39._0_4_;
          auVar89._8_4_ = auVar39._8_4_ * auVar39._8_4_;
          auVar89._12_4_ = auVar39._12_4_ * auVar39._12_4_;
          auVar89._16_4_ = auVar39._16_4_ * auVar39._16_4_;
          auVar89._20_4_ = auVar39._20_4_ * auVar39._20_4_;
          auVar89._24_4_ = auVar39._24_4_ * auVar39._24_4_;
          auVar89._28_4_ = auVar39._28_4_;
          auVar176 = vcmpps_avx(auVar89,auVar88,2);
          local_460 = (uint)lVar169;
          auVar231 = vpshufd_avx(ZEXT416(local_460),0);
          auVar174 = vpor_avx(auVar231,_DAT_01ff0cf0);
          auVar231 = vpor_avx(auVar231,_DAT_02020ea0);
          auVar151._4_4_ = fStack_5dc;
          auVar151._0_4_ = local_5e0;
          auVar151._8_4_ = fStack_5d8;
          auVar151._12_4_ = fStack_5d4;
          auVar174 = vpcmpgtd_avx(auVar151,auVar174);
          auVar231 = vpcmpgtd_avx(auVar151,auVar231);
          auVar240._16_16_ = auVar231;
          auVar240._0_16_ = auVar174;
          auVar242 = ZEXT3264(auVar240);
          auVar39 = auVar240 & auVar176;
          if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar39 >> 0x7f,0) != '\0') ||
                (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar39 >> 0xbf,0) != '\0') ||
              (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar39[0x1f] < '\0') {
            local_880._0_4_ = auVar158._0_4_;
            local_880._4_4_ = auVar158._4_4_;
            uStack_878._0_4_ = auVar158._8_4_;
            uStack_878._4_4_ = auVar158._12_4_;
            uStack_870._0_4_ = auVar158._16_4_;
            uStack_870._4_4_ = auVar158._20_4_;
            uStack_868._0_4_ = auVar158._24_4_;
            local_880._0_4_ =
                 fVar246 * (float)local_7e0._0_4_ +
                 fVar245 * (float)local_4e0._0_4_ +
                 (float)local_e0._0_4_ * (float)local_880._0_4_ + (float)local_6e0._0_4_ * local_5c0
            ;
            local_880._4_4_ =
                 fVar262 * (float)local_7e0._4_4_ +
                 fVar171 * (float)local_4e0._4_4_ +
                 (float)local_e0._4_4_ * (float)local_880._4_4_ +
                 (float)local_6e0._4_4_ * fStack_5bc;
            uStack_878._0_4_ =
                 fVar261 * fStack_7d8 +
                 fVar309 * fStack_4d8 + fStack_d8 * (float)uStack_878 + fStack_6d8 * fStack_5b8;
            uStack_878._4_4_ =
                 fVar264 * fStack_7d4 +
                 fVar195 * fStack_4d4 + fStack_d4 * uStack_878._4_4_ + fStack_6d4 * fStack_5b4;
            uStack_870._0_4_ =
                 fVar277 * fStack_7d0 +
                 fVar376 * fStack_4d0 + fStack_d0 * (float)uStack_870 + fStack_6d0 * fStack_5b0;
            uStack_870._4_4_ =
                 fVar289 * fStack_7cc +
                 fVar198 * fStack_4cc + fStack_cc * uStack_870._4_4_ + fStack_6cc * fStack_5ac;
            uStack_868._0_4_ =
                 fVar292 * fStack_7c8 +
                 fVar199 * fStack_4c8 + fStack_c8 * (float)uStack_868 + fStack_6c8 * fStack_5a8;
            uStack_868._4_4_ = local_340._28_4_ + *(float *)(*pauVar10 + 0x1c) + fStack_584 + 0.0;
            local_760._0_4_ = auVar155._0_4_;
            local_760._4_4_ = auVar155._4_4_;
            auStack_758._0_4_ = auVar155._8_4_;
            auStack_758._4_4_ = auVar155._12_4_;
            auStack_750._0_4_ = auVar155._16_4_;
            auStack_750._4_4_ = auVar155._20_4_;
            fStack_748 = auVar155._24_4_;
            local_860._0_4_ = auVar154._0_4_;
            local_860._4_4_ = auVar154._4_4_;
            uStack_858._0_4_ = auVar154._8_4_;
            uStack_858._4_4_ = auVar154._12_4_;
            fStack_850 = auVar154._16_4_;
            fStack_84c = auVar154._20_4_;
            fStack_848 = auVar154._24_4_;
            fVar310 = (float)local_6e0._0_4_ * (float)local_860._0_4_;
            fVar318 = (float)local_6e0._4_4_ * (float)local_860._4_4_;
            fVar319 = fStack_6d8 * (float)uStack_858;
            fVar320 = fStack_6d4 * uStack_858._4_4_;
            fVar321 = fStack_6d0 * fStack_850;
            fVar322 = fStack_6cc * fStack_84c;
            fVar323 = fStack_6c8 * fStack_848;
            pfVar1 = (float *)(lVar166 + 0x2228dfc + lVar169 * 4);
            fVar246 = *pfVar1;
            fVar244 = pfVar1[1];
            fVar260 = pfVar1[2];
            fVar262 = pfVar1[3];
            fVar243 = pfVar1[4];
            fVar265 = pfVar1[5];
            fVar261 = pfVar1[6];
            pfVar2 = (float *)(lVar166 + 0x2229280 + lVar169 * 4);
            fVar307 = *pfVar2;
            fVar263 = pfVar2[1];
            fVar264 = pfVar2[2];
            fVar266 = pfVar2[3];
            fVar268 = pfVar2[4];
            fVar277 = pfVar2[5];
            fVar281 = pfVar2[6];
            pfVar3 = (float *)(lVar166 + 0x2228978 + lVar169 * 4);
            fVar285 = *pfVar3;
            fVar289 = pfVar3[1];
            fVar290 = pfVar3[2];
            fVar291 = pfVar3[3];
            fVar292 = pfVar3[4];
            fVar302 = pfVar3[5];
            fVar303 = pfVar3[6];
            fVar206 = pfVar1[7] + pfVar2[7];
            fVar226 = pfVar2[7] + auVar422._28_4_ + 0.0;
            fVar324 = auVar422._28_4_ + fStack_304 + auVar422._28_4_ + 0.0;
            pfVar1 = (float *)(lVar166 + 0x22284f4 + lVar169 * 4);
            fVar245 = *pfVar1;
            fVar171 = pfVar1[1];
            fVar309 = pfVar1[2];
            fVar195 = pfVar1[3];
            fVar376 = pfVar1[4];
            fVar198 = pfVar1[5];
            fVar199 = pfVar1[6];
            local_860._4_4_ =
                 fVar171 * (float)local_2c0._4_4_ +
                 (float)local_540._4_4_ * fVar289 +
                 (float)local_700._4_4_ * fVar244 + (float)local_500._4_4_ * fVar263;
            local_860._0_4_ =
                 fVar245 * (float)local_2c0._0_4_ +
                 (float)local_540._0_4_ * fVar285 +
                 (float)local_700._0_4_ * fVar246 + (float)local_500._0_4_ * fVar307;
            uStack_858._0_4_ =
                 fVar309 * fStack_2b8 +
                 fStack_538 * fVar290 + fStack_6f8 * fVar260 + fStack_4f8 * fVar264;
            uStack_858._4_4_ =
                 fVar195 * fStack_2b4 +
                 fStack_534 * fVar291 + fStack_6f4 * fVar262 + fStack_4f4 * fVar266;
            fStack_850 = fVar376 * fStack_2b0 +
                         fStack_530 * fVar292 + fStack_6f0 * fVar243 + fStack_4f0 * fVar268;
            fStack_84c = fVar198 * fStack_2ac +
                         fStack_52c * fVar302 + fStack_6ec * fVar265 + fStack_4ec * fVar277;
            fStack_848 = fVar199 * fStack_2a8 +
                         fStack_528 * fVar303 + fStack_6e8 * fVar261 + fStack_4e8 * fVar281;
            fStack_844 = fVar206 + fVar226;
            auVar217._0_4_ =
                 fVar245 * (float)local_320._0_4_ +
                 (float)local_580._0_4_ * fVar246 + (float)local_520._0_4_ * fVar307 +
                 (float)local_5a0._0_4_ * fVar285;
            auVar217._4_4_ =
                 fVar171 * (float)local_320._4_4_ +
                 (float)local_580._4_4_ * fVar244 + (float)local_520._4_4_ * fVar263 +
                 (float)local_5a0._4_4_ * fVar289;
            auVar217._8_4_ =
                 fVar309 * fStack_318 +
                 fStack_578 * fVar260 + fStack_518 * fVar264 + fStack_598 * fVar290;
            auVar217._12_4_ =
                 fVar195 * fStack_314 +
                 fStack_574 * fVar262 + fStack_514 * fVar266 + fStack_594 * fVar291;
            auVar217._16_4_ =
                 fVar376 * fStack_310 +
                 fStack_570 * fVar243 + fStack_510 * fVar268 + fStack_590 * fVar292;
            auVar217._20_4_ =
                 fVar198 * fStack_30c +
                 fStack_56c * fVar265 + fStack_50c * fVar277 + fStack_58c * fVar302;
            auVar217._24_4_ =
                 fVar199 * fStack_308 +
                 fStack_568 * fVar261 + fStack_508 * fVar281 + fStack_588 * fVar303;
            auVar217._28_4_ = fVar226 + fVar324;
            auVar409._0_4_ =
                 (float)local_4e0._0_4_ * fVar285 +
                 (float)local_e0._0_4_ * fVar246 + (float)local_6e0._0_4_ * fVar307 +
                 fVar245 * (float)local_7e0._0_4_;
            auVar409._4_4_ =
                 (float)local_4e0._4_4_ * fVar289 +
                 (float)local_e0._4_4_ * fVar244 + (float)local_6e0._4_4_ * fVar263 +
                 fVar171 * (float)local_7e0._4_4_;
            auVar409._8_4_ =
                 fStack_4d8 * fVar290 + fStack_d8 * fVar260 + fStack_6d8 * fVar264 +
                 fVar309 * fStack_7d8;
            auVar409._12_4_ =
                 fStack_4d4 * fVar291 + fStack_d4 * fVar262 + fStack_6d4 * fVar266 +
                 fVar195 * fStack_7d4;
            auVar409._16_4_ =
                 fStack_4d0 * fVar292 + fStack_d0 * fVar243 + fStack_6d0 * fVar268 +
                 fVar376 * fStack_7d0;
            auVar409._20_4_ =
                 fStack_4cc * fVar302 + fStack_cc * fVar265 + fStack_6cc * fVar277 +
                 fVar198 * fStack_7cc;
            auVar409._24_4_ =
                 fStack_4c8 * fVar303 + fStack_c8 * fVar261 + fStack_6c8 * fVar281 +
                 fVar199 * fStack_7c8;
            auVar409._28_4_ = pfVar3[7] + fVar206 + fVar324;
            pfVar1 = (float *)(lVar166 + 0x222b21c + lVar169 * 4);
            fVar246 = *pfVar1;
            fVar244 = pfVar1[1];
            fVar260 = pfVar1[2];
            fVar262 = pfVar1[3];
            fVar243 = pfVar1[4];
            fVar265 = pfVar1[5];
            fVar261 = pfVar1[6];
            pfVar2 = (float *)(lVar166 + 0x222b6a0 + lVar169 * 4);
            fVar307 = *pfVar2;
            fVar263 = pfVar2[1];
            fVar264 = pfVar2[2];
            fVar266 = pfVar2[3];
            fVar268 = pfVar2[4];
            fVar277 = pfVar2[5];
            fVar281 = pfVar2[6];
            pfVar3 = (float *)(lVar166 + 0x222ad98 + lVar169 * 4);
            fVar285 = *pfVar3;
            fVar289 = pfVar3[1];
            fVar290 = pfVar3[2];
            fVar291 = pfVar3[3];
            fVar292 = pfVar3[4];
            fVar302 = pfVar3[5];
            fVar303 = pfVar3[6];
            pfVar4 = (float *)(lVar166 + 0x222a914 + lVar169 * 4);
            fVar245 = *pfVar4;
            fVar171 = pfVar4[1];
            fVar309 = pfVar4[2];
            fVar195 = pfVar4[3];
            fVar376 = pfVar4[4];
            fVar198 = pfVar4[5];
            fVar199 = pfVar4[6];
            auVar372._0_4_ =
                 fVar245 * (float)local_2c0._0_4_ +
                 fVar285 * (float)local_540._0_4_ +
                 (float)local_700._0_4_ * fVar246 + (float)local_500._0_4_ * fVar307;
            auVar372._4_4_ =
                 fVar171 * (float)local_2c0._4_4_ +
                 fVar289 * (float)local_540._4_4_ +
                 (float)local_700._4_4_ * fVar244 + (float)local_500._4_4_ * fVar263;
            auVar372._8_4_ =
                 fVar309 * fStack_2b8 +
                 fVar290 * fStack_538 + fStack_6f8 * fVar260 + fStack_4f8 * fVar264;
            auVar372._12_4_ =
                 fVar195 * fStack_2b4 +
                 fVar291 * fStack_534 + fStack_6f4 * fVar262 + fStack_4f4 * fVar266;
            auVar372._16_4_ =
                 fVar376 * fStack_2b0 +
                 fVar292 * fStack_530 + fStack_6f0 * fVar243 + fStack_4f0 * fVar268;
            auVar372._20_4_ =
                 fVar198 * fStack_2ac +
                 fVar302 * fStack_52c + fStack_6ec * fVar265 + fStack_4ec * fVar277;
            auVar372._24_4_ =
                 fVar199 * fStack_2a8 +
                 fVar303 * fStack_528 + fStack_6e8 * fVar261 + fStack_4e8 * fVar281;
            auVar372._28_4_ = fStack_584 + fStack_584 + fStack_6e4 + fStack_584;
            auVar401._0_4_ =
                 fVar245 * (float)local_320._0_4_ +
                 fVar285 * (float)local_5a0._0_4_ +
                 (float)local_580._0_4_ * fVar246 + fVar307 * (float)local_520._0_4_;
            auVar401._4_4_ =
                 fVar171 * (float)local_320._4_4_ +
                 fVar289 * (float)local_5a0._4_4_ +
                 (float)local_580._4_4_ * fVar244 + fVar263 * (float)local_520._4_4_;
            auVar401._8_4_ =
                 fVar309 * fStack_318 +
                 fVar290 * fStack_598 + fStack_578 * fVar260 + fVar264 * fStack_518;
            auVar401._12_4_ =
                 fVar195 * fStack_314 +
                 fVar291 * fStack_594 + fStack_574 * fVar262 + fVar266 * fStack_514;
            auVar401._16_4_ =
                 fVar376 * fStack_310 +
                 fVar292 * fStack_590 + fStack_570 * fVar243 + fVar268 * fStack_510;
            auVar401._20_4_ =
                 fVar198 * fStack_30c +
                 fVar302 * fStack_58c + fStack_56c * fVar265 + fVar277 * fStack_50c;
            auVar401._24_4_ =
                 fVar199 * fStack_308 +
                 fVar303 * fStack_588 + fStack_568 * fVar261 + fVar281 * fStack_508;
            auVar401._28_4_ = fStack_584 + fStack_584 + fStack_564 + fStack_584;
            auVar301._8_4_ = 0x7fffffff;
            auVar301._0_8_ = 0x7fffffff7fffffff;
            auVar301._12_4_ = 0x7fffffff;
            auVar301._16_4_ = 0x7fffffff;
            auVar301._20_4_ = 0x7fffffff;
            auVar301._24_4_ = 0x7fffffff;
            auVar301._28_4_ = 0x7fffffff;
            auVar39 = vandps_avx(_local_860,auVar301);
            auVar40 = vandps_avx(auVar217,auVar301);
            auVar40 = vmaxps_avx(auVar39,auVar40);
            auVar39 = vandps_avx(auVar409,auVar301);
            auVar40 = vmaxps_avx(auVar40,auVar39);
            auVar40 = vcmpps_avx(auVar40,local_100,1);
            auVar41 = vblendvps_avx(_local_860,auVar186,auVar40);
            auVar183._0_4_ =
                 fVar245 * (float)local_7e0._0_4_ +
                 (float)local_4e0._0_4_ * fVar285 +
                 (float)local_6e0._0_4_ * fVar307 + (float)local_e0._0_4_ * fVar246;
            auVar183._4_4_ =
                 fVar171 * (float)local_7e0._4_4_ +
                 (float)local_4e0._4_4_ * fVar289 +
                 (float)local_6e0._4_4_ * fVar263 + (float)local_e0._4_4_ * fVar244;
            auVar183._8_4_ =
                 fVar309 * fStack_7d8 +
                 fStack_4d8 * fVar290 + fStack_6d8 * fVar264 + fStack_d8 * fVar260;
            auVar183._12_4_ =
                 fVar195 * fStack_7d4 +
                 fStack_4d4 * fVar291 + fStack_6d4 * fVar266 + fStack_d4 * fVar262;
            auVar183._16_4_ =
                 fVar376 * fStack_7d0 +
                 fStack_4d0 * fVar292 + fStack_6d0 * fVar268 + fStack_d0 * fVar243;
            auVar183._20_4_ =
                 fVar198 * fStack_7cc +
                 fStack_4cc * fVar302 + fStack_6cc * fVar277 + fStack_cc * fVar265;
            auVar183._24_4_ =
                 fVar199 * fStack_7c8 +
                 fStack_4c8 * fVar303 + fStack_6c8 * fVar281 + fStack_c8 * fVar261;
            auVar183._28_4_ = auVar39._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar371 = vblendvps_avx(auVar217,local_340,auVar40);
            auVar39 = vandps_avx(auVar372,auVar301);
            auVar40 = vandps_avx(auVar401,auVar301);
            auVar40 = vmaxps_avx(auVar39,auVar40);
            auVar39 = vandps_avx(auVar183,auVar301);
            auVar39 = vmaxps_avx(auVar40,auVar39);
            local_820._0_4_ = auVar156._0_4_;
            local_820._4_4_ = auVar156._4_4_;
            uStack_818._0_4_ = auVar156._8_4_;
            uStack_818._4_4_ = auVar156._12_4_;
            uStack_810._0_4_ = auVar156._16_4_;
            uStack_810._4_4_ = auVar156._20_4_;
            uStack_808._0_4_ = auVar156._24_4_;
            auVar39 = vcmpps_avx(auVar39,local_100,1);
            auVar186 = vblendvps_avx(auVar372,auVar186,auVar39);
            auVar184._0_4_ =
                 (float)local_7e0._0_4_ * (float)local_820._0_4_ +
                 (float)local_4e0._0_4_ * (float)local_760 +
                 (float)local_e0._0_4_ * fVar304 + fVar310;
            auVar184._4_4_ =
                 (float)local_7e0._4_4_ * (float)local_820._4_4_ +
                 (float)local_4e0._4_4_ * local_760._4_4_ +
                 (float)local_e0._4_4_ * fVar305 + fVar318;
            auVar184._8_4_ =
                 fStack_7d8 * (float)uStack_818 +
                 fStack_4d8 * (float)auStack_758._0_4_ + fStack_d8 * fVar306 + fVar319;
            auVar184._12_4_ =
                 fStack_7d4 * uStack_818._4_4_ +
                 fStack_4d4 * (float)auStack_758._4_4_ + fStack_d4 * fVar308 + fVar320;
            auVar184._16_4_ =
                 fStack_7d0 * (float)uStack_810 +
                 fStack_4d0 * (float)auStack_750._0_4_ + fStack_d0 * fVar363 + fVar321;
            auVar184._20_4_ =
                 fStack_7cc * uStack_810._4_4_ +
                 fStack_4cc * (float)auStack_750._4_4_ + fStack_cc * fVar364 + fVar322;
            auVar184._24_4_ =
                 fStack_7c8 * (float)uStack_808 +
                 fStack_4c8 * fStack_748 + fStack_c8 * fVar267 + fVar323;
            auVar184._28_4_ = auVar40._28_4_ + uStack_868._4_4_ + fStack_584 + 0.0;
            auVar39 = vblendvps_avx(auVar401,local_340,auVar39);
            fVar206 = auVar41._0_4_;
            fVar226 = auVar41._4_4_;
            fVar310 = auVar41._8_4_;
            fVar318 = auVar41._12_4_;
            fVar319 = auVar41._16_4_;
            fVar320 = auVar41._20_4_;
            fVar321 = auVar41._24_4_;
            fVar322 = auVar41._28_4_;
            fVar285 = auVar186._0_4_;
            fVar290 = auVar186._4_4_;
            fVar292 = auVar186._8_4_;
            fVar303 = auVar186._12_4_;
            fVar305 = auVar186._16_4_;
            fVar308 = auVar186._20_4_;
            fVar364 = auVar186._24_4_;
            fVar246 = auVar371._0_4_;
            fVar260 = auVar371._4_4_;
            fVar243 = auVar371._8_4_;
            fVar261 = auVar371._12_4_;
            fVar263 = auVar371._16_4_;
            fVar266 = auVar371._20_4_;
            fVar277 = auVar371._24_4_;
            auVar382._0_4_ = fVar246 * fVar246 + fVar206 * fVar206;
            auVar382._4_4_ = fVar260 * fVar260 + fVar226 * fVar226;
            auVar382._8_4_ = fVar243 * fVar243 + fVar310 * fVar310;
            auVar382._12_4_ = fVar261 * fVar261 + fVar318 * fVar318;
            auVar382._16_4_ = fVar263 * fVar263 + fVar319 * fVar319;
            auVar382._20_4_ = fVar266 * fVar266 + fVar320 * fVar320;
            auVar382._24_4_ = fVar277 * fVar277 + fVar321 * fVar321;
            auVar382._28_4_ = fStack_6c4 + local_340._28_4_;
            auVar40 = vrsqrtps_avx(auVar382);
            fVar244 = auVar40._0_4_;
            fVar262 = auVar40._4_4_;
            auVar90._4_4_ = fVar262 * 1.5;
            auVar90._0_4_ = fVar244 * 1.5;
            fVar265 = auVar40._8_4_;
            auVar90._8_4_ = fVar265 * 1.5;
            fVar307 = auVar40._12_4_;
            auVar90._12_4_ = fVar307 * 1.5;
            fVar264 = auVar40._16_4_;
            auVar90._16_4_ = fVar264 * 1.5;
            fVar268 = auVar40._20_4_;
            auVar90._20_4_ = fVar268 * 1.5;
            fVar281 = auVar40._24_4_;
            auVar90._24_4_ = fVar281 * 1.5;
            auVar90._28_4_ = auVar401._28_4_;
            auVar91._4_4_ = fVar262 * fVar262 * fVar262 * auVar382._4_4_ * 0.5;
            auVar91._0_4_ = fVar244 * fVar244 * fVar244 * auVar382._0_4_ * 0.5;
            auVar91._8_4_ = fVar265 * fVar265 * fVar265 * auVar382._8_4_ * 0.5;
            auVar91._12_4_ = fVar307 * fVar307 * fVar307 * auVar382._12_4_ * 0.5;
            auVar91._16_4_ = fVar264 * fVar264 * fVar264 * auVar382._16_4_ * 0.5;
            auVar91._20_4_ = fVar268 * fVar268 * fVar268 * auVar382._20_4_ * 0.5;
            auVar91._24_4_ = fVar281 * fVar281 * fVar281 * auVar382._24_4_ * 0.5;
            auVar91._28_4_ = auVar382._28_4_;
            auVar41 = vsubps_avx(auVar90,auVar91);
            fVar245 = auVar41._0_4_;
            fVar171 = auVar41._4_4_;
            fVar309 = auVar41._8_4_;
            fVar195 = auVar41._12_4_;
            fVar376 = auVar41._16_4_;
            fVar198 = auVar41._20_4_;
            fVar199 = auVar41._24_4_;
            fVar244 = auVar39._0_4_;
            fVar262 = auVar39._4_4_;
            fVar265 = auVar39._8_4_;
            fVar307 = auVar39._12_4_;
            fVar264 = auVar39._16_4_;
            fVar268 = auVar39._20_4_;
            fVar281 = auVar39._24_4_;
            auVar358._0_4_ = fVar244 * fVar244 + fVar285 * fVar285;
            auVar358._4_4_ = fVar262 * fVar262 + fVar290 * fVar290;
            auVar358._8_4_ = fVar265 * fVar265 + fVar292 * fVar292;
            auVar358._12_4_ = fVar307 * fVar307 + fVar303 * fVar303;
            auVar358._16_4_ = fVar264 * fVar264 + fVar305 * fVar305;
            auVar358._20_4_ = fVar268 * fVar268 + fVar308 * fVar308;
            auVar358._24_4_ = fVar281 * fVar281 + fVar364 * fVar364;
            auVar358._28_4_ = auVar40._28_4_ + auVar186._28_4_;
            auVar186 = vrsqrtps_avx(auVar358);
            fVar289 = auVar186._0_4_;
            fVar291 = auVar186._4_4_;
            auVar92._4_4_ = fVar291 * 1.5;
            auVar92._0_4_ = fVar289 * 1.5;
            fVar302 = auVar186._8_4_;
            auVar92._8_4_ = fVar302 * 1.5;
            fVar304 = auVar186._12_4_;
            auVar92._12_4_ = fVar304 * 1.5;
            fVar306 = auVar186._16_4_;
            auVar92._16_4_ = fVar306 * 1.5;
            fVar363 = auVar186._20_4_;
            auVar92._20_4_ = fVar363 * 1.5;
            fVar267 = auVar186._24_4_;
            auVar92._24_4_ = fVar267 * 1.5;
            auVar92._28_4_ = auVar401._28_4_;
            auVar93._4_4_ = fVar291 * fVar291 * fVar291 * auVar358._4_4_ * 0.5;
            auVar93._0_4_ = fVar289 * fVar289 * fVar289 * auVar358._0_4_ * 0.5;
            auVar93._8_4_ = fVar302 * fVar302 * fVar302 * auVar358._8_4_ * 0.5;
            auVar93._12_4_ = fVar304 * fVar304 * fVar304 * auVar358._12_4_ * 0.5;
            auVar93._16_4_ = fVar306 * fVar306 * fVar306 * auVar358._16_4_ * 0.5;
            auVar93._20_4_ = fVar363 * fVar363 * fVar363 * auVar358._20_4_ * 0.5;
            auVar93._24_4_ = fVar267 * fVar267 * fVar267 * auVar358._24_4_ * 0.5;
            auVar93._28_4_ = auVar358._28_4_;
            auVar39 = vsubps_avx(auVar92,auVar93);
            fVar289 = auVar39._0_4_;
            fVar291 = auVar39._4_4_;
            fVar302 = auVar39._8_4_;
            fVar304 = auVar39._12_4_;
            fVar306 = auVar39._16_4_;
            fVar363 = auVar39._20_4_;
            fVar267 = auVar39._24_4_;
            fVar246 = fVar172 * fVar245 * fVar246;
            fVar260 = fVar196 * fVar171 * fVar260;
            auVar94._4_4_ = fVar260;
            auVar94._0_4_ = fVar246;
            fVar243 = fVar200 * fVar309 * fVar243;
            auVar94._8_4_ = fVar243;
            fVar261 = fVar201 * fVar195 * fVar261;
            auVar94._12_4_ = fVar261;
            fVar263 = fVar202 * fVar376 * fVar263;
            auVar94._16_4_ = fVar263;
            fVar266 = fVar203 * fVar198 * fVar266;
            auVar94._20_4_ = fVar266;
            fVar277 = fVar204 * fVar199 * fVar277;
            auVar94._24_4_ = fVar277;
            auVar94._28_4_ = auVar186._28_4_;
            local_820._4_4_ = fVar260 + auVar429._4_4_;
            local_820._0_4_ = fVar246 + auVar429._0_4_;
            uStack_818._0_4_ = fVar243 + auVar429._8_4_;
            uStack_818._4_4_ = fVar261 + auVar429._12_4_;
            uStack_810._0_4_ = fVar263 + auVar429._16_4_;
            uStack_810._4_4_ = fVar266 + auVar429._20_4_;
            uStack_808._0_4_ = fVar277 + auVar429._24_4_;
            uStack_808._4_4_ = auVar186._28_4_ + auVar429._28_4_;
            local_840 = fVar172 * fVar245 * -fVar206;
            fStack_83c = fVar196 * fVar171 * -fVar226;
            auVar95._4_4_ = fStack_83c;
            auVar95._0_4_ = local_840;
            fStack_838 = fVar200 * fVar309 * -fVar310;
            auVar95._8_4_ = fStack_838;
            fStack_834 = fVar201 * fVar195 * -fVar318;
            auVar95._12_4_ = fStack_834;
            fStack_830 = fVar202 * fVar376 * -fVar319;
            auVar95._16_4_ = fStack_830;
            fStack_82c = fVar203 * fVar198 * -fVar320;
            auVar95._20_4_ = fStack_82c;
            fStack_828 = fVar204 * fVar199 * -fVar321;
            auVar95._24_4_ = fStack_828;
            auVar95._28_4_ = -fVar322;
            local_840 = local_8a0._0_4_ + local_840;
            fStack_83c = local_8a0._4_4_ + fStack_83c;
            fStack_838 = local_8a0._8_4_ + fStack_838;
            fStack_834 = local_8a0._12_4_ + fStack_834;
            fStack_830 = local_8a0._16_4_ + fStack_830;
            fStack_82c = local_8a0._20_4_ + fStack_82c;
            fStack_828 = local_8a0._24_4_ + fStack_828;
            fStack_824 = local_8a0._28_4_ + -fVar322;
            fVar246 = fVar245 * 0.0 * fVar172;
            fVar260 = fVar171 * 0.0 * fVar196;
            auVar96._4_4_ = fVar260;
            auVar96._0_4_ = fVar246;
            fVar243 = fVar309 * 0.0 * fVar200;
            auVar96._8_4_ = fVar243;
            fVar261 = fVar195 * 0.0 * fVar201;
            auVar96._12_4_ = fVar261;
            fVar263 = fVar376 * 0.0 * fVar202;
            auVar96._16_4_ = fVar263;
            fVar266 = fVar198 * 0.0 * fVar203;
            auVar96._20_4_ = fVar266;
            fVar277 = fVar199 * 0.0 * fVar204;
            auVar96._24_4_ = fVar277;
            auVar96._28_4_ = fVar322;
            auVar42 = vsubps_avx(auVar429,auVar94);
            auVar430._0_4_ = fVar246 + auVar184._0_4_;
            auVar430._4_4_ = fVar260 + auVar184._4_4_;
            auVar430._8_4_ = fVar243 + auVar184._8_4_;
            auVar430._12_4_ = fVar261 + auVar184._12_4_;
            auVar430._16_4_ = fVar263 + auVar184._16_4_;
            auVar430._20_4_ = fVar266 + auVar184._20_4_;
            auVar430._24_4_ = fVar277 + auVar184._24_4_;
            auVar430._28_4_ = fVar322 + auVar184._28_4_;
            fVar246 = auVar422._0_4_ * fVar289 * fVar244;
            fVar244 = auVar422._4_4_ * fVar291 * fVar262;
            auVar97._4_4_ = fVar244;
            auVar97._0_4_ = fVar246;
            fVar260 = auVar422._8_4_ * fVar302 * fVar265;
            auVar97._8_4_ = fVar260;
            fVar262 = auVar422._12_4_ * fVar304 * fVar307;
            auVar97._12_4_ = fVar262;
            fVar243 = auVar422._16_4_ * fVar306 * fVar264;
            auVar97._16_4_ = fVar243;
            fVar265 = auVar422._20_4_ * fVar363 * fVar268;
            auVar97._20_4_ = fVar265;
            fVar261 = auVar422._24_4_ * fVar267 * fVar281;
            auVar97._24_4_ = fVar261;
            auVar97._28_4_ = fVar205;
            auVar44 = vsubps_avx(local_8a0,auVar95);
            auVar410._0_4_ = auVar316._0_4_ + fVar246;
            auVar410._4_4_ = auVar316._4_4_ + fVar244;
            auVar410._8_4_ = auVar316._8_4_ + fVar260;
            auVar410._12_4_ = auVar316._12_4_ + fVar262;
            auVar410._16_4_ = auVar316._16_4_ + fVar243;
            auVar410._20_4_ = auVar316._20_4_ + fVar265;
            auVar410._24_4_ = auVar316._24_4_ + fVar261;
            auVar410._28_4_ = auVar316._28_4_ + fVar205;
            fVar246 = fVar289 * -fVar285 * auVar422._0_4_;
            fVar244 = fVar291 * -fVar290 * auVar422._4_4_;
            auVar98._4_4_ = fVar244;
            auVar98._0_4_ = fVar246;
            fVar260 = fVar302 * -fVar292 * auVar422._8_4_;
            auVar98._8_4_ = fVar260;
            fVar262 = fVar304 * -fVar303 * auVar422._12_4_;
            auVar98._12_4_ = fVar262;
            fVar243 = fVar306 * -fVar305 * auVar422._16_4_;
            auVar98._16_4_ = fVar243;
            fVar265 = fVar363 * -fVar308 * auVar422._20_4_;
            auVar98._20_4_ = fVar265;
            fVar261 = fVar267 * -fVar364 * auVar422._24_4_;
            auVar98._24_4_ = fVar261;
            auVar98._28_4_ = auVar429._28_4_;
            auVar177 = vsubps_avx(auVar184,auVar96);
            auVar275._0_4_ = auVar300._0_4_ + fVar246;
            auVar275._4_4_ = auVar300._4_4_ + fVar244;
            auVar275._8_4_ = auVar300._8_4_ + fVar260;
            auVar275._12_4_ = auVar300._12_4_ + fVar262;
            auVar275._16_4_ = auVar300._16_4_ + fVar243;
            auVar275._20_4_ = auVar300._20_4_ + fVar265;
            auVar275._24_4_ = auVar300._24_4_ + fVar261;
            auVar275._28_4_ = auVar300._28_4_ + auVar429._28_4_;
            fVar246 = fVar289 * 0.0 * auVar422._0_4_;
            fVar244 = fVar291 * 0.0 * auVar422._4_4_;
            auVar99._4_4_ = fVar244;
            auVar99._0_4_ = fVar246;
            fVar260 = fVar302 * 0.0 * auVar422._8_4_;
            auVar99._8_4_ = fVar260;
            fVar262 = fVar304 * 0.0 * auVar422._12_4_;
            auVar99._12_4_ = fVar262;
            fVar243 = fVar306 * 0.0 * auVar422._16_4_;
            auVar99._16_4_ = fVar243;
            fVar265 = fVar363 * 0.0 * auVar422._20_4_;
            auVar99._20_4_ = fVar265;
            fVar261 = fVar267 * 0.0 * auVar422._24_4_;
            auVar99._24_4_ = fVar261;
            auVar99._28_4_ = auVar184._28_4_;
            auVar186 = vsubps_avx(auVar316,auVar97);
            auVar373._0_4_ = (float)local_880._0_4_ + fVar246;
            auVar373._4_4_ = (float)local_880._4_4_ + fVar244;
            auVar373._8_4_ = (float)uStack_878 + fVar260;
            auVar373._12_4_ = uStack_878._4_4_ + fVar262;
            auVar373._16_4_ = (float)uStack_870 + fVar243;
            auVar373._20_4_ = uStack_870._4_4_ + fVar265;
            auVar373._24_4_ = (float)uStack_868 + fVar261;
            auVar373._28_4_ = uStack_868._4_4_ + auVar184._28_4_;
            auVar40 = vsubps_avx(auVar300,auVar98);
            auVar41 = vsubps_avx(_local_880,auVar99);
            auVar371 = vsubps_avx(auVar275,auVar44);
            auVar357 = vsubps_avx(auVar373,auVar177);
            auVar100._4_4_ = auVar177._4_4_ * auVar371._4_4_;
            auVar100._0_4_ = auVar177._0_4_ * auVar371._0_4_;
            auVar100._8_4_ = auVar177._8_4_ * auVar371._8_4_;
            auVar100._12_4_ = auVar177._12_4_ * auVar371._12_4_;
            auVar100._16_4_ = auVar177._16_4_ * auVar371._16_4_;
            auVar100._20_4_ = auVar177._20_4_ * auVar371._20_4_;
            auVar100._24_4_ = auVar177._24_4_ * auVar371._24_4_;
            auVar100._28_4_ = auVar401._28_4_;
            auVar101._4_4_ = auVar44._4_4_ * auVar357._4_4_;
            auVar101._0_4_ = auVar44._0_4_ * auVar357._0_4_;
            auVar101._8_4_ = auVar44._8_4_ * auVar357._8_4_;
            auVar101._12_4_ = auVar44._12_4_ * auVar357._12_4_;
            auVar101._16_4_ = auVar44._16_4_ * auVar357._16_4_;
            auVar101._20_4_ = auVar44._20_4_ * auVar357._20_4_;
            auVar101._24_4_ = auVar44._24_4_ * auVar357._24_4_;
            auVar101._28_4_ = uStack_868._4_4_;
            auVar431 = vsubps_avx(auVar101,auVar100);
            auVar102._4_4_ = auVar42._4_4_ * auVar357._4_4_;
            auVar102._0_4_ = auVar42._0_4_ * auVar357._0_4_;
            auVar102._8_4_ = auVar42._8_4_ * auVar357._8_4_;
            auVar102._12_4_ = auVar42._12_4_ * auVar357._12_4_;
            auVar102._16_4_ = auVar42._16_4_ * auVar357._16_4_;
            auVar102._20_4_ = auVar42._20_4_ * auVar357._20_4_;
            auVar102._24_4_ = auVar42._24_4_ * auVar357._24_4_;
            auVar102._28_4_ = auVar357._28_4_;
            auVar357 = vsubps_avx(auVar410,auVar42);
            auVar103._4_4_ = auVar177._4_4_ * auVar357._4_4_;
            auVar103._0_4_ = auVar177._0_4_ * auVar357._0_4_;
            auVar103._8_4_ = auVar177._8_4_ * auVar357._8_4_;
            auVar103._12_4_ = auVar177._12_4_ * auVar357._12_4_;
            auVar103._16_4_ = auVar177._16_4_ * auVar357._16_4_;
            auVar103._20_4_ = auVar177._20_4_ * auVar357._20_4_;
            auVar103._24_4_ = auVar177._24_4_ * auVar357._24_4_;
            auVar103._28_4_ = auVar39._28_4_;
            auVar45 = vsubps_avx(auVar103,auVar102);
            auVar104._4_4_ = auVar44._4_4_ * auVar357._4_4_;
            auVar104._0_4_ = auVar44._0_4_ * auVar357._0_4_;
            auVar104._8_4_ = auVar44._8_4_ * auVar357._8_4_;
            auVar104._12_4_ = auVar44._12_4_ * auVar357._12_4_;
            auVar104._16_4_ = auVar44._16_4_ * auVar357._16_4_;
            auVar104._20_4_ = auVar44._20_4_ * auVar357._20_4_;
            auVar104._24_4_ = auVar44._24_4_ * auVar357._24_4_;
            auVar104._28_4_ = auVar39._28_4_;
            auVar105._4_4_ = auVar42._4_4_ * auVar371._4_4_;
            auVar105._0_4_ = auVar42._0_4_ * auVar371._0_4_;
            auVar105._8_4_ = auVar42._8_4_ * auVar371._8_4_;
            auVar105._12_4_ = auVar42._12_4_ * auVar371._12_4_;
            auVar105._16_4_ = auVar42._16_4_ * auVar371._16_4_;
            auVar105._20_4_ = auVar42._20_4_ * auVar371._20_4_;
            auVar105._24_4_ = auVar42._24_4_ * auVar371._24_4_;
            auVar105._28_4_ = auVar371._28_4_;
            auVar39 = vsubps_avx(auVar105,auVar104);
            auVar218._0_4_ = auVar431._0_4_ * 0.0 + auVar39._0_4_ + auVar45._0_4_ * 0.0;
            auVar218._4_4_ = auVar431._4_4_ * 0.0 + auVar39._4_4_ + auVar45._4_4_ * 0.0;
            auVar218._8_4_ = auVar431._8_4_ * 0.0 + auVar39._8_4_ + auVar45._8_4_ * 0.0;
            auVar218._12_4_ = auVar431._12_4_ * 0.0 + auVar39._12_4_ + auVar45._12_4_ * 0.0;
            auVar218._16_4_ = auVar431._16_4_ * 0.0 + auVar39._16_4_ + auVar45._16_4_ * 0.0;
            auVar218._20_4_ = auVar431._20_4_ * 0.0 + auVar39._20_4_ + auVar45._20_4_ * 0.0;
            auVar218._24_4_ = auVar431._24_4_ * 0.0 + auVar39._24_4_ + auVar45._24_4_ * 0.0;
            auVar218._28_4_ = auVar431._28_4_ + auVar39._28_4_ + auVar45._28_4_;
            auVar241 = vcmpps_avx(auVar218,ZEXT832(0) << 0x20,2);
            auVar186 = vblendvps_avx(auVar186,_local_820,auVar241);
            auVar259 = ZEXT3264(auVar186);
            auVar142._4_4_ = fStack_83c;
            auVar142._0_4_ = local_840;
            auVar142._8_4_ = fStack_838;
            auVar142._12_4_ = fStack_834;
            auVar142._16_4_ = fStack_830;
            auVar142._20_4_ = fStack_82c;
            auVar142._24_4_ = fStack_828;
            auVar142._28_4_ = fStack_824;
            auVar39 = vblendvps_avx(auVar40,auVar142,auVar241);
            auVar40 = vblendvps_avx(auVar41,auVar430,auVar241);
            auVar41 = vblendvps_avx(auVar42,auVar410,auVar241);
            auVar371 = vblendvps_avx(auVar44,auVar275,auVar241);
            auVar357 = vblendvps_avx(auVar177,auVar373,auVar241);
            auVar42 = vblendvps_avx(auVar410,auVar42,auVar241);
            auVar431 = vblendvps_avx(auVar275,auVar44,auVar241);
            auVar45 = vblendvps_avx(auVar373,auVar177,auVar241);
            local_8a0 = vandps_avx(auVar176,auVar240);
            auVar42 = vsubps_avx(auVar42,auVar186);
            auVar178 = vsubps_avx(auVar431,auVar39);
            auVar45 = vsubps_avx(auVar45,auVar40);
            auVar211 = vsubps_avx(auVar39,auVar371);
            fVar246 = auVar178._0_4_;
            fVar327 = auVar40._0_4_;
            fVar307 = auVar178._4_4_;
            fVar338 = auVar40._4_4_;
            auVar106._4_4_ = fVar338 * fVar307;
            auVar106._0_4_ = fVar327 * fVar246;
            fVar285 = auVar178._8_4_;
            fVar340 = auVar40._8_4_;
            auVar106._8_4_ = fVar340 * fVar285;
            fVar304 = auVar178._12_4_;
            fVar342 = auVar40._12_4_;
            auVar106._12_4_ = fVar342 * fVar304;
            fVar245 = auVar178._16_4_;
            fVar343 = auVar40._16_4_;
            auVar106._16_4_ = fVar343 * fVar245;
            fVar206 = auVar178._20_4_;
            fVar344 = auVar40._20_4_;
            auVar106._20_4_ = fVar344 * fVar206;
            fVar322 = auVar178._24_4_;
            fVar345 = auVar40._24_4_;
            auVar106._24_4_ = fVar345 * fVar322;
            auVar106._28_4_ = auVar431._28_4_;
            fVar244 = auVar39._0_4_;
            fVar278 = auVar45._0_4_;
            fVar263 = auVar39._4_4_;
            fVar279 = auVar45._4_4_;
            auVar107._4_4_ = fVar279 * fVar263;
            auVar107._0_4_ = fVar278 * fVar244;
            fVar289 = auVar39._8_4_;
            fVar282 = auVar45._8_4_;
            auVar107._8_4_ = fVar282 * fVar289;
            fVar305 = auVar39._12_4_;
            fVar283 = auVar45._12_4_;
            auVar107._12_4_ = fVar283 * fVar305;
            fVar171 = auVar39._16_4_;
            fVar286 = auVar45._16_4_;
            auVar107._16_4_ = fVar286 * fVar171;
            fVar226 = auVar39._20_4_;
            fVar287 = auVar45._20_4_;
            auVar107._20_4_ = fVar287 * fVar226;
            fVar323 = auVar39._24_4_;
            fVar269 = auVar45._24_4_;
            uVar11 = auVar44._28_4_;
            auVar107._24_4_ = fVar269 * fVar323;
            auVar107._28_4_ = uVar11;
            auVar431 = vsubps_avx(auVar107,auVar106);
            fVar260 = auVar186._0_4_;
            fVar264 = auVar186._4_4_;
            auVar108._4_4_ = fVar279 * fVar264;
            auVar108._0_4_ = fVar278 * fVar260;
            fVar290 = auVar186._8_4_;
            auVar108._8_4_ = fVar282 * fVar290;
            fVar306 = auVar186._12_4_;
            auVar108._12_4_ = fVar283 * fVar306;
            fVar309 = auVar186._16_4_;
            auVar108._16_4_ = fVar286 * fVar309;
            fVar310 = auVar186._20_4_;
            auVar108._20_4_ = fVar287 * fVar310;
            fVar324 = auVar186._24_4_;
            auVar108._24_4_ = fVar269 * fVar324;
            auVar108._28_4_ = uVar11;
            fVar262 = auVar42._0_4_;
            fVar266 = auVar42._4_4_;
            auVar109._4_4_ = fVar338 * fVar266;
            auVar109._0_4_ = fVar327 * fVar262;
            fVar291 = auVar42._8_4_;
            auVar109._8_4_ = fVar340 * fVar291;
            fVar308 = auVar42._12_4_;
            auVar109._12_4_ = fVar342 * fVar308;
            fVar195 = auVar42._16_4_;
            auVar109._16_4_ = fVar343 * fVar195;
            fVar318 = auVar42._20_4_;
            auVar109._20_4_ = fVar344 * fVar318;
            fVar375 = auVar42._24_4_;
            auVar109._24_4_ = fVar345 * fVar375;
            auVar109._28_4_ = auVar410._28_4_;
            auVar44 = vsubps_avx(auVar109,auVar108);
            auVar110._4_4_ = fVar263 * fVar266;
            auVar110._0_4_ = fVar244 * fVar262;
            auVar110._8_4_ = fVar289 * fVar291;
            auVar110._12_4_ = fVar305 * fVar308;
            auVar110._16_4_ = fVar171 * fVar195;
            auVar110._20_4_ = fVar226 * fVar318;
            auVar110._24_4_ = fVar323 * fVar375;
            auVar110._28_4_ = uVar11;
            auVar111._4_4_ = fVar264 * fVar307;
            auVar111._0_4_ = fVar260 * fVar246;
            auVar111._8_4_ = fVar290 * fVar285;
            auVar111._12_4_ = fVar306 * fVar304;
            auVar111._16_4_ = fVar309 * fVar245;
            auVar111._20_4_ = fVar310 * fVar206;
            auVar111._24_4_ = fVar324 * fVar322;
            auVar111._28_4_ = auVar177._28_4_;
            auVar177 = vsubps_avx(auVar111,auVar110);
            auVar212 = vsubps_avx(auVar40,auVar357);
            fVar265 = auVar177._28_4_ + auVar44._28_4_;
            auVar383._0_4_ = auVar177._0_4_ + auVar44._0_4_ * 0.0 + auVar431._0_4_ * 0.0;
            auVar383._4_4_ = auVar177._4_4_ + auVar44._4_4_ * 0.0 + auVar431._4_4_ * 0.0;
            auVar383._8_4_ = auVar177._8_4_ + auVar44._8_4_ * 0.0 + auVar431._8_4_ * 0.0;
            auVar383._12_4_ = auVar177._12_4_ + auVar44._12_4_ * 0.0 + auVar431._12_4_ * 0.0;
            auVar383._16_4_ = auVar177._16_4_ + auVar44._16_4_ * 0.0 + auVar431._16_4_ * 0.0;
            auVar383._20_4_ = auVar177._20_4_ + auVar44._20_4_ * 0.0 + auVar431._20_4_ * 0.0;
            auVar383._24_4_ = auVar177._24_4_ + auVar44._24_4_ * 0.0 + auVar431._24_4_ * 0.0;
            auVar383._28_4_ = fVar265 + auVar431._28_4_;
            fVar243 = auVar211._0_4_;
            fVar268 = auVar211._4_4_;
            auVar112._4_4_ = auVar357._4_4_ * fVar268;
            auVar112._0_4_ = auVar357._0_4_ * fVar243;
            fVar292 = auVar211._8_4_;
            auVar112._8_4_ = auVar357._8_4_ * fVar292;
            fVar363 = auVar211._12_4_;
            auVar112._12_4_ = auVar357._12_4_ * fVar363;
            fVar376 = auVar211._16_4_;
            auVar112._16_4_ = auVar357._16_4_ * fVar376;
            fVar319 = auVar211._20_4_;
            auVar112._20_4_ = auVar357._20_4_ * fVar319;
            fVar170 = auVar211._24_4_;
            auVar112._24_4_ = auVar357._24_4_ * fVar170;
            auVar112._28_4_ = fVar265;
            fVar265 = auVar212._0_4_;
            fVar277 = auVar212._4_4_;
            auVar113._4_4_ = auVar371._4_4_ * fVar277;
            auVar113._0_4_ = auVar371._0_4_ * fVar265;
            fVar302 = auVar212._8_4_;
            auVar113._8_4_ = auVar371._8_4_ * fVar302;
            fVar364 = auVar212._12_4_;
            auVar113._12_4_ = auVar371._12_4_ * fVar364;
            fVar198 = auVar212._16_4_;
            auVar113._16_4_ = auVar371._16_4_ * fVar198;
            fVar320 = auVar212._20_4_;
            auVar113._20_4_ = auVar371._20_4_ * fVar320;
            fVar194 = auVar212._24_4_;
            auVar113._24_4_ = auVar371._24_4_ * fVar194;
            auVar113._28_4_ = auVar177._28_4_;
            auVar44 = vsubps_avx(auVar113,auVar112);
            auVar177 = vsubps_avx(auVar186,auVar41);
            fVar261 = auVar177._0_4_;
            fVar281 = auVar177._4_4_;
            auVar114._4_4_ = auVar357._4_4_ * fVar281;
            auVar114._0_4_ = auVar357._0_4_ * fVar261;
            fVar303 = auVar177._8_4_;
            auVar114._8_4_ = auVar357._8_4_ * fVar303;
            fVar267 = auVar177._12_4_;
            auVar114._12_4_ = auVar357._12_4_ * fVar267;
            fVar199 = auVar177._16_4_;
            auVar114._16_4_ = auVar357._16_4_ * fVar199;
            fVar321 = auVar177._20_4_;
            auVar114._20_4_ = auVar357._20_4_ * fVar321;
            fVar197 = auVar177._24_4_;
            auVar114._24_4_ = auVar357._24_4_ * fVar197;
            auVar114._28_4_ = auVar357._28_4_;
            auVar115._4_4_ = fVar277 * auVar41._4_4_;
            auVar115._0_4_ = fVar265 * auVar41._0_4_;
            auVar115._8_4_ = fVar302 * auVar41._8_4_;
            auVar115._12_4_ = fVar364 * auVar41._12_4_;
            auVar115._16_4_ = fVar198 * auVar41._16_4_;
            auVar115._20_4_ = fVar320 * auVar41._20_4_;
            auVar115._24_4_ = fVar194 * auVar41._24_4_;
            auVar115._28_4_ = auVar431._28_4_;
            auVar357 = vsubps_avx(auVar114,auVar115);
            auVar432 = ZEXT1264(ZEXT412(0)) << 0x20;
            auVar116._4_4_ = auVar371._4_4_ * fVar281;
            auVar116._0_4_ = auVar371._0_4_ * fVar261;
            auVar116._8_4_ = auVar371._8_4_ * fVar303;
            auVar116._12_4_ = auVar371._12_4_ * fVar267;
            auVar116._16_4_ = auVar371._16_4_ * fVar199;
            auVar116._20_4_ = auVar371._20_4_ * fVar321;
            auVar116._24_4_ = auVar371._24_4_ * fVar197;
            auVar116._28_4_ = auVar371._28_4_;
            auVar117._4_4_ = fVar268 * auVar41._4_4_;
            auVar117._0_4_ = fVar243 * auVar41._0_4_;
            auVar117._8_4_ = fVar292 * auVar41._8_4_;
            auVar117._12_4_ = fVar363 * auVar41._12_4_;
            auVar117._16_4_ = fVar376 * auVar41._16_4_;
            auVar117._20_4_ = fVar319 * auVar41._20_4_;
            auVar117._24_4_ = fVar170 * auVar41._24_4_;
            auVar117._28_4_ = auVar41._28_4_;
            auVar41 = vsubps_avx(auVar117,auVar116);
            auVar431 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar185._0_4_ = auVar44._0_4_ * 0.0 + auVar41._0_4_ + auVar357._0_4_ * 0.0;
            auVar185._4_4_ = auVar44._4_4_ * 0.0 + auVar41._4_4_ + auVar357._4_4_ * 0.0;
            auVar185._8_4_ = auVar44._8_4_ * 0.0 + auVar41._8_4_ + auVar357._8_4_ * 0.0;
            auVar185._12_4_ = auVar44._12_4_ * 0.0 + auVar41._12_4_ + auVar357._12_4_ * 0.0;
            auVar185._16_4_ = auVar44._16_4_ * 0.0 + auVar41._16_4_ + auVar357._16_4_ * 0.0;
            auVar185._20_4_ = auVar44._20_4_ * 0.0 + auVar41._20_4_ + auVar357._20_4_ * 0.0;
            auVar185._24_4_ = auVar44._24_4_ * 0.0 + auVar41._24_4_ + auVar357._24_4_ * 0.0;
            auVar185._28_4_ = auVar357._28_4_ + auVar41._28_4_ + auVar357._28_4_;
            auVar193 = ZEXT3264(auVar185);
            auVar41 = vmaxps_avx(auVar383,auVar185);
            auVar41 = vcmpps_avx(auVar41,auVar431,2);
            auVar371 = local_8a0 & auVar41;
            auVar125 = auVar40;
            if ((((((((auVar371 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar371 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar371 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar371 >> 0x7f,0) == '\0') &&
                  (auVar371 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar371 >> 0xbf,0) == '\0') &&
                (auVar371 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar371[0x1f]) {
LAB_01263553:
              auVar335 = ZEXT3264(auVar125);
              auVar220._8_8_ = uStack_678;
              auVar220._0_8_ = local_680;
              auVar220._16_8_ = uStack_670;
              auVar220._24_8_ = uStack_668;
              auVar374 = ZEXT3264(local_600);
              auVar384._4_4_ = fVar196;
              auVar384._0_4_ = fVar172;
              auVar384._8_4_ = fVar200;
              auVar384._12_4_ = fVar201;
              auVar384._16_4_ = fVar202;
              auVar384._20_4_ = fVar203;
              auVar384._24_4_ = fVar204;
              auVar384._28_4_ = fVar205;
            }
            else {
              auVar371 = vandps_avx(auVar41,local_8a0);
              auVar118._4_4_ = fVar277 * fVar307;
              auVar118._0_4_ = fVar265 * fVar246;
              auVar118._8_4_ = fVar302 * fVar285;
              auVar118._12_4_ = fVar364 * fVar304;
              auVar118._16_4_ = fVar198 * fVar245;
              auVar118._20_4_ = fVar320 * fVar206;
              auVar118._24_4_ = fVar194 * fVar322;
              auVar118._28_4_ = local_8a0._28_4_;
              auVar119._4_4_ = fVar268 * fVar279;
              auVar119._0_4_ = fVar243 * fVar278;
              auVar119._8_4_ = fVar292 * fVar282;
              auVar119._12_4_ = fVar363 * fVar283;
              auVar119._16_4_ = fVar376 * fVar286;
              auVar119._20_4_ = fVar319 * fVar287;
              auVar119._24_4_ = fVar170 * fVar269;
              auVar119._28_4_ = auVar41._28_4_;
              auVar357 = vsubps_avx(auVar119,auVar118);
              auVar120._4_4_ = fVar281 * fVar279;
              auVar120._0_4_ = fVar261 * fVar278;
              auVar120._8_4_ = fVar303 * fVar282;
              auVar120._12_4_ = fVar267 * fVar283;
              auVar120._16_4_ = fVar199 * fVar286;
              auVar120._20_4_ = fVar321 * fVar287;
              auVar120._24_4_ = fVar197 * fVar269;
              auVar120._28_4_ = auVar45._28_4_;
              auVar121._4_4_ = fVar277 * fVar266;
              auVar121._0_4_ = fVar265 * fVar262;
              auVar121._8_4_ = fVar302 * fVar291;
              auVar121._12_4_ = fVar364 * fVar308;
              auVar121._16_4_ = fVar198 * fVar195;
              auVar121._20_4_ = fVar320 * fVar318;
              auVar121._24_4_ = fVar194 * fVar375;
              auVar121._28_4_ = auVar212._28_4_;
              auVar45 = vsubps_avx(auVar121,auVar120);
              auVar122._4_4_ = fVar268 * fVar266;
              auVar122._0_4_ = fVar243 * fVar262;
              auVar122._8_4_ = fVar292 * fVar291;
              auVar122._12_4_ = fVar363 * fVar308;
              auVar122._16_4_ = fVar376 * fVar195;
              auVar122._20_4_ = fVar319 * fVar318;
              auVar122._24_4_ = fVar170 * fVar375;
              auVar122._28_4_ = auVar42._28_4_;
              auVar123._4_4_ = fVar281 * fVar307;
              auVar123._0_4_ = fVar261 * fVar246;
              auVar123._8_4_ = fVar303 * fVar285;
              auVar123._12_4_ = fVar267 * fVar304;
              auVar123._16_4_ = fVar199 * fVar245;
              auVar123._20_4_ = fVar321 * fVar206;
              auVar123._24_4_ = fVar197 * fVar322;
              auVar123._28_4_ = auVar178._28_4_;
              auVar44 = vsubps_avx(auVar123,auVar122);
              auVar219._0_4_ = auVar357._0_4_ * 0.0 + auVar44._0_4_ + auVar45._0_4_ * 0.0;
              auVar219._4_4_ = auVar357._4_4_ * 0.0 + auVar44._4_4_ + auVar45._4_4_ * 0.0;
              auVar219._8_4_ = auVar357._8_4_ * 0.0 + auVar44._8_4_ + auVar45._8_4_ * 0.0;
              auVar219._12_4_ = auVar357._12_4_ * 0.0 + auVar44._12_4_ + auVar45._12_4_ * 0.0;
              auVar219._16_4_ = auVar357._16_4_ * 0.0 + auVar44._16_4_ + auVar45._16_4_ * 0.0;
              auVar219._20_4_ = auVar357._20_4_ * 0.0 + auVar44._20_4_ + auVar45._20_4_ * 0.0;
              auVar219._24_4_ = auVar357._24_4_ * 0.0 + auVar44._24_4_ + auVar45._24_4_ * 0.0;
              auVar219._28_4_ = auVar178._28_4_ + auVar44._28_4_ + auVar42._28_4_;
              auVar41 = vrcpps_avx(auVar219);
              fVar246 = auVar41._0_4_;
              fVar262 = auVar41._4_4_;
              auVar124._4_4_ = auVar219._4_4_ * fVar262;
              auVar124._0_4_ = auVar219._0_4_ * fVar246;
              fVar243 = auVar41._8_4_;
              auVar124._8_4_ = auVar219._8_4_ * fVar243;
              fVar265 = auVar41._12_4_;
              auVar124._12_4_ = auVar219._12_4_ * fVar265;
              fVar261 = auVar41._16_4_;
              auVar124._16_4_ = auVar219._16_4_ * fVar261;
              fVar307 = auVar41._20_4_;
              auVar124._20_4_ = auVar219._20_4_ * fVar307;
              fVar266 = auVar41._24_4_;
              auVar124._24_4_ = auVar219._24_4_ * fVar266;
              auVar124._28_4_ = auVar212._28_4_;
              auVar402._8_4_ = 0x3f800000;
              auVar402._0_8_ = &DAT_3f8000003f800000;
              auVar402._12_4_ = 0x3f800000;
              auVar402._16_4_ = 0x3f800000;
              auVar402._20_4_ = 0x3f800000;
              auVar402._24_4_ = 0x3f800000;
              auVar402._28_4_ = 0x3f800000;
              auVar41 = vsubps_avx(auVar402,auVar124);
              fVar246 = auVar41._0_4_ * fVar246 + fVar246;
              fVar262 = auVar41._4_4_ * fVar262 + fVar262;
              fVar243 = auVar41._8_4_ * fVar243 + fVar243;
              fVar265 = auVar41._12_4_ * fVar265 + fVar265;
              fVar261 = auVar41._16_4_ * fVar261 + fVar261;
              fVar307 = auVar41._20_4_ * fVar307 + fVar307;
              fVar266 = auVar41._24_4_ * fVar266 + fVar266;
              fVar327 = auVar44._0_4_ * fVar327;
              fVar338 = auVar44._4_4_ * fVar338;
              auVar125._4_4_ = fVar338;
              auVar125._0_4_ = fVar327;
              fVar340 = auVar44._8_4_ * fVar340;
              auVar125._8_4_ = fVar340;
              fVar342 = auVar44._12_4_ * fVar342;
              auVar125._12_4_ = fVar342;
              fVar343 = auVar44._16_4_ * fVar343;
              auVar125._16_4_ = fVar343;
              fVar344 = auVar44._20_4_ * fVar344;
              auVar125._20_4_ = fVar344;
              fVar345 = auVar44._24_4_ * fVar345;
              auVar125._24_4_ = fVar345;
              auVar125._28_4_ = auVar40._28_4_;
              auVar126._4_4_ =
                   (fVar264 * auVar357._4_4_ + auVar45._4_4_ * fVar263 + fVar338) * fVar262;
              auVar126._0_4_ =
                   (fVar260 * auVar357._0_4_ + auVar45._0_4_ * fVar244 + fVar327) * fVar246;
              auVar126._8_4_ =
                   (fVar290 * auVar357._8_4_ + auVar45._8_4_ * fVar289 + fVar340) * fVar243;
              auVar126._12_4_ =
                   (fVar306 * auVar357._12_4_ + auVar45._12_4_ * fVar305 + fVar342) * fVar265;
              auVar126._16_4_ =
                   (fVar309 * auVar357._16_4_ + auVar45._16_4_ * fVar171 + fVar343) * fVar261;
              auVar126._20_4_ =
                   (fVar310 * auVar357._20_4_ + auVar45._20_4_ * fVar226 + fVar344) * fVar307;
              auVar126._24_4_ =
                   (fVar324 * auVar357._24_4_ + auVar45._24_4_ * fVar323 + fVar345) * fVar266;
              auVar126._28_4_ = auVar186._28_4_ + auVar39._28_4_ + auVar40._28_4_;
              auVar259 = ZEXT3264(auVar126);
              uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar276._4_4_ = uVar11;
              auVar276._0_4_ = uVar11;
              auVar276._8_4_ = uVar11;
              auVar276._12_4_ = uVar11;
              auVar276._16_4_ = uVar11;
              auVar276._20_4_ = uVar11;
              auVar276._24_4_ = uVar11;
              auVar276._28_4_ = uVar11;
              auVar186 = vcmpps_avx(local_120,auVar126,2);
              auVar39 = vcmpps_avx(auVar126,auVar276,2);
              auVar186 = vandps_avx(auVar186,auVar39);
              auVar39 = auVar371 & auVar186;
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar39 >> 0x7f,0) == '\0') &&
                    (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar39 >> 0xbf,0) == '\0') &&
                  (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar39[0x1f]) goto LAB_01263553;
              auVar186 = vandps_avx(auVar371,auVar186);
              auVar39 = vcmpps_avx(auVar431,auVar219,4);
              auVar335 = ZEXT3264(auVar39);
              auVar40 = auVar186 & auVar39;
              auVar220._8_8_ = uStack_678;
              auVar220._0_8_ = local_680;
              auVar220._16_8_ = uStack_670;
              auVar220._24_8_ = uStack_668;
              auVar374 = ZEXT3264(local_600);
              auVar384._4_4_ = fVar196;
              auVar384._0_4_ = fVar172;
              auVar384._8_4_ = fVar200;
              auVar384._12_4_ = fVar201;
              auVar384._16_4_ = fVar202;
              auVar384._20_4_ = fVar203;
              auVar384._24_4_ = fVar204;
              auVar384._28_4_ = fVar205;
              if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar40 >> 0x7f,0) != '\0') ||
                    (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar40 >> 0xbf,0) != '\0') ||
                  (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar40[0x1f] < '\0') {
                auVar220 = vandps_avx(auVar39,auVar186);
                auVar127._4_4_ = auVar383._4_4_ * fVar262;
                auVar127._0_4_ = auVar383._0_4_ * fVar246;
                auVar127._8_4_ = auVar383._8_4_ * fVar243;
                auVar127._12_4_ = auVar383._12_4_ * fVar265;
                auVar127._16_4_ = auVar383._16_4_ * fVar261;
                auVar127._20_4_ = auVar383._20_4_ * fVar307;
                auVar127._24_4_ = auVar383._24_4_ * fVar266;
                auVar127._28_4_ = local_620._28_4_;
                auVar128._4_4_ = auVar185._4_4_ * fVar262;
                auVar128._0_4_ = auVar185._0_4_ * fVar246;
                auVar128._8_4_ = auVar185._8_4_ * fVar243;
                auVar128._12_4_ = auVar185._12_4_ * fVar265;
                auVar128._16_4_ = auVar185._16_4_ * fVar261;
                auVar128._20_4_ = auVar185._20_4_ * fVar307;
                auVar128._24_4_ = auVar185._24_4_ * fVar266;
                auVar128._28_4_ = auVar185._28_4_;
                auVar193 = ZEXT3264(auVar128);
                auVar317._8_4_ = 0x3f800000;
                auVar317._0_8_ = &DAT_3f8000003f800000;
                auVar317._12_4_ = 0x3f800000;
                auVar317._16_4_ = 0x3f800000;
                auVar317._20_4_ = 0x3f800000;
                auVar317._24_4_ = 0x3f800000;
                auVar317._28_4_ = 0x3f800000;
                auVar186 = vsubps_avx(auVar317,auVar127);
                local_380 = vblendvps_avx(auVar186,auVar127,auVar241);
                auVar186 = vsubps_avx(auVar317,auVar128);
                local_620 = vblendvps_avx(auVar186,auVar128,auVar241);
                auVar374 = ZEXT3264(auVar126);
              }
            }
            local_600 = auVar374._0_32_;
            local_560 = auVar240;
            if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar220 >> 0x7f,0) != '\0') ||
                  (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar220 >> 0xbf,0) != '\0') ||
                (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar220[0x1f] < '\0') {
              auVar186 = vsubps_avx(auVar422,auVar384);
              fVar244 = auVar384._0_4_ + local_380._0_4_ * auVar186._0_4_;
              fVar260 = auVar384._4_4_ + local_380._4_4_ * auVar186._4_4_;
              fVar262 = auVar384._8_4_ + local_380._8_4_ * auVar186._8_4_;
              fVar243 = auVar384._12_4_ + local_380._12_4_ * auVar186._12_4_;
              fVar265 = auVar384._16_4_ + local_380._16_4_ * auVar186._16_4_;
              fVar261 = auVar384._20_4_ + local_380._20_4_ * auVar186._20_4_;
              fVar307 = auVar384._24_4_ + local_380._24_4_ * auVar186._24_4_;
              fVar263 = auVar384._28_4_ + auVar186._28_4_;
              fVar246 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar241._4_4_ = fVar246;
              auVar241._0_4_ = fVar246;
              auVar241._8_4_ = fVar246;
              auVar241._12_4_ = fVar246;
              auVar241._16_4_ = fVar246;
              auVar241._20_4_ = fVar246;
              auVar241._24_4_ = fVar246;
              auVar241._28_4_ = fVar246;
              auVar129._4_4_ = (fVar260 + fVar260) * fVar246;
              auVar129._0_4_ = (fVar244 + fVar244) * fVar246;
              auVar129._8_4_ = (fVar262 + fVar262) * fVar246;
              auVar129._12_4_ = (fVar243 + fVar243) * fVar246;
              auVar129._16_4_ = (fVar265 + fVar265) * fVar246;
              auVar129._20_4_ = (fVar261 + fVar261) * fVar246;
              auVar129._24_4_ = (fVar307 + fVar307) * fVar246;
              auVar129._28_4_ = fVar263 + fVar263;
              auVar186 = vcmpps_avx(local_600,auVar129,6);
              auVar193 = ZEXT3264(auVar186);
              auVar39 = auVar220 & auVar186;
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                local_400 = vandps_avx(auVar186,auVar220);
                auVar193 = ZEXT3264(local_400);
                fVar246 = local_620._4_4_;
                fVar244 = local_620._8_4_;
                fVar260 = local_620._12_4_;
                fVar262 = local_620._16_4_;
                fVar243 = local_620._20_4_;
                fVar265 = local_620._24_4_;
                fVar261 = local_620._28_4_;
                auVar242 = ZEXT3264(CONCAT428(0xbf800000,
                                              CONCAT424(0xbf800000,
                                                        CONCAT420(0xbf800000,
                                                                  CONCAT416(0xbf800000,
                                                                            CONCAT412(0xbf800000,
                                                                                      CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
                local_620._0_4_ = local_620._0_4_ + local_620._0_4_ + -1.0;
                local_620._4_4_ = fVar246 + fVar246 + -1.0;
                local_620._8_4_ = fVar244 + fVar244 + -1.0;
                local_620._12_4_ = fVar260 + fVar260 + -1.0;
                local_620._16_4_ = fVar262 + fVar262 + -1.0;
                local_620._20_4_ = fVar243 + fVar243 + -1.0;
                local_620._24_4_ = fVar265 + fVar265 + -1.0;
                local_620._28_4_ = fVar261 + fVar261 + -1.0;
                auVar335 = ZEXT3264(local_620);
                uStack_448 = uStack_908;
                local_440 = local_790;
                uStack_438 = uStack_788;
                local_430 = local_720;
                uStack_428 = uStack_718;
                local_420 = local_710;
                uStack_418 = uStack_708;
                pGVar168 = (context->scene->geometries).items[uVar32].ptr;
                if ((pGVar168->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar230._0_4_ = (float)(int)local_460;
                  auVar230._4_8_ = SUB128(ZEXT812(0),4);
                  auVar230._12_4_ = 0;
                  auVar174 = vshufps_avx(auVar230,auVar230,0);
                  local_3e0[0] = (auVar174._0_4_ + local_380._0_4_ + 0.0) * (float)local_140._0_4_;
                  local_3e0[1] = (auVar174._4_4_ + local_380._4_4_ + 1.0) * (float)local_140._4_4_;
                  local_3e0[2] = (auVar174._8_4_ + local_380._8_4_ + 2.0) * fStack_138;
                  local_3e0[3] = (auVar174._12_4_ + local_380._12_4_ + 3.0) * fStack_134;
                  fStack_3d0 = (auVar174._0_4_ + local_380._16_4_ + 4.0) * fStack_130;
                  fStack_3cc = (auVar174._4_4_ + local_380._20_4_ + 5.0) * fStack_12c;
                  fStack_3c8 = (auVar174._8_4_ + local_380._24_4_ + 6.0) * fStack_128;
                  fStack_3c4 = auVar174._12_4_ + local_380._28_4_ + 7.0;
                  local_3c0 = local_620;
                  local_3a0 = local_600;
                  auVar221._8_4_ = 0x7f800000;
                  auVar221._0_8_ = 0x7f8000007f800000;
                  auVar221._12_4_ = 0x7f800000;
                  auVar221._16_4_ = 0x7f800000;
                  auVar221._20_4_ = 0x7f800000;
                  auVar221._24_4_ = 0x7f800000;
                  auVar221._28_4_ = 0x7f800000;
                  auVar186 = vblendvps_avx(auVar221,local_600,local_400);
                  auVar39 = vshufps_avx(auVar186,auVar186,0xb1);
                  auVar39 = vminps_avx(auVar186,auVar39);
                  auVar40 = vshufpd_avx(auVar39,auVar39,5);
                  auVar39 = vminps_avx(auVar39,auVar40);
                  auVar40 = vperm2f128_avx(auVar39,auVar39,1);
                  auVar39 = vminps_avx(auVar39,auVar40);
                  auVar39 = vcmpps_avx(auVar186,auVar39,0);
                  auVar40 = local_400 & auVar39;
                  auVar186 = local_400;
                  if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar40 >> 0x7f,0) != '\0') ||
                        (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar40 >> 0xbf,0) != '\0') ||
                      (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar40[0x1f] < '\0') {
                    auVar186 = vandps_avx(auVar39,local_400);
                  }
                  uVar161 = vmovmskps_avx(auVar186);
                  uVar165 = 0;
                  if (uVar161 != 0) {
                    for (; (uVar161 >> uVar165 & 1) == 0; uVar165 = uVar165 + 1) {
                    }
                  }
                  uVar162 = (ulong)uVar165;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar168->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar246 = local_3e0[uVar162];
                    auVar193 = ZEXT464((uint)fVar246);
                    uVar11 = *(undefined4 *)(local_3c0 + uVar162 * 4);
                    fVar260 = 1.0 - fVar246;
                    fVar244 = fVar246 * fVar260 + fVar246 * fVar260;
                    auVar174 = ZEXT416((uint)(fVar246 * fVar246 * 3.0));
                    auVar174 = vshufps_avx(auVar174,auVar174,0);
                    auVar231 = ZEXT416((uint)((fVar244 - fVar246 * fVar246) * 3.0));
                    auVar231 = vshufps_avx(auVar231,auVar231,0);
                    auVar249 = ZEXT416((uint)((fVar260 * fVar260 - fVar244) * 3.0));
                    auVar249 = vshufps_avx(auVar249,auVar249,0);
                    auVar233 = ZEXT416((uint)(fVar260 * fVar260 * -3.0));
                    auVar233 = vshufps_avx(auVar233,auVar233,0);
                    auVar232._0_4_ =
                         auVar233._0_4_ * fVar346 +
                         auVar249._0_4_ * (float)local_790._0_4_ +
                         auVar174._0_4_ * (float)local_710._0_4_ +
                         auVar231._0_4_ * (float)local_720._0_4_;
                    auVar232._4_4_ =
                         auVar233._4_4_ * fVar359 +
                         auVar249._4_4_ * (float)local_790._4_4_ +
                         auVar174._4_4_ * (float)local_710._4_4_ +
                         auVar231._4_4_ * (float)local_720._4_4_;
                    auVar232._8_4_ =
                         auVar233._8_4_ * auVar348._8_4_ +
                         auVar249._8_4_ * (float)uStack_788 +
                         auVar174._8_4_ * (float)uStack_708 + auVar231._8_4_ * (float)uStack_718;
                    auVar232._12_4_ =
                         auVar233._12_4_ * auVar348._12_4_ +
                         auVar249._12_4_ * uStack_788._4_4_ +
                         auVar174._12_4_ * uStack_708._4_4_ + auVar231._12_4_ * uStack_718._4_4_;
                    auVar242 = ZEXT1664(auVar232);
                    auVar259 = ZEXT464(*(uint *)(local_3a0 + uVar162 * 4));
                    *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3a0 + uVar162 * 4);
                    *(float *)(ray + k * 4 + 0x180) = auVar232._0_4_;
                    uVar35 = vextractps_avx(auVar232,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar35;
                    uVar35 = vextractps_avx(auVar232,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar35;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar246;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar11;
                    *(uint *)(ray + k * 4 + 0x220) = uVar33;
                    *(uint *)(ray + k * 4 + 0x240) = uVar32;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    auStack_8b0 = auVar429._16_16_;
                    _local_8c0 = _local_790;
                    auStack_7f0 = auVar316._16_16_;
                    _local_800 = _local_720;
                    auStack_730 = auVar300._16_16_;
                    _local_740 = _local_710;
                    uStack_810 = *local_778;
                    _local_820 = *local_770;
                    uStack_808 = local_778[1];
                    _auStack_758 = auVar176._8_24_;
                    local_760 = pGVar168;
                    local_6c0 = local_400;
                    local_4c0 = local_380;
                    _local_4a0 = local_620;
                    local_480 = local_600;
                    local_45c = uVar34;
                    local_450 = auVar348._0_8_;
                    do {
                      uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_240 = local_3e0[uVar162];
                      local_220 = *(undefined4 *)(local_3c0 + uVar162 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_3a0 + uVar162 * 4);
                      fVar244 = 1.0 - local_240;
                      fVar246 = local_240 * fVar244 + local_240 * fVar244;
                      auVar174 = ZEXT416((uint)(local_240 * local_240 * 3.0));
                      auVar174 = vshufps_avx(auVar174,auVar174,0);
                      auVar231 = ZEXT416((uint)((fVar246 - local_240 * local_240) * 3.0));
                      auVar231 = vshufps_avx(auVar231,auVar231,0);
                      auVar249 = ZEXT416((uint)((fVar244 * fVar244 - fVar246) * 3.0));
                      auVar249 = vshufps_avx(auVar249,auVar249,0);
                      local_8f0.context = context->user;
                      auVar233 = ZEXT416((uint)(fVar244 * fVar244 * -3.0));
                      auVar233 = vshufps_avx(auVar233,auVar233,0);
                      auVar234._0_4_ =
                           auVar233._0_4_ * fVar346 +
                           auVar249._0_4_ * (float)local_8c0._0_4_ +
                           auVar174._0_4_ * (float)local_740._0_4_ +
                           auVar231._0_4_ * (float)local_800._0_4_;
                      auVar234._4_4_ =
                           auVar233._4_4_ * fVar359 +
                           auVar249._4_4_ * (float)local_8c0._4_4_ +
                           auVar174._4_4_ * (float)local_740._4_4_ +
                           auVar231._4_4_ * (float)local_800._4_4_;
                      auVar234._8_4_ =
                           auVar233._8_4_ * auVar348._8_4_ +
                           auVar249._8_4_ * fStack_8b8 +
                           auVar174._8_4_ * (float)uStack_738 + auVar231._8_4_ * fStack_7f8;
                      auVar234._12_4_ =
                           auVar233._12_4_ * auVar348._12_4_ +
                           auVar249._12_4_ * fStack_8b4 +
                           auVar174._12_4_ * uStack_738._4_4_ + auVar231._12_4_ * fStack_7f4;
                      auStack_290 = vshufps_avx(auVar234,auVar234,0);
                      local_2a0[0] = (RTCHitN)auStack_290[0];
                      local_2a0[1] = (RTCHitN)auStack_290[1];
                      local_2a0[2] = (RTCHitN)auStack_290[2];
                      local_2a0[3] = (RTCHitN)auStack_290[3];
                      local_2a0[4] = (RTCHitN)auStack_290[4];
                      local_2a0[5] = (RTCHitN)auStack_290[5];
                      local_2a0[6] = (RTCHitN)auStack_290[6];
                      local_2a0[7] = (RTCHitN)auStack_290[7];
                      local_2a0[8] = (RTCHitN)auStack_290[8];
                      local_2a0[9] = (RTCHitN)auStack_290[9];
                      local_2a0[10] = (RTCHitN)auStack_290[10];
                      local_2a0[0xb] = (RTCHitN)auStack_290[0xb];
                      local_2a0[0xc] = (RTCHitN)auStack_290[0xc];
                      local_2a0[0xd] = (RTCHitN)auStack_290[0xd];
                      local_2a0[0xe] = (RTCHitN)auStack_290[0xe];
                      local_2a0[0xf] = (RTCHitN)auStack_290[0xf];
                      auStack_270 = vshufps_avx(auVar234,auVar234,0x55);
                      auVar259 = ZEXT1664(auStack_270);
                      local_280 = auStack_270;
                      auStack_250 = vshufps_avx(auVar234,auVar234,0xaa);
                      local_260 = auStack_250;
                      fStack_23c = local_240;
                      fStack_238 = local_240;
                      fStack_234 = local_240;
                      fStack_230 = local_240;
                      fStack_22c = local_240;
                      fStack_228 = local_240;
                      fStack_224 = local_240;
                      uStack_21c = local_220;
                      uStack_218 = local_220;
                      uStack_214 = local_220;
                      uStack_210 = local_220;
                      uStack_20c = local_220;
                      uStack_208 = local_220;
                      uStack_204 = local_220;
                      local_200 = local_180._0_8_;
                      uStack_1f8 = local_180._8_8_;
                      uStack_1f0 = local_180._16_8_;
                      uStack_1e8 = local_180._24_8_;
                      local_1e0 = local_160._0_8_;
                      uStack_1d8 = local_160._8_8_;
                      uStack_1d0 = local_160._16_8_;
                      uStack_1c8 = local_160._24_8_;
                      auVar176 = vcmpps_avx(auVar432._0_32_,auVar432._0_32_,0xf);
                      local_768[1] = auVar176;
                      *local_768 = auVar176;
                      local_1c0 = (local_8f0.context)->instID[0];
                      uStack_1bc = local_1c0;
                      uStack_1b8 = local_1c0;
                      uStack_1b4 = local_1c0;
                      uStack_1b0 = local_1c0;
                      uStack_1ac = local_1c0;
                      uStack_1a8 = local_1c0;
                      uStack_1a4 = local_1c0;
                      local_1a0 = (local_8f0.context)->instPrimID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_7c0 = local_820;
                      uStack_7b8 = uStack_818;
                      uStack_7b0 = uStack_810;
                      uStack_7a8 = uStack_808;
                      local_8f0.valid = (int *)&local_7c0;
                      local_8f0.geometryUserPtr = pGVar168->userPtr;
                      local_8f0.hit = local_2a0;
                      local_8f0.N = 8;
                      local_8f0.ray = (RTCRayN *)ray;
                      if (pGVar168->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar259 = ZEXT1664(auStack_270);
                        auVar335 = ZEXT1664(auVar335._0_16_);
                        local_8a0 = auVar176;
                        (*pGVar168->intersectionFilterN)(&local_8f0);
                        auVar374 = ZEXT3264(local_600);
                        auVar432 = ZEXT1664(ZEXT816(0) << 0x40);
                        pGVar168 = local_760;
                        auVar176 = local_8a0;
                      }
                      auVar143._8_8_ = uStack_7b8;
                      auVar143._0_8_ = local_7c0;
                      auVar174 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar143);
                      auVar147._8_8_ = uStack_7a8;
                      auVar147._0_8_ = uStack_7b0;
                      auVar231 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar147);
                      auVar187._16_16_ = auVar231;
                      auVar187._0_16_ = auVar174;
                      auVar186 = auVar176 & ~auVar187;
                      if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar186 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar186 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar186 >> 0x7f,0) == '\0') &&
                            (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar186 >> 0xbf,0) == '\0') &&
                          (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar186[0x1f]) {
                        auVar188._0_4_ = auVar174._0_4_ ^ auVar176._0_4_;
                        auVar188._4_4_ = auVar174._4_4_ ^ auVar176._4_4_;
                        auVar188._8_4_ = auVar174._8_4_ ^ auVar176._8_4_;
                        auVar188._12_4_ = auVar174._12_4_ ^ auVar176._12_4_;
                        auVar188._16_4_ = auVar231._0_4_ ^ auVar176._16_4_;
                        auVar188._20_4_ = auVar231._4_4_ ^ auVar176._20_4_;
                        auVar188._24_4_ = auVar231._8_4_ ^ auVar176._24_4_;
                        auVar188._28_4_ = auVar231._12_4_ ^ auVar176._28_4_;
                      }
                      else {
                        p_Var38 = context->args->filter;
                        if ((p_Var38 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar168->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar259 = ZEXT1664(auVar259._0_16_);
                          auVar335 = ZEXT1664(auVar335._0_16_);
                          local_8a0 = auVar176;
                          (*p_Var38)(&local_8f0);
                          auVar374 = ZEXT3264(local_600);
                          auVar432 = ZEXT1664(ZEXT816(0) << 0x40);
                          pGVar168 = local_760;
                          auVar176 = local_8a0;
                        }
                        auVar144._8_8_ = uStack_7b8;
                        auVar144._0_8_ = local_7c0;
                        auVar174 = vpcmpeqd_avx((undefined1  [16])0x0,auVar144);
                        auVar148._8_8_ = uStack_7a8;
                        auVar148._0_8_ = uStack_7b0;
                        auVar231 = vpcmpeqd_avx((undefined1  [16])0x0,auVar148);
                        auVar222._16_16_ = auVar231;
                        auVar222._0_16_ = auVar174;
                        auVar188._0_4_ = auVar174._0_4_ ^ auVar176._0_4_;
                        auVar188._4_4_ = auVar174._4_4_ ^ auVar176._4_4_;
                        auVar188._8_4_ = auVar174._8_4_ ^ auVar176._8_4_;
                        auVar188._12_4_ = auVar174._12_4_ ^ auVar176._12_4_;
                        auVar188._16_4_ = auVar231._0_4_ ^ auVar176._16_4_;
                        auVar188._20_4_ = auVar231._4_4_ ^ auVar176._20_4_;
                        auVar188._24_4_ = auVar231._8_4_ ^ auVar176._24_4_;
                        auVar188._28_4_ = auVar231._12_4_ ^ auVar176._28_4_;
                        auVar176 = auVar176 & ~auVar222;
                        if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar176 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar176 >> 0x7f,0) != '\0')
                              || (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar176 >> 0xbf,0) != '\0') ||
                            (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar176[0x1f] < '\0') {
                          auVar176 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])local_8f0.hit);
                          *(undefined1 (*) [32])(local_8f0.ray + 0x180) = auVar176;
                          auVar176 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0x20));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x1a0) = auVar176;
                          auVar176 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0x40));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x1c0) = auVar176;
                          auVar176 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0x60));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x1e0) = auVar176;
                          auVar176 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0x80));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x200) = auVar176;
                          auVar176 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0xa0));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x220) = auVar176;
                          auVar176 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0xc0));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x240) = auVar176;
                          auVar176 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0xe0));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x260) = auVar176;
                          auVar176 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0x100));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x280) = auVar176;
                        }
                      }
                      if ((((((((auVar188 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar188 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar188 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar188 >> 0x7f,0) == '\0') &&
                            (auVar188 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar188 >> 0xbf,0) == '\0') &&
                          (auVar188 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar188[0x1f]) {
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar11;
                      }
                      *(undefined4 *)(local_6c0 + uVar162 * 4) = 0;
                      uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar189._4_4_ = uVar11;
                      auVar189._0_4_ = uVar11;
                      auVar189._8_4_ = uVar11;
                      auVar189._12_4_ = uVar11;
                      auVar189._16_4_ = uVar11;
                      auVar189._20_4_ = uVar11;
                      auVar189._24_4_ = uVar11;
                      auVar189._28_4_ = uVar11;
                      auVar186 = vcmpps_avx(auVar374._0_32_,auVar189,2);
                      auVar176 = vandps_avx(auVar186,local_6c0);
                      auVar193 = ZEXT3264(auVar176);
                      auVar186 = local_6c0 & auVar186;
                      bVar136 = (auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar137 = (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar135 = (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar134 = SUB321(auVar186 >> 0x7f,0) != '\0';
                      bVar133 = (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar132 = SUB321(auVar186 >> 0xbf,0) != '\0';
                      bVar131 = (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar130 = auVar186[0x1f] < '\0';
                      if (((((((bVar136 || bVar137) || bVar135) || bVar134) || bVar133) || bVar132)
                          || bVar131) || bVar130) {
                        auVar223._8_4_ = 0x7f800000;
                        auVar223._0_8_ = 0x7f8000007f800000;
                        auVar223._12_4_ = 0x7f800000;
                        auVar223._16_4_ = 0x7f800000;
                        auVar223._20_4_ = 0x7f800000;
                        auVar223._24_4_ = 0x7f800000;
                        auVar223._28_4_ = 0x7f800000;
                        auVar186 = vblendvps_avx(auVar223,auVar374._0_32_,auVar176);
                        auVar39 = vshufps_avx(auVar186,auVar186,0xb1);
                        auVar39 = vminps_avx(auVar186,auVar39);
                        auVar40 = vshufpd_avx(auVar39,auVar39,5);
                        auVar39 = vminps_avx(auVar39,auVar40);
                        auVar40 = vperm2f128_avx(auVar39,auVar39,1);
                        auVar259 = ZEXT3264(auVar40);
                        local_6c0 = vminps_avx(auVar39,auVar40);
                        auVar186 = vcmpps_avx(auVar186,local_6c0,0);
                        auVar39 = auVar176 & auVar186;
                        if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar39 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar39 >> 0x7f,0) != '\0') ||
                              (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar39 >> 0xbf,0) != '\0') ||
                            (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar39[0x1f] < '\0') {
                          auVar186 = vandps_avx(auVar186,auVar176);
                          auVar193 = ZEXT3264(auVar186);
                        }
                        uVar161 = vmovmskps_avx(auVar193._0_32_);
                        uVar165 = 0;
                        if (uVar161 != 0) {
                          for (; (uVar161 >> uVar165 & 1) == 0; uVar165 = uVar165 + 1) {
                          }
                        }
                        uVar162 = (ulong)uVar165;
                      }
                      auVar242 = ZEXT3264(local_6c0);
                      local_6c0 = auVar176;
                    } while (((((((bVar136 || bVar137) || bVar135) || bVar134) || bVar133) ||
                              bVar132) || bVar131) || bVar130);
                  }
                }
                goto LAB_01263281;
              }
            }
            auVar242 = ZEXT3264(auVar241);
          }
LAB_01263281:
          lVar169 = lVar169 + 8;
        } while ((int)lVar169 < (int)uVar34);
      }
      uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar182._4_4_ = uVar11;
      auVar182._0_4_ = uVar11;
      auVar182._8_4_ = uVar11;
      auVar182._12_4_ = uVar11;
      auVar182._16_4_ = uVar11;
      auVar182._20_4_ = uVar11;
      auVar182._24_4_ = uVar11;
      auVar182._28_4_ = uVar11;
      auVar176 = vcmpps_avx(local_80,auVar182,2);
      uVar165 = vmovmskps_avx(auVar176);
      uVar159 = uVar159 & uVar159 + 0xff & uVar165;
    } while (uVar159 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }